

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx::CurveNiMBIntersectorK<4,8>::
     occluded_t<embree::avx::SweepCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  Primitive PVar10;
  Geometry *pGVar11;
  __int_type_conflict _Var12;
  long lVar13;
  long lVar14;
  long lVar15;
  RTCRayQueryContext *pRVar16;
  RTCFilterFunctionN p_Var17;
  long lVar18;
  undefined1 auVar19 [16];
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [12];
  ulong uVar91;
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  byte bVar99;
  uint uVar100;
  ulong uVar101;
  undefined1 (*pauVar102) [32];
  uint uVar103;
  uint uVar104;
  int iVar105;
  ulong uVar106;
  long lVar107;
  bool bVar108;
  bool bVar109;
  float fVar136;
  float fVar137;
  vint4 bi_1;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar122 [16];
  float fVar139;
  float fVar140;
  float fVar141;
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  float fVar138;
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar121 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  float fVar142;
  float fVar170;
  float fVar172;
  vint4 bi;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar143;
  float fVar144;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar171;
  float fVar173;
  float fVar174;
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  float fVar175;
  float fVar204;
  float fVar205;
  vint4 bi_2;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  float fVar206;
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  float fVar207;
  float fVar226;
  float fVar227;
  vint4 ai_1;
  undefined1 auVar208 [16];
  float fVar228;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [28];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  float fVar229;
  float fVar240;
  float fVar241;
  vint4 ai_2;
  undefined1 auVar230 [16];
  float fVar242;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar237 [32];
  undefined1 auVar236 [16];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  float fVar243;
  float fVar257;
  float fVar258;
  undefined1 auVar244 [16];
  float fVar259;
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  float fVar260;
  float fVar261;
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  float fVar262;
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  float fVar263;
  float fVar264;
  float fVar277;
  float fVar281;
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  float fVar278;
  float fVar279;
  float fVar282;
  float fVar283;
  float fVar285;
  float fVar286;
  float fVar287;
  float fVar290;
  float fVar291;
  float fVar294;
  float fVar295;
  float fVar298;
  float fVar299;
  float fVar301;
  undefined1 auVar269 [32];
  float fVar280;
  float fVar284;
  float fVar288;
  float fVar292;
  float fVar296;
  float fVar300;
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  float fVar289;
  float fVar293;
  float fVar297;
  undefined1 auVar276 [64];
  float fVar302;
  float fVar311;
  float fVar312;
  vint4 ai;
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  float fVar314;
  undefined1 auVar308 [32];
  float fVar313;
  float fVar315;
  float fVar317;
  float fVar319;
  float fVar321;
  undefined1 auVar309 [32];
  float fVar316;
  float fVar318;
  float fVar320;
  undefined1 auVar310 [64];
  float fVar322;
  float fVar323;
  float fVar324;
  float fVar334;
  float fVar337;
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  float fVar335;
  float fVar336;
  float fVar338;
  float fVar339;
  float fVar340;
  float fVar341;
  float fVar342;
  float fVar343;
  float fVar344;
  float fVar345;
  float fVar346;
  float fVar347;
  float fVar348;
  float fVar349;
  float fVar350;
  float fVar351;
  float fVar352;
  float fVar353;
  float fVar354;
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  float fVar362;
  float fVar363;
  undefined1 auVar357 [32];
  float fVar359;
  float fVar360;
  float fVar361;
  undefined1 auVar358 [64];
  undefined1 auVar364 [16];
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar367 [64];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  float fVar373;
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  float fVar374;
  float fVar379;
  float fVar380;
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  float fVar381;
  float fVar382;
  float fVar383;
  float fVar384;
  undefined1 auVar377 [32];
  float fVar385;
  float fVar396;
  float fVar398;
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  float fVar386;
  float fVar397;
  float fVar399;
  float fVar400;
  float fVar401;
  float fVar402;
  float fVar403;
  float fVar404;
  float fVar405;
  float fVar406;
  float fVar407;
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  undefined1 auVar392 [32];
  undefined1 auVar393 [32];
  undefined1 auVar394 [32];
  undefined1 auVar395 [32];
  undefined1 auVar408 [32];
  undefined1 auVar409 [32];
  undefined1 auVar410 [32];
  undefined1 auVar411 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_cc4;
  float local_cc0;
  undefined1 local_c80 [32];
  undefined1 local_ba0 [16];
  undefined1 local_b90 [16];
  undefined1 local_b80 [8];
  float fStack_b78;
  float fStack_b74;
  undefined1 local_b70 [8];
  float fStack_b68;
  float fStack_b64;
  undefined1 local_b60 [8];
  float fStack_b58;
  float fStack_b54;
  undefined1 local_b50 [8];
  float fStack_b48;
  float fStack_b44;
  undefined1 local_b40 [8];
  float fStack_b38;
  float fStack_b34;
  float fStack_b30;
  float fStack_b2c;
  float fStack_b28;
  float fStack_b24;
  undefined1 (*local_b10) [16];
  undefined1 (*local_b08) [16];
  uint *local_b00;
  ulong local_af8;
  RTCFilterFunctionNArguments local_af0;
  undefined1 local_ac0 [8];
  float fStack_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float fStack_aa8;
  float fStack_aa4;
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [16];
  undefined1 local_a50 [8];
  float fStack_a48;
  float fStack_a44;
  undefined1 local_a40 [32];
  undefined1 local_a20 [8];
  float fStack_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float fStack_a08;
  float fStack_a04;
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float fStack_9e4;
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  float local_9a0;
  float fStack_99c;
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [32];
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  undefined1 local_930 [16];
  undefined1 local_920 [16];
  Primitive *local_910;
  ulong local_908;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [16];
  undefined1 auStack_7f0 [16];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [16];
  undefined1 local_6f0 [16];
  RTCHitN local_6e0 [16];
  undefined1 auStack_6d0 [16];
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [16];
  undefined1 local_690 [16];
  undefined1 local_680 [16];
  undefined1 local_670 [16];
  undefined1 local_660 [32];
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  uint local_600;
  uint uStack_5fc;
  uint uStack_5f8;
  uint uStack_5f4;
  uint uStack_5f0;
  uint uStack_5ec;
  uint uStack_5e8;
  uint uStack_5e4;
  uint local_5e0;
  uint uStack_5dc;
  uint uStack_5d8;
  uint uStack_5d4;
  uint uStack_5d0;
  uint uStack_5cc;
  uint uStack_5c8;
  uint uStack_5c4;
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined4 uStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined4 uStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined4 uStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  undefined1 auVar372 [64];
  undefined1 auVar378 [64];
  
  PVar10 = prim[1];
  uVar106 = (ulong)(byte)PVar10;
  lVar18 = uVar106 * 0x25;
  fVar142 = *(float *)(prim + lVar18 + 0x12);
  auVar149 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar149 = vinsertps_avx(auVar149,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar19 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar19 = vinsertps_avx(auVar19,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar149 = vsubps_avx(auVar149,*(undefined1 (*) [16])(prim + lVar18 + 6));
  auVar145._0_4_ = fVar142 * auVar149._0_4_;
  auVar145._4_4_ = fVar142 * auVar149._4_4_;
  auVar145._8_4_ = fVar142 * auVar149._8_4_;
  auVar145._12_4_ = fVar142 * auVar149._12_4_;
  auVar303._0_4_ = fVar142 * auVar19._0_4_;
  auVar303._4_4_ = fVar142 * auVar19._4_4_;
  auVar303._8_4_ = fVar142 * auVar19._8_4_;
  auVar303._12_4_ = fVar142 * auVar19._12_4_;
  auVar149 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 4 + 6)));
  auVar149 = vcvtdq2ps_avx(auVar149);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 5 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar189 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 6 + 6)));
  auVar189 = vcvtdq2ps_avx(auVar189);
  auVar185 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 0xf + 6)));
  auVar118 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar10 * 0x10 + 6)));
  auVar185 = vcvtdq2ps_avx(auVar185);
  auVar154 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar10 * 0x10 + uVar106 + 6)));
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar154 = vcvtdq2ps_avx(auVar154);
  auVar356 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 0x1a + 6)));
  auVar356 = vcvtdq2ps_avx(auVar356);
  auVar117 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 0x1b + 6)));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 0x1c + 6)));
  auVar36 = vcvtdq2ps_avx(auVar36);
  auVar37 = vshufps_avx(auVar303,auVar303,0);
  auVar120 = vshufps_avx(auVar303,auVar303,0x55);
  auVar38 = vshufps_avx(auVar303,auVar303,0xaa);
  fVar142 = auVar38._0_4_;
  fVar144 = auVar38._4_4_;
  fVar171 = auVar38._8_4_;
  fVar173 = auVar38._12_4_;
  fVar229 = auVar120._0_4_;
  fVar240 = auVar120._4_4_;
  fVar241 = auVar120._8_4_;
  fVar242 = auVar120._12_4_;
  fVar207 = auVar37._0_4_;
  fVar226 = auVar37._4_4_;
  fVar227 = auVar37._8_4_;
  fVar228 = auVar37._12_4_;
  auVar375._0_4_ = fVar207 * auVar149._0_4_ + fVar229 * auVar19._0_4_ + fVar142 * auVar189._0_4_;
  auVar375._4_4_ = fVar226 * auVar149._4_4_ + fVar240 * auVar19._4_4_ + fVar144 * auVar189._4_4_;
  auVar375._8_4_ = fVar227 * auVar149._8_4_ + fVar241 * auVar19._8_4_ + fVar171 * auVar189._8_4_;
  auVar375._12_4_ = fVar228 * auVar149._12_4_ + fVar242 * auVar19._12_4_ + fVar173 * auVar189._12_4_
  ;
  auVar387._0_4_ = fVar207 * auVar185._0_4_ + fVar229 * auVar118._0_4_ + auVar154._0_4_ * fVar142;
  auVar387._4_4_ = fVar226 * auVar185._4_4_ + fVar240 * auVar118._4_4_ + auVar154._4_4_ * fVar144;
  auVar387._8_4_ = fVar227 * auVar185._8_4_ + fVar241 * auVar118._8_4_ + auVar154._8_4_ * fVar171;
  auVar387._12_4_ =
       fVar228 * auVar185._12_4_ + fVar242 * auVar118._12_4_ + auVar154._12_4_ * fVar173;
  auVar304._0_4_ = fVar207 * auVar356._0_4_ + fVar229 * auVar117._0_4_ + auVar36._0_4_ * fVar142;
  auVar304._4_4_ = fVar226 * auVar356._4_4_ + fVar240 * auVar117._4_4_ + auVar36._4_4_ * fVar144;
  auVar304._8_4_ = fVar227 * auVar356._8_4_ + fVar241 * auVar117._8_4_ + auVar36._8_4_ * fVar171;
  auVar304._12_4_ = fVar228 * auVar356._12_4_ + fVar242 * auVar117._12_4_ + auVar36._12_4_ * fVar173
  ;
  auVar37 = vshufps_avx(auVar145,auVar145,0);
  auVar120 = vshufps_avx(auVar145,auVar145,0x55);
  auVar38 = vshufps_avx(auVar145,auVar145,0xaa);
  fVar142 = auVar38._0_4_;
  fVar144 = auVar38._4_4_;
  fVar171 = auVar38._8_4_;
  fVar173 = auVar38._12_4_;
  fVar229 = auVar120._0_4_;
  fVar240 = auVar120._4_4_;
  fVar241 = auVar120._8_4_;
  fVar242 = auVar120._12_4_;
  fVar207 = auVar37._0_4_;
  fVar226 = auVar37._4_4_;
  fVar227 = auVar37._8_4_;
  fVar228 = auVar37._12_4_;
  auVar146._0_4_ = fVar207 * auVar149._0_4_ + fVar229 * auVar19._0_4_ + fVar142 * auVar189._0_4_;
  auVar146._4_4_ = fVar226 * auVar149._4_4_ + fVar240 * auVar19._4_4_ + fVar144 * auVar189._4_4_;
  auVar146._8_4_ = fVar227 * auVar149._8_4_ + fVar241 * auVar19._8_4_ + fVar171 * auVar189._8_4_;
  auVar146._12_4_ = fVar228 * auVar149._12_4_ + fVar242 * auVar19._12_4_ + fVar173 * auVar189._12_4_
  ;
  auVar110._0_4_ = fVar207 * auVar185._0_4_ + auVar154._0_4_ * fVar142 + fVar229 * auVar118._0_4_;
  auVar110._4_4_ = fVar226 * auVar185._4_4_ + auVar154._4_4_ * fVar144 + fVar240 * auVar118._4_4_;
  auVar110._8_4_ = fVar227 * auVar185._8_4_ + auVar154._8_4_ * fVar171 + fVar241 * auVar118._8_4_;
  auVar110._12_4_ =
       fVar228 * auVar185._12_4_ + auVar154._12_4_ * fVar173 + fVar242 * auVar118._12_4_;
  auVar325._8_4_ = 0x7fffffff;
  auVar325._0_8_ = 0x7fffffff7fffffff;
  auVar325._12_4_ = 0x7fffffff;
  auVar149 = vandps_avx(auVar375,auVar325);
  auVar230._8_4_ = 0x219392ef;
  auVar230._0_8_ = 0x219392ef219392ef;
  auVar230._12_4_ = 0x219392ef;
  auVar149 = vcmpps_avx(auVar149,auVar230,1);
  auVar19 = vblendvps_avx(auVar375,auVar230,auVar149);
  auVar149 = vandps_avx(auVar387,auVar325);
  auVar149 = vcmpps_avx(auVar149,auVar230,1);
  auVar189 = vblendvps_avx(auVar387,auVar230,auVar149);
  auVar149 = vandps_avx(auVar325,auVar304);
  auVar149 = vcmpps_avx(auVar149,auVar230,1);
  auVar149 = vblendvps_avx(auVar304,auVar230,auVar149);
  auVar176._0_4_ = fVar207 * auVar356._0_4_ + fVar229 * auVar117._0_4_ + auVar36._0_4_ * fVar142;
  auVar176._4_4_ = fVar226 * auVar356._4_4_ + fVar240 * auVar117._4_4_ + auVar36._4_4_ * fVar144;
  auVar176._8_4_ = fVar227 * auVar356._8_4_ + fVar241 * auVar117._8_4_ + auVar36._8_4_ * fVar171;
  auVar176._12_4_ = fVar228 * auVar356._12_4_ + fVar242 * auVar117._12_4_ + auVar36._12_4_ * fVar173
  ;
  auVar185 = vrcpps_avx(auVar19);
  fVar207 = auVar185._0_4_;
  auVar208._0_4_ = fVar207 * auVar19._0_4_;
  fVar226 = auVar185._4_4_;
  auVar208._4_4_ = fVar226 * auVar19._4_4_;
  fVar227 = auVar185._8_4_;
  auVar208._8_4_ = fVar227 * auVar19._8_4_;
  fVar228 = auVar185._12_4_;
  auVar208._12_4_ = fVar228 * auVar19._12_4_;
  auVar265._8_4_ = 0x3f800000;
  auVar265._0_8_ = 0x3f8000003f800000;
  auVar265._12_4_ = 0x3f800000;
  auVar19 = vsubps_avx(auVar265,auVar208);
  fVar207 = fVar207 + fVar207 * auVar19._0_4_;
  fVar226 = fVar226 + fVar226 * auVar19._4_4_;
  fVar227 = fVar227 + fVar227 * auVar19._8_4_;
  fVar228 = fVar228 + fVar228 * auVar19._12_4_;
  auVar19 = vrcpps_avx(auVar189);
  fVar229 = auVar19._0_4_;
  auVar244._0_4_ = fVar229 * auVar189._0_4_;
  fVar240 = auVar19._4_4_;
  auVar244._4_4_ = fVar240 * auVar189._4_4_;
  fVar241 = auVar19._8_4_;
  auVar244._8_4_ = fVar241 * auVar189._8_4_;
  fVar242 = auVar19._12_4_;
  auVar244._12_4_ = fVar242 * auVar189._12_4_;
  auVar19 = vsubps_avx(auVar265,auVar244);
  fVar229 = fVar229 + fVar229 * auVar19._0_4_;
  fVar240 = fVar240 + fVar240 * auVar19._4_4_;
  fVar241 = fVar241 + fVar241 * auVar19._8_4_;
  fVar242 = fVar242 + fVar242 * auVar19._12_4_;
  auVar19 = vrcpps_avx(auVar149);
  fVar243 = auVar19._0_4_;
  auVar305._0_4_ = fVar243 * auVar149._0_4_;
  fVar257 = auVar19._4_4_;
  auVar305._4_4_ = fVar257 * auVar149._4_4_;
  fVar258 = auVar19._8_4_;
  auVar305._8_4_ = fVar258 * auVar149._8_4_;
  fVar259 = auVar19._12_4_;
  auVar305._12_4_ = fVar259 * auVar149._12_4_;
  auVar149 = vsubps_avx(auVar265,auVar305);
  fVar243 = fVar243 + fVar243 * auVar149._0_4_;
  fVar257 = fVar257 + fVar257 * auVar149._4_4_;
  fVar258 = fVar258 + fVar258 * auVar149._8_4_;
  fVar259 = fVar259 + fVar259 * auVar149._12_4_;
  auVar149 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar18 + 0x16)) *
                           *(float *)(prim + lVar18 + 0x1a)));
  auVar189 = vshufps_avx(auVar149,auVar149,0);
  auVar149._8_8_ = 0;
  auVar149._0_8_ = *(ulong *)(prim + uVar106 * 7 + 6);
  auVar149 = vpmovsxwd_avx(auVar149);
  auVar149 = vcvtdq2ps_avx(auVar149);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar106 * 0xb + 6);
  auVar19 = vpmovsxwd_avx(auVar19);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar185 = vsubps_avx(auVar19,auVar149);
  fVar142 = auVar189._0_4_;
  fVar144 = auVar189._4_4_;
  fVar171 = auVar189._8_4_;
  fVar173 = auVar189._12_4_;
  auVar189._8_8_ = 0;
  auVar189._0_8_ = *(ulong *)(prim + uVar106 * 9 + 6);
  auVar19 = vpmovsxwd_avx(auVar189);
  auVar306._0_4_ = auVar185._0_4_ * fVar142 + auVar149._0_4_;
  auVar306._4_4_ = auVar185._4_4_ * fVar144 + auVar149._4_4_;
  auVar306._8_4_ = auVar185._8_4_ * fVar171 + auVar149._8_4_;
  auVar306._12_4_ = auVar185._12_4_ * fVar173 + auVar149._12_4_;
  auVar185._8_8_ = 0;
  auVar185._0_8_ = *(ulong *)(prim + uVar106 * 0xd + 6);
  auVar189 = vpmovsxwd_avx(auVar185);
  auVar149 = vcvtdq2ps_avx(auVar19);
  auVar19 = vcvtdq2ps_avx(auVar189);
  auVar19 = vsubps_avx(auVar19,auVar149);
  auVar326._0_4_ = auVar19._0_4_ * fVar142 + auVar149._0_4_;
  auVar326._4_4_ = auVar19._4_4_ * fVar144 + auVar149._4_4_;
  auVar326._8_4_ = auVar19._8_4_ * fVar171 + auVar149._8_4_;
  auVar326._12_4_ = auVar19._12_4_ * fVar173 + auVar149._12_4_;
  auVar118._8_8_ = 0;
  auVar118._0_8_ = *(ulong *)(prim + uVar106 * 0x12 + 6);
  auVar149 = vpmovsxwd_avx(auVar118);
  uVar101 = (ulong)(uint)((int)(uVar106 * 5) << 2);
  auVar154._8_8_ = 0;
  auVar154._0_8_ = *(ulong *)(prim + uVar106 * 2 + uVar101 + 6);
  auVar19 = vpmovsxwd_avx(auVar154);
  auVar149 = vcvtdq2ps_avx(auVar149);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar19 = vsubps_avx(auVar19,auVar149);
  auVar355._0_4_ = auVar19._0_4_ * fVar142 + auVar149._0_4_;
  auVar355._4_4_ = auVar19._4_4_ * fVar144 + auVar149._4_4_;
  auVar355._8_4_ = auVar19._8_4_ * fVar171 + auVar149._8_4_;
  auVar355._12_4_ = auVar19._12_4_ * fVar173 + auVar149._12_4_;
  auVar356._8_8_ = 0;
  auVar356._0_8_ = *(ulong *)(prim + uVar101 + 6);
  auVar149 = vpmovsxwd_avx(auVar356);
  auVar149 = vcvtdq2ps_avx(auVar149);
  auVar117._8_8_ = 0;
  auVar117._0_8_ = *(ulong *)(prim + uVar106 * 0x18 + 6);
  auVar19 = vpmovsxwd_avx(auVar117);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar189 = vsubps_avx(auVar19,auVar149);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + uVar106 * 0x1d + 6);
  auVar19 = vpmovsxwd_avx(auVar36);
  auVar364._0_4_ = auVar189._0_4_ * fVar142 + auVar149._0_4_;
  auVar364._4_4_ = auVar189._4_4_ * fVar144 + auVar149._4_4_;
  auVar364._8_4_ = auVar189._8_4_ * fVar171 + auVar149._8_4_;
  auVar364._12_4_ = auVar189._12_4_ * fVar173 + auVar149._12_4_;
  auVar149 = vcvtdq2ps_avx(auVar19);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar106 + (ulong)(byte)PVar10 * 0x20 + 6);
  auVar19 = vpmovsxwd_avx(auVar37);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar19 = vsubps_avx(auVar19,auVar149);
  auVar368._0_4_ = auVar19._0_4_ * fVar142 + auVar149._0_4_;
  auVar368._4_4_ = auVar19._4_4_ * fVar144 + auVar149._4_4_;
  auVar368._8_4_ = auVar19._8_4_ * fVar171 + auVar149._8_4_;
  auVar368._12_4_ = auVar19._12_4_ * fVar173 + auVar149._12_4_;
  auVar120._8_8_ = 0;
  auVar120._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar10 * 0x20 - uVar106) + 6);
  auVar149 = vpmovsxwd_avx(auVar120);
  auVar149 = vcvtdq2ps_avx(auVar149);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar106 * 0x23 + 6);
  auVar19 = vpmovsxwd_avx(auVar38);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar19 = vsubps_avx(auVar19,auVar149);
  auVar266._0_4_ = auVar149._0_4_ + auVar19._0_4_ * fVar142;
  auVar266._4_4_ = auVar149._4_4_ + auVar19._4_4_ * fVar144;
  auVar266._8_4_ = auVar149._8_4_ + auVar19._8_4_ * fVar171;
  auVar266._12_4_ = auVar149._12_4_ + auVar19._12_4_ * fVar173;
  auVar149 = vsubps_avx(auVar306,auVar146);
  auVar307._0_4_ = fVar207 * auVar149._0_4_;
  auVar307._4_4_ = fVar226 * auVar149._4_4_;
  auVar307._8_4_ = fVar227 * auVar149._8_4_;
  auVar307._12_4_ = fVar228 * auVar149._12_4_;
  auVar149 = vsubps_avx(auVar326,auVar146);
  auVar147._0_4_ = fVar207 * auVar149._0_4_;
  auVar147._4_4_ = fVar226 * auVar149._4_4_;
  auVar147._8_4_ = fVar227 * auVar149._8_4_;
  auVar147._12_4_ = fVar228 * auVar149._12_4_;
  auVar149 = vsubps_avx(auVar355,auVar110);
  auVar209._0_4_ = fVar229 * auVar149._0_4_;
  auVar209._4_4_ = fVar240 * auVar149._4_4_;
  auVar209._8_4_ = fVar241 * auVar149._8_4_;
  auVar209._12_4_ = fVar242 * auVar149._12_4_;
  auVar149 = vsubps_avx(auVar364,auVar110);
  auVar111._0_4_ = fVar229 * auVar149._0_4_;
  auVar111._4_4_ = fVar240 * auVar149._4_4_;
  auVar111._8_4_ = fVar241 * auVar149._8_4_;
  auVar111._12_4_ = fVar242 * auVar149._12_4_;
  auVar149 = vsubps_avx(auVar368,auVar176);
  auVar231._0_4_ = fVar243 * auVar149._0_4_;
  auVar231._4_4_ = fVar257 * auVar149._4_4_;
  auVar231._8_4_ = fVar258 * auVar149._8_4_;
  auVar231._12_4_ = fVar259 * auVar149._12_4_;
  auVar149 = vsubps_avx(auVar266,auVar176);
  auVar177._0_4_ = fVar243 * auVar149._0_4_;
  auVar177._4_4_ = fVar257 * auVar149._4_4_;
  auVar177._8_4_ = fVar258 * auVar149._8_4_;
  auVar177._12_4_ = fVar259 * auVar149._12_4_;
  auVar149 = vpminsd_avx(auVar307,auVar147);
  auVar19 = vpminsd_avx(auVar209,auVar111);
  auVar149 = vmaxps_avx(auVar149,auVar19);
  auVar19 = vpminsd_avx(auVar231,auVar177);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar327._4_4_ = uVar8;
  auVar327._0_4_ = uVar8;
  auVar327._8_4_ = uVar8;
  auVar327._12_4_ = uVar8;
  auVar19 = vmaxps_avx(auVar19,auVar327);
  auVar149 = vmaxps_avx(auVar149,auVar19);
  local_700._0_4_ = auVar149._0_4_ * 0.99999964;
  local_700._4_4_ = auVar149._4_4_ * 0.99999964;
  local_700._8_4_ = auVar149._8_4_ * 0.99999964;
  local_700._12_4_ = auVar149._12_4_ * 0.99999964;
  auVar149 = vpmaxsd_avx(auVar307,auVar147);
  auVar19 = vpmaxsd_avx(auVar209,auVar111);
  auVar149 = vminps_avx(auVar149,auVar19);
  auVar19 = vpmaxsd_avx(auVar231,auVar177);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar178._4_4_ = uVar8;
  auVar178._0_4_ = uVar8;
  auVar178._8_4_ = uVar8;
  auVar178._12_4_ = uVar8;
  auVar19 = vminps_avx(auVar19,auVar178);
  auVar149 = vminps_avx(auVar149,auVar19);
  auVar112._0_4_ = auVar149._0_4_ * 1.0000004;
  auVar112._4_4_ = auVar149._4_4_ * 1.0000004;
  auVar112._8_4_ = auVar149._8_4_ * 1.0000004;
  auVar112._12_4_ = auVar149._12_4_ * 1.0000004;
  auVar149 = vpshufd_avx(ZEXT116((byte)PVar10),0);
  auVar19 = vpcmpgtd_avx(auVar149,_DAT_01f7fcf0);
  auVar149 = vcmpps_avx(local_700,auVar112,2);
  auVar149 = vandps_avx(auVar149,auVar19);
  uVar100 = vmovmskps_avx(auVar149);
  if (uVar100 == 0) {
    return false;
  }
  uVar100 = uVar100 & 0xff;
  auVar123._16_16_ = mm_lookupmask_ps._240_16_;
  auVar123._0_16_ = mm_lookupmask_ps._240_16_;
  local_500 = vblendps_avx(auVar123,ZEXT832(0) << 0x20,0x80);
  uVar104 = 1 << ((byte)k & 0x1f);
  local_b00 = &local_600;
  local_b08 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar104 & 0xf) << 4));
  local_b10 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar104 >> 4) * 0x10);
  local_910 = prim;
LAB_00f3e5a8:
  local_908 = (ulong)uVar100;
  lVar18 = 0;
  if (local_908 != 0) {
    for (; (uVar100 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
    }
  }
  local_af8 = (ulong)*(uint *)(local_910 + 2);
  pGVar11 = (context->scene->geometries).items[local_af8].ptr;
  uVar106 = (ulong)*(uint *)(*(long *)&pGVar11->field_0x58 +
                            (ulong)*(uint *)(local_910 + lVar18 * 4 + 6) *
                            pGVar11[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar142 = (pGVar11->time_range).lower;
  fVar142 = pGVar11->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar142) / ((pGVar11->time_range).upper - fVar142));
  auVar149 = vroundss_avx(ZEXT416((uint)fVar142),ZEXT416((uint)fVar142),9);
  auVar149 = vminss_avx(auVar149,ZEXT416((uint)(pGVar11->fnumTimeSegments + -1.0)));
  auVar149 = vmaxss_avx(ZEXT816(0) << 0x20,auVar149);
  fVar142 = fVar142 - auVar149._0_4_;
  _Var12 = pGVar11[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar107 = (long)(int)auVar149._0_4_ * 0x38;
  lVar13 = *(long *)(_Var12 + 0x10 + lVar107);
  lVar14 = *(long *)(_Var12 + 0x38 + lVar107);
  lVar15 = *(long *)(_Var12 + 0x48 + lVar107);
  auVar149 = vshufps_avx(ZEXT416((uint)fVar142),ZEXT416((uint)fVar142),0);
  pfVar1 = (float *)(lVar14 + uVar106 * lVar15);
  fVar226 = auVar149._0_4_;
  fVar227 = auVar149._4_4_;
  fVar228 = auVar149._8_4_;
  fVar229 = auVar149._12_4_;
  pfVar2 = (float *)(lVar14 + (uVar106 + 1) * lVar15);
  pfVar3 = (float *)(lVar14 + (uVar106 + 2) * lVar15);
  pfVar4 = (float *)(lVar14 + lVar15 * (uVar106 + 3));
  lVar14 = *(long *)(_Var12 + lVar107);
  auVar149 = vshufps_avx(ZEXT416((uint)(1.0 - fVar142)),ZEXT416((uint)(1.0 - fVar142)),0);
  pfVar5 = (float *)(lVar14 + lVar13 * uVar106);
  fVar144 = auVar149._0_4_;
  fVar171 = auVar149._4_4_;
  fVar173 = auVar149._8_4_;
  fVar207 = auVar149._12_4_;
  pfVar6 = (float *)(lVar14 + lVar13 * (uVar106 + 1));
  pfVar7 = (float *)(lVar14 + lVar13 * (uVar106 + 2));
  auVar179._0_4_ = fVar226 * *pfVar1 + fVar144 * *pfVar5;
  auVar179._4_4_ = fVar227 * pfVar1[1] + fVar171 * pfVar5[1];
  auVar179._8_4_ = fVar228 * pfVar1[2] + fVar173 * pfVar5[2];
  auVar179._12_4_ = fVar229 * pfVar1[3] + fVar207 * pfVar5[3];
  auVar148._0_4_ = fVar144 * *pfVar6 + fVar226 * *pfVar2;
  auVar148._4_4_ = fVar171 * pfVar6[1] + fVar227 * pfVar2[1];
  auVar148._8_4_ = fVar173 * pfVar6[2] + fVar228 * pfVar2[2];
  auVar148._12_4_ = fVar207 * pfVar6[3] + fVar229 * pfVar2[3];
  pfVar1 = (float *)(lVar14 + lVar13 * (uVar106 + 3));
  auVar210._0_4_ = fVar144 * *pfVar7 + fVar226 * *pfVar3;
  auVar210._4_4_ = fVar171 * pfVar7[1] + fVar227 * pfVar3[1];
  auVar210._8_4_ = fVar173 * pfVar7[2] + fVar228 * pfVar3[2];
  auVar210._12_4_ = fVar207 * pfVar7[3] + fVar229 * pfVar3[3];
  auVar149 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar19 = vinsertps_avx(auVar149,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar142 = *(float *)(ray + k * 4 + 0x80);
  auVar369._4_4_ = fVar142;
  auVar369._0_4_ = fVar142;
  auVar369._8_4_ = fVar142;
  auVar369._12_4_ = fVar142;
  fStack_ab0 = fVar142;
  _local_ac0 = auVar369;
  fStack_aac = fVar142;
  fStack_aa8 = fVar142;
  fStack_aa4 = fVar142;
  auVar372 = ZEXT3264(_local_ac0);
  auVar245._0_4_ = fVar144 * *pfVar1 + fVar226 * *pfVar4;
  auVar245._4_4_ = fVar171 * pfVar1[1] + fVar227 * pfVar4[1];
  auVar245._8_4_ = fVar173 * pfVar1[2] + fVar228 * pfVar4[2];
  auVar245._12_4_ = fVar207 * pfVar1[3] + fVar229 * pfVar4[3];
  fVar144 = *(float *)(ray + k * 4 + 0xa0);
  auVar376._4_4_ = fVar144;
  auVar376._0_4_ = fVar144;
  auVar376._8_4_ = fVar144;
  auVar376._12_4_ = fVar144;
  fStack_9f0 = fVar144;
  _local_a00 = auVar376;
  fStack_9ec = fVar144;
  fStack_9e8 = fVar144;
  fStack_9e4 = fVar144;
  auVar378 = ZEXT3264(_local_a00);
  auVar149 = vunpcklps_avx(auVar369,auVar376);
  fVar171 = *(float *)(ray + k * 4 + 0xc0);
  auVar388._4_4_ = fVar171;
  auVar388._0_4_ = fVar171;
  auVar388._8_4_ = fVar171;
  auVar388._12_4_ = fVar171;
  fStack_890 = fVar171;
  _local_8a0 = auVar388;
  fStack_88c = fVar171;
  fStack_888 = fVar171;
  fStack_884 = fVar171;
  _local_a50 = vinsertps_avx(auVar149,auVar388,0x28);
  auVar358 = ZEXT1664(_local_a50);
  auVar113._0_4_ = (auVar179._0_4_ + auVar148._0_4_ + auVar210._0_4_ + auVar245._0_4_) * 0.25;
  auVar113._4_4_ = (auVar179._4_4_ + auVar148._4_4_ + auVar210._4_4_ + auVar245._4_4_) * 0.25;
  auVar113._8_4_ = (auVar179._8_4_ + auVar148._8_4_ + auVar210._8_4_ + auVar245._8_4_) * 0.25;
  auVar113._12_4_ = (auVar179._12_4_ + auVar148._12_4_ + auVar210._12_4_ + auVar245._12_4_) * 0.25;
  auVar149 = vsubps_avx(auVar113,auVar19);
  auVar149 = vdpps_avx(auVar149,_local_a50,0x7f);
  local_a60 = vdpps_avx(_local_a50,_local_a50,0x7f);
  auVar367 = ZEXT1664(local_a60);
  auVar189 = vrcpss_avx(local_a60,local_a60);
  fVar173 = auVar149._0_4_ * auVar189._0_4_ * (2.0 - local_a60._0_4_ * auVar189._0_4_);
  auVar310 = ZEXT464((uint)fVar173);
  auVar189 = vshufps_avx(ZEXT416((uint)fVar173),ZEXT416((uint)fVar173),0);
  auVar232._0_4_ = auVar19._0_4_ + local_a50._0_4_ * auVar189._0_4_;
  auVar232._4_4_ = auVar19._4_4_ + local_a50._4_4_ * auVar189._4_4_;
  auVar232._8_4_ = auVar19._8_4_ + local_a50._8_4_ * auVar189._8_4_;
  auVar232._12_4_ = auVar19._12_4_ + local_a50._12_4_ * auVar189._12_4_;
  auVar149 = vblendps_avx(auVar232,_DAT_01f7aa10,8);
  _local_b50 = vsubps_avx(auVar179,auVar149);
  auVar276 = ZEXT1664(_local_b50);
  _local_b60 = vsubps_avx(auVar210,auVar149);
  _local_b70 = vsubps_avx(auVar148,auVar149);
  _local_b80 = vsubps_avx(auVar245,auVar149);
  auVar149 = vshufps_avx(_local_b50,_local_b50,0);
  register0x00001250 = auVar149;
  _local_1e0 = auVar149;
  auVar149 = vshufps_avx(_local_b50,_local_b50,0x55);
  register0x00001250 = auVar149;
  _local_200 = auVar149;
  auVar149 = vshufps_avx(_local_b50,_local_b50,0xaa);
  register0x00001250 = auVar149;
  _local_220 = auVar149;
  auVar149 = vshufps_avx(_local_b50,_local_b50,0xff);
  register0x00001290 = auVar149;
  _local_240 = auVar149;
  auVar149 = vshufps_avx(_local_b70,_local_b70,0);
  register0x00001290 = auVar149;
  _local_260 = auVar149;
  auVar149 = vshufps_avx(_local_b70,_local_b70,0x55);
  register0x00001290 = auVar149;
  _local_280 = auVar149;
  auVar149 = vshufps_avx(_local_b70,_local_b70,0xaa);
  register0x00001290 = auVar149;
  _local_2a0 = auVar149;
  auVar149 = vshufps_avx(_local_b70,_local_b70,0xff);
  register0x00001290 = auVar149;
  _local_3e0 = auVar149;
  auVar149 = vshufps_avx(_local_b60,_local_b60,0);
  register0x00001290 = auVar149;
  _local_400 = auVar149;
  auVar149 = vshufps_avx(_local_b60,_local_b60,0x55);
  register0x00001290 = auVar149;
  _local_420 = auVar149;
  auVar149 = vshufps_avx(_local_b60,_local_b60,0xaa);
  register0x00001290 = auVar149;
  _local_440 = auVar149;
  auVar149 = vshufps_avx(_local_b60,_local_b60,0xff);
  register0x00001290 = auVar149;
  _local_460 = auVar149;
  auVar149 = vshufps_avx(_local_b80,_local_b80,0);
  register0x00001290 = auVar149;
  _local_480 = auVar149;
  auVar149 = vshufps_avx(_local_b80,_local_b80,0x55);
  register0x00001290 = auVar149;
  _local_4a0 = auVar149;
  auVar149 = vshufps_avx(_local_b80,_local_b80,0xaa);
  register0x00001290 = auVar149;
  _local_4c0 = auVar149;
  auVar149 = vshufps_avx(_local_b80,_local_b80,0xff);
  local_4e0._16_16_ = auVar149;
  local_4e0._0_16_ = auVar149;
  auVar149 = ZEXT416((uint)(fVar142 * fVar142 + fVar144 * fVar144 + fVar171 * fVar171));
  auVar149 = vshufps_avx(auVar149,auVar149,0);
  local_2c0._16_16_ = auVar149;
  local_2c0._0_16_ = auVar149;
  fVar142 = *(float *)(ray + k * 4 + 0x60);
  local_920 = ZEXT416((uint)fVar173);
  auVar149 = vshufps_avx(ZEXT416((uint)(fVar142 - fVar173)),ZEXT416((uint)(fVar142 - fVar173)),0);
  local_2e0._16_16_ = auVar149;
  local_2e0._0_16_ = auVar149;
  auVar149 = vpshufd_avx(ZEXT416(*(uint *)(local_910 + 2)),0);
  local_540._16_16_ = auVar149;
  local_540._0_16_ = auVar149;
  auVar149 = vpshufd_avx(ZEXT416(*(uint *)(local_910 + lVar18 * 4 + 6)),0);
  local_560._16_16_ = auVar149;
  local_560._0_16_ = auVar149;
  register0x00001210 = auVar189;
  _local_960 = auVar189;
  uVar106 = 0;
  bVar108 = false;
  local_cc4 = 1;
  auVar124._8_4_ = 0x7fffffff;
  auVar124._0_8_ = 0x7fffffff7fffffff;
  auVar124._12_4_ = 0x7fffffff;
  auVar124._16_4_ = 0x7fffffff;
  auVar124._20_4_ = 0x7fffffff;
  auVar124._24_4_ = 0x7fffffff;
  auVar124._28_4_ = 0x7fffffff;
  local_520 = vandps_avx(local_2c0,auVar124);
  auVar149 = vsqrtss_avx(local_a60,local_a60);
  auVar19 = vsqrtss_avx(local_a60,local_a60);
  local_6f0 = ZEXT816(0x3f80000000000000);
  do {
    auVar250._8_4_ = 0x3f800000;
    auVar250._0_8_ = 0x3f8000003f800000;
    auVar250._12_4_ = 0x3f800000;
    auVar250._16_4_ = 0x3f800000;
    auVar250._20_4_ = 0x3f800000;
    auVar250._24_4_ = 0x3f800000;
    auVar250._28_4_ = 0x3f800000;
    iVar105 = (int)uVar106;
    auVar189 = vmovshdup_avx(local_6f0);
    auVar118 = vsubps_avx(auVar189,local_6f0);
    auVar189 = vshufps_avx(local_6f0,local_6f0,0);
    auVar185 = vshufps_avx(auVar118,auVar118,0);
    fVar143 = auVar185._0_4_;
    fVar170 = auVar185._4_4_;
    fVar172 = auVar185._8_4_;
    fVar174 = auVar185._12_4_;
    fVar175 = auVar189._0_4_;
    auVar222._0_4_ = fVar175 + fVar143 * 0.0;
    fVar204 = auVar189._4_4_;
    auVar222._4_4_ = fVar204 + fVar170 * 0.14285715;
    fVar205 = auVar189._8_4_;
    auVar222._8_4_ = fVar205 + fVar172 * 0.2857143;
    fVar206 = auVar189._12_4_;
    auVar222._12_4_ = fVar206 + fVar174 * 0.42857146;
    auVar222._16_4_ = fVar175 + fVar143 * 0.5714286;
    auVar222._20_4_ = fVar204 + fVar170 * 0.71428573;
    auVar222._24_4_ = fVar205 + fVar172 * 0.8571429;
    auVar222._28_4_ = fVar206 + fVar174;
    auVar123 = vsubps_avx(auVar250,auVar222);
    fVar144 = auVar123._0_4_;
    fVar171 = auVar123._4_4_;
    fVar173 = auVar123._8_4_;
    fVar207 = auVar123._12_4_;
    fVar226 = auVar123._16_4_;
    fVar227 = auVar123._20_4_;
    fVar228 = auVar123._24_4_;
    fVar241 = fVar144 * fVar144 * fVar144;
    fVar277 = fVar171 * fVar171 * fVar171;
    fVar281 = fVar173 * fVar173 * fVar173;
    fVar285 = fVar207 * fVar207 * fVar207;
    fVar289 = fVar226 * fVar226 * fVar226;
    fVar293 = fVar227 * fVar227 * fVar227;
    fVar297 = fVar228 * fVar228 * fVar228;
    fVar302 = auVar222._0_4_ * auVar222._0_4_ * auVar222._0_4_;
    fVar311 = auVar222._4_4_ * auVar222._4_4_ * auVar222._4_4_;
    fVar312 = auVar222._8_4_ * auVar222._8_4_ * auVar222._8_4_;
    fVar314 = auVar222._12_4_ * auVar222._12_4_ * auVar222._12_4_;
    fVar316 = auVar222._16_4_ * auVar222._16_4_ * auVar222._16_4_;
    fVar318 = auVar222._20_4_ * auVar222._20_4_ * auVar222._20_4_;
    fVar320 = auVar222._24_4_ * auVar222._24_4_ * auVar222._24_4_;
    fVar229 = auVar222._0_4_ * fVar144;
    fVar240 = auVar222._4_4_ * fVar171;
    fVar242 = auVar222._8_4_ * fVar173;
    fVar257 = auVar222._12_4_ * fVar207;
    fVar258 = auVar222._16_4_ * fVar226;
    fVar259 = auVar222._20_4_ * fVar227;
    fVar261 = auVar222._24_4_ * fVar228;
    fVar243 = auVar367._28_4_ + auVar378._28_4_;
    fVar352 = auVar310._28_4_ + 1.0 + fVar243;
    fVar362 = fVar243 + auVar276._28_4_ + auVar372._28_4_ + auVar358._28_4_;
    fVar243 = fVar241 * 0.16666667;
    fVar278 = fVar277 * 0.16666667;
    fVar282 = fVar281 * 0.16666667;
    fVar286 = fVar285 * 0.16666667;
    fVar290 = fVar289 * 0.16666667;
    fVar294 = fVar293 * 0.16666667;
    fVar298 = fVar297 * 0.16666667;
    fVar322 = (fVar302 + fVar241 * 4.0 + fVar144 * fVar229 * 12.0 + auVar222._0_4_ * fVar229 * 6.0)
              * 0.16666667;
    fVar334 = (fVar311 + fVar277 * 4.0 + fVar171 * fVar240 * 12.0 + auVar222._4_4_ * fVar240 * 6.0)
              * 0.16666667;
    fVar337 = (fVar312 + fVar281 * 4.0 + fVar173 * fVar242 * 12.0 + auVar222._8_4_ * fVar242 * 6.0)
              * 0.16666667;
    fVar340 = (fVar314 + fVar285 * 4.0 + fVar207 * fVar257 * 12.0 + auVar222._12_4_ * fVar257 * 6.0)
              * 0.16666667;
    fVar343 = (fVar316 + fVar289 * 4.0 + fVar226 * fVar258 * 12.0 + auVar222._16_4_ * fVar258 * 6.0)
              * 0.16666667;
    fVar346 = (fVar318 + fVar293 * 4.0 + fVar227 * fVar259 * 12.0 + auVar222._20_4_ * fVar259 * 6.0)
              * 0.16666667;
    fVar349 = (fVar320 + fVar297 * 4.0 + fVar228 * fVar261 * 12.0 + auVar222._24_4_ * fVar261 * 6.0)
              * 0.16666667;
    fVar241 = (fVar302 * 4.0 + fVar241 + auVar222._0_4_ * fVar229 * 12.0 + fVar144 * fVar229 * 6.0)
              * 0.16666667;
    fVar277 = (fVar311 * 4.0 + fVar277 + auVar222._4_4_ * fVar240 * 12.0 + fVar171 * fVar240 * 6.0)
              * 0.16666667;
    fVar281 = (fVar312 * 4.0 + fVar281 + auVar222._8_4_ * fVar242 * 12.0 + fVar173 * fVar242 * 6.0)
              * 0.16666667;
    fVar285 = (fVar314 * 4.0 + fVar285 + auVar222._12_4_ * fVar257 * 12.0 + fVar207 * fVar257 * 6.0)
              * 0.16666667;
    fVar289 = (fVar316 * 4.0 + fVar289 + auVar222._16_4_ * fVar258 * 12.0 + fVar226 * fVar258 * 6.0)
              * 0.16666667;
    fVar293 = (fVar318 * 4.0 + fVar293 + auVar222._20_4_ * fVar259 * 12.0 + fVar227 * fVar259 * 6.0)
              * 0.16666667;
    fVar297 = (fVar320 * 4.0 + fVar297 + auVar222._24_4_ * fVar261 * 12.0 + fVar228 * fVar261 * 6.0)
              * 0.16666667;
    fVar302 = fVar302 * 0.16666667;
    fVar311 = fVar311 * 0.16666667;
    fVar312 = fVar312 * 0.16666667;
    fVar314 = fVar314 * 0.16666667;
    fVar316 = fVar316 * 0.16666667;
    fVar318 = fVar318 * 0.16666667;
    fVar320 = fVar320 * 0.16666667;
    fVar373 = auVar372._28_4_ + 12.0;
    fVar363 = fVar362 + 12.166667;
    fVar323 = (float)local_1e0._0_4_ * fVar243 +
              fVar322 * (float)local_260._0_4_ +
              fVar302 * (float)local_480._0_4_ + fVar241 * (float)local_400._0_4_;
    fVar335 = (float)local_1e0._4_4_ * fVar278 +
              fVar334 * (float)local_260._4_4_ +
              fVar311 * (float)local_480._4_4_ + fVar277 * (float)local_400._4_4_;
    fVar338 = fStack_1d8 * fVar282 +
              fVar337 * fStack_258 + fVar312 * fStack_478 + fVar281 * fStack_3f8;
    fVar341 = fStack_1d4 * fVar286 +
              fVar340 * fStack_254 + fVar314 * fStack_474 + fVar285 * fStack_3f4;
    fVar344 = fStack_1d0 * fVar290 +
              fVar343 * fStack_250 + fVar316 * fStack_470 + fVar289 * fStack_3f0;
    fVar347 = fStack_1cc * fVar294 +
              fVar346 * fStack_24c + fVar318 * fStack_46c + fVar293 * fStack_3ec;
    fVar350 = fStack_1c8 * fVar298 +
              fVar349 * fStack_248 + fVar320 * fStack_468 + fVar297 * fStack_3e8;
    fVar353 = fVar352 + fVar363;
    fVar324 = (float)local_200._0_4_ * fVar243 +
              (float)local_280._0_4_ * fVar322 +
              fVar302 * (float)local_4a0._0_4_ + fVar241 * (float)local_420._0_4_;
    fVar336 = (float)local_200._4_4_ * fVar278 +
              (float)local_280._4_4_ * fVar334 +
              fVar311 * (float)local_4a0._4_4_ + fVar277 * (float)local_420._4_4_;
    fVar339 = fStack_1f8 * fVar282 +
              fStack_278 * fVar337 + fVar312 * fStack_498 + fVar281 * fStack_418;
    fVar342 = fStack_1f4 * fVar286 +
              fStack_274 * fVar340 + fVar314 * fStack_494 + fVar285 * fStack_414;
    fVar345 = fStack_1f0 * fVar290 +
              fStack_270 * fVar343 + fVar316 * fStack_490 + fVar289 * fStack_410;
    fVar348 = fStack_1ec * fVar294 +
              fStack_26c * fVar346 + fVar318 * fStack_48c + fVar293 * fStack_40c;
    fVar351 = fStack_1e8 * fVar298 +
              fStack_268 * fVar349 + fVar320 * fStack_488 + fVar297 * fStack_408;
    fVar354 = fVar353 + fVar373 + 12.166667;
    local_9a0 = (float)local_220._0_4_ * fVar243 +
                (float)local_2a0._0_4_ * fVar322 +
                fVar302 * (float)local_4c0._0_4_ + fVar241 * (float)local_440._0_4_;
    fStack_99c = (float)local_220._4_4_ * fVar278 +
                 (float)local_2a0._4_4_ * fVar334 +
                 fVar311 * (float)local_4c0._4_4_ + fVar277 * (float)local_440._4_4_;
    fStack_998 = fStack_218 * fVar282 +
                 fStack_298 * fVar337 + fVar312 * fStack_4b8 + fVar281 * fStack_438;
    fStack_994 = fStack_214 * fVar286 +
                 fStack_294 * fVar340 + fVar314 * fStack_4b4 + fVar285 * fStack_434;
    fStack_990 = fStack_210 * fVar290 +
                 fStack_290 * fVar343 + fVar316 * fStack_4b0 + fVar289 * fStack_430;
    fStack_98c = fStack_20c * fVar294 +
                 fStack_28c * fVar346 + fVar318 * fStack_4ac + fVar293 * fStack_42c;
    fStack_988 = fStack_208 * fVar298 +
                 fStack_288 * fVar349 + fVar320 * fStack_4a8 + fVar297 * fStack_428;
    fStack_984 = fVar354 + fVar373 + auVar378._28_4_ + 12.0;
    local_b40._0_4_ =
         (float)local_240._0_4_ * fVar243 +
         fVar322 * (float)local_3e0._0_4_ +
         fVar241 * (float)local_460._0_4_ + local_4e0._0_4_ * fVar302;
    local_b40._4_4_ =
         (float)local_240._4_4_ * fVar278 +
         fVar334 * (float)local_3e0._4_4_ +
         fVar277 * (float)local_460._4_4_ + local_4e0._4_4_ * fVar311;
    fStack_b38 = fStack_238 * fVar282 +
                 fVar337 * fStack_3d8 + fVar281 * fStack_458 + local_4e0._8_4_ * fVar312;
    fStack_b34 = fStack_234 * fVar286 +
                 fVar340 * fStack_3d4 + fVar285 * fStack_454 + local_4e0._12_4_ * fVar314;
    fStack_b30 = fStack_230 * fVar290 +
                 fVar343 * fStack_3d0 + fVar289 * fStack_450 + local_4e0._16_4_ * fVar316;
    fStack_b2c = fStack_22c * fVar294 +
                 fVar346 * fStack_3cc + fVar293 * fStack_44c + local_4e0._20_4_ * fVar318;
    fStack_b28 = fStack_228 * fVar298 +
                 fVar349 * fStack_3c8 + fVar297 * fStack_448 + local_4e0._24_4_ * fVar320;
    fStack_b24 = auVar276._28_4_ + fVar352 + fVar362 + auVar310._28_4_;
    auVar42._4_4_ = auVar222._4_4_ * -auVar222._4_4_;
    auVar42._0_4_ = auVar222._0_4_ * -auVar222._0_4_;
    auVar42._8_4_ = auVar222._8_4_ * -auVar222._8_4_;
    auVar42._12_4_ = auVar222._12_4_ * -auVar222._12_4_;
    auVar42._16_4_ = auVar222._16_4_ * -auVar222._16_4_;
    auVar42._20_4_ = auVar222._20_4_ * -auVar222._20_4_;
    auVar42._24_4_ = auVar222._24_4_ * -auVar222._24_4_;
    auVar42._28_4_ = auVar222._28_4_;
    auVar39._4_4_ = fVar240 * 4.0;
    auVar39._0_4_ = fVar229 * 4.0;
    auVar39._8_4_ = fVar242 * 4.0;
    auVar39._12_4_ = fVar257 * 4.0;
    auVar39._16_4_ = fVar258 * 4.0;
    auVar39._20_4_ = fVar259 * 4.0;
    auVar39._24_4_ = fVar261 * 4.0;
    auVar39._28_4_ = 0x3f800000;
    auVar123 = vsubps_avx(auVar42,auVar39);
    fVar294 = fVar144 * -fVar144 * 0.5;
    fVar297 = fVar171 * -fVar171 * 0.5;
    fVar298 = fVar173 * -fVar173 * 0.5;
    fVar302 = fVar207 * -fVar207 * 0.5;
    fVar311 = fVar226 * -fVar226 * 0.5;
    fVar312 = fVar227 * -fVar227 * 0.5;
    fVar314 = fVar228 * -fVar228 * 0.5;
    fVar277 = auVar123._0_4_ * 0.5;
    fVar281 = auVar123._4_4_ * 0.5;
    fVar285 = auVar123._8_4_ * 0.5;
    fVar286 = auVar123._12_4_ * 0.5;
    fVar289 = auVar123._16_4_ * 0.5;
    fVar290 = auVar123._20_4_ * 0.5;
    fVar293 = auVar123._24_4_ * 0.5;
    fVar229 = (fVar144 * fVar144 + fVar229 * 4.0) * 0.5;
    fVar241 = (fVar171 * fVar171 + fVar240 * 4.0) * 0.5;
    fVar243 = (fVar173 * fVar173 + fVar242 * 4.0) * 0.5;
    fVar257 = (fVar207 * fVar207 + fVar257 * 4.0) * 0.5;
    fVar258 = (fVar226 * fVar226 + fVar258 * 4.0) * 0.5;
    fVar259 = (fVar227 * fVar227 + fVar259 * 4.0) * 0.5;
    fVar282 = (fVar228 * fVar228 + fVar261 * 4.0) * 0.5;
    fVar144 = auVar222._0_4_ * auVar222._0_4_ * 0.5;
    fVar171 = auVar222._4_4_ * auVar222._4_4_ * 0.5;
    fVar173 = auVar222._8_4_ * auVar222._8_4_ * 0.5;
    fVar207 = auVar222._12_4_ * auVar222._12_4_ * 0.5;
    fVar226 = auVar222._16_4_ * auVar222._16_4_ * 0.5;
    fVar227 = auVar222._20_4_ * auVar222._20_4_ * 0.5;
    fVar242 = auVar222._24_4_ * auVar222._24_4_ * 0.5;
    fVar301 = fStack_984 + fVar363 + fVar363 + 4.0;
    auVar189 = vpermilps_avx(ZEXT416((uint)(auVar118._0_4_ * 0.04761905)),0);
    fVar228 = auVar189._0_4_;
    fVar263 = fVar228 * ((float)local_1e0._0_4_ * fVar294 +
                        (float)local_260._0_4_ * fVar277 +
                        fVar229 * (float)local_400._0_4_ + fVar144 * (float)local_480._0_4_);
    fVar240 = auVar189._4_4_;
    fVar279 = fVar240 * ((float)local_1e0._4_4_ * fVar297 +
                        (float)local_260._4_4_ * fVar281 +
                        fVar241 * (float)local_400._4_4_ + fVar171 * (float)local_480._4_4_);
    auVar50._4_4_ = fVar279;
    auVar50._0_4_ = fVar263;
    fVar261 = auVar189._8_4_;
    fVar283 = fVar261 * (fStack_1d8 * fVar298 +
                        fStack_258 * fVar285 + fVar243 * fStack_3f8 + fVar173 * fStack_478);
    auVar50._8_4_ = fVar283;
    fVar278 = auVar189._12_4_;
    fVar287 = fVar278 * (fStack_1d4 * fVar302 +
                        fStack_254 * fVar286 + fVar257 * fStack_3f4 + fVar207 * fStack_474);
    auVar50._12_4_ = fVar287;
    fVar291 = fVar228 * (fStack_1d0 * fVar311 +
                        fStack_250 * fVar289 + fVar258 * fStack_3f0 + fVar226 * fStack_470);
    auVar50._16_4_ = fVar291;
    fVar295 = fVar240 * (fStack_1cc * fVar312 +
                        fStack_24c * fVar290 + fVar259 * fStack_3ec + fVar227 * fStack_46c);
    auVar50._20_4_ = fVar295;
    fVar299 = fVar261 * (fStack_1c8 * fVar314 +
                        fStack_248 * fVar293 + fVar282 * fStack_3e8 + fVar242 * fStack_468);
    auVar50._24_4_ = fVar299;
    auVar50._28_4_ = fVar301;
    fVar374 = fVar228 * ((float)local_200._0_4_ * fVar294 +
                        (float)local_280._0_4_ * fVar277 +
                        fVar229 * (float)local_420._0_4_ + fVar144 * (float)local_4a0._0_4_);
    fVar379 = fVar240 * ((float)local_200._4_4_ * fVar297 +
                        (float)local_280._4_4_ * fVar281 +
                        fVar241 * (float)local_420._4_4_ + fVar171 * (float)local_4a0._4_4_);
    auVar46._4_4_ = fVar379;
    auVar46._0_4_ = fVar374;
    fVar380 = fVar261 * (fStack_1f8 * fVar298 +
                        fStack_278 * fVar285 + fVar243 * fStack_418 + fVar173 * fStack_498);
    auVar46._8_4_ = fVar380;
    fVar381 = fVar278 * (fStack_1f4 * fVar302 +
                        fStack_274 * fVar286 + fVar257 * fStack_414 + fVar207 * fStack_494);
    auVar46._12_4_ = fVar381;
    fVar382 = fVar228 * (fStack_1f0 * fVar311 +
                        fStack_270 * fVar289 + fVar258 * fStack_410 + fVar226 * fStack_490);
    auVar46._16_4_ = fVar382;
    fVar383 = fVar240 * (fStack_1ec * fVar312 +
                        fStack_26c * fVar290 + fVar259 * fStack_40c + fVar227 * fStack_48c);
    auVar46._20_4_ = fVar383;
    fVar384 = fVar261 * (fStack_1e8 * fVar314 +
                        fStack_268 * fVar293 + fVar282 * fStack_408 + fVar242 * fStack_488);
    auVar46._24_4_ = fVar384;
    auVar46._28_4_ = uStack_1c4;
    fVar385 = fVar228 * ((float)local_220._0_4_ * fVar294 +
                        fVar144 * (float)local_4c0._0_4_ + fVar229 * (float)local_440._0_4_ +
                        (float)local_2a0._0_4_ * fVar277);
    fVar396 = fVar240 * ((float)local_220._4_4_ * fVar297 +
                        fVar171 * (float)local_4c0._4_4_ + fVar241 * (float)local_440._4_4_ +
                        (float)local_2a0._4_4_ * fVar281);
    auVar392._4_4_ = fVar396;
    auVar392._0_4_ = fVar385;
    fVar398 = fVar261 * (fStack_218 * fVar298 +
                        fVar173 * fStack_4b8 + fVar243 * fStack_438 + fStack_298 * fVar285);
    auVar392._8_4_ = fVar398;
    fVar400 = fVar278 * (fStack_214 * fVar302 +
                        fVar207 * fStack_4b4 + fVar257 * fStack_434 + fStack_294 * fVar286);
    auVar392._12_4_ = fVar400;
    fVar402 = fVar228 * (fStack_210 * fVar311 +
                        fVar226 * fStack_4b0 + fVar258 * fStack_430 + fStack_290 * fVar289);
    auVar392._16_4_ = fVar402;
    fVar404 = fVar240 * (fStack_20c * fVar312 +
                        fVar227 * fStack_4ac + fVar259 * fStack_42c + fStack_28c * fVar290);
    auVar392._20_4_ = fVar404;
    fVar406 = fVar261 * (fStack_208 * fVar314 +
                        fVar242 * fStack_4a8 + fVar282 * fStack_428 + fStack_288 * fVar293);
    auVar392._24_4_ = fVar406;
    auVar392._28_4_ = uStack_1e4;
    fVar229 = fVar228 * ((float)local_240._0_4_ * fVar294 +
                        fVar277 * (float)local_3e0._0_4_ +
                        fVar144 * local_4e0._0_4_ + fVar229 * (float)local_460._0_4_);
    fVar241 = fVar240 * ((float)local_240._4_4_ * fVar297 +
                        fVar281 * (float)local_3e0._4_4_ +
                        fVar171 * local_4e0._4_4_ + fVar241 * (float)local_460._4_4_);
    auVar160._4_4_ = fVar241;
    auVar160._0_4_ = fVar229;
    fVar277 = fVar261 * (fStack_238 * fVar298 +
                        fVar285 * fStack_3d8 + fVar173 * local_4e0._8_4_ + fVar243 * fStack_458);
    auVar160._8_4_ = fVar277;
    fVar281 = fVar278 * (fStack_234 * fVar302 +
                        fVar286 * fStack_3d4 + fVar207 * local_4e0._12_4_ + fVar257 * fStack_454);
    auVar160._12_4_ = fVar281;
    fVar228 = fVar228 * (fStack_230 * fVar311 +
                        fVar289 * fStack_3d0 + fVar226 * local_4e0._16_4_ + fVar258 * fStack_450);
    auVar160._16_4_ = fVar228;
    fVar240 = fVar240 * (fStack_22c * fVar312 +
                        fVar290 * fStack_3cc + fVar227 * local_4e0._20_4_ + fVar259 * fStack_44c);
    auVar160._20_4_ = fVar240;
    fVar261 = fVar261 * (fStack_228 * fVar314 +
                        fVar293 * fStack_3c8 + fVar242 * local_4e0._24_4_ + fVar282 * fStack_448);
    auVar160._24_4_ = fVar261;
    auVar160._28_4_ = fVar278;
    auVar40._4_4_ = fVar336;
    auVar40._0_4_ = fVar324;
    auVar40._8_4_ = fVar339;
    auVar40._12_4_ = fVar342;
    auVar40._16_4_ = fVar345;
    auVar40._20_4_ = fVar348;
    auVar40._24_4_ = fVar351;
    auVar40._28_4_ = fVar354;
    auVar123 = vperm2f128_avx(auVar40,auVar40,1);
    auVar123 = vshufps_avx(auVar123,auVar40,0x30);
    local_9c0 = vshufps_avx(auVar40,auVar123,0x29);
    auVar96._4_4_ = fStack_99c;
    auVar96._0_4_ = local_9a0;
    auVar96._8_4_ = fStack_998;
    auVar96._12_4_ = fStack_994;
    auVar96._16_4_ = fStack_990;
    auVar96._20_4_ = fStack_98c;
    auVar96._24_4_ = fStack_988;
    auVar96._28_4_ = fStack_984;
    auVar123 = vperm2f128_avx(auVar96,auVar96,1);
    auVar123 = vshufps_avx(auVar123,auVar96,0x30);
    auVar39 = vshufps_avx(auVar96,auVar123,0x29);
    auVar124 = vsubps_avx(_local_b40,auVar160);
    auVar123 = vperm2f128_avx(auVar124,auVar124,1);
    auVar123 = vshufps_avx(auVar123,auVar124,0x30);
    auVar160 = vshufps_avx(auVar124,auVar123,0x29);
    auVar40 = vsubps_avx(local_9c0,auVar40);
    auVar41 = vsubps_avx(auVar39,auVar96);
    fVar171 = auVar40._0_4_;
    fVar242 = auVar40._4_4_;
    auVar393._4_4_ = fVar396 * fVar242;
    auVar393._0_4_ = fVar385 * fVar171;
    fVar282 = auVar40._8_4_;
    auVar393._8_4_ = fVar398 * fVar282;
    fVar302 = auVar40._12_4_;
    auVar393._12_4_ = fVar400 * fVar302;
    fVar337 = auVar40._16_4_;
    auVar393._16_4_ = fVar402 * fVar337;
    fVar20 = auVar40._20_4_;
    auVar393._20_4_ = fVar404 * fVar20;
    fVar28 = auVar40._24_4_;
    auVar393._24_4_ = fVar406 * fVar28;
    auVar393._28_4_ = auVar124._28_4_;
    fVar173 = auVar41._0_4_;
    fVar243 = auVar41._4_4_;
    auVar193._4_4_ = fVar379 * fVar243;
    auVar193._0_4_ = fVar374 * fVar173;
    fVar285 = auVar41._8_4_;
    auVar193._8_4_ = fVar380 * fVar285;
    fVar311 = auVar41._12_4_;
    auVar193._12_4_ = fVar381 * fVar311;
    fVar340 = auVar41._16_4_;
    auVar193._16_4_ = fVar382 * fVar340;
    fVar21 = auVar41._20_4_;
    auVar193._20_4_ = fVar383 * fVar21;
    fVar29 = auVar41._24_4_;
    auVar193._24_4_ = fVar384 * fVar29;
    auVar193._28_4_ = auVar123._28_4_;
    auVar42 = vsubps_avx(auVar193,auVar393);
    auVar43._4_4_ = fVar335;
    auVar43._0_4_ = fVar323;
    auVar43._8_4_ = fVar338;
    auVar43._12_4_ = fVar341;
    auVar43._16_4_ = fVar344;
    auVar43._20_4_ = fVar347;
    auVar43._24_4_ = fVar350;
    auVar43._28_4_ = fVar353;
    auVar123 = vperm2f128_avx(auVar43,auVar43,1);
    auVar123 = vshufps_avx(auVar123,auVar43,0x30);
    auVar393 = vshufps_avx(auVar43,auVar123,0x29);
    auVar43 = vsubps_avx(auVar393,auVar43);
    auVar44._4_4_ = fVar243 * fVar279;
    auVar44._0_4_ = fVar173 * fVar263;
    auVar44._8_4_ = fVar285 * fVar283;
    auVar44._12_4_ = fVar311 * fVar287;
    auVar44._16_4_ = fVar340 * fVar291;
    auVar44._20_4_ = fVar21 * fVar295;
    auVar44._24_4_ = fVar29 * fVar299;
    auVar44._28_4_ = auVar393._28_4_;
    fVar207 = auVar43._0_4_;
    fVar257 = auVar43._4_4_;
    auVar45._4_4_ = fVar396 * fVar257;
    auVar45._0_4_ = fVar385 * fVar207;
    fVar286 = auVar43._8_4_;
    auVar45._8_4_ = fVar398 * fVar286;
    fVar312 = auVar43._12_4_;
    auVar45._12_4_ = fVar400 * fVar312;
    fVar343 = auVar43._16_4_;
    auVar45._16_4_ = fVar402 * fVar343;
    fVar22 = auVar43._20_4_;
    auVar45._20_4_ = fVar404 * fVar22;
    fVar30 = auVar43._24_4_;
    auVar45._24_4_ = fVar406 * fVar30;
    auVar45._28_4_ = fVar353;
    auVar193 = vsubps_avx(auVar45,auVar44);
    auVar47._4_4_ = fVar379 * fVar257;
    auVar47._0_4_ = fVar374 * fVar207;
    auVar47._8_4_ = fVar380 * fVar286;
    auVar47._12_4_ = fVar381 * fVar312;
    auVar47._16_4_ = fVar382 * fVar343;
    auVar47._20_4_ = fVar383 * fVar22;
    auVar47._24_4_ = fVar384 * fVar30;
    auVar47._28_4_ = fVar353;
    auVar377._4_4_ = fVar242 * fVar279;
    auVar377._0_4_ = fVar171 * fVar263;
    auVar377._8_4_ = fVar282 * fVar283;
    auVar377._12_4_ = fVar302 * fVar287;
    auVar377._16_4_ = fVar337 * fVar291;
    auVar377._20_4_ = fVar20 * fVar295;
    auVar377._24_4_ = fVar28 * fVar299;
    auVar377._28_4_ = uStack_204;
    auVar44 = vsubps_avx(auVar377,auVar47);
    fVar144 = auVar44._28_4_;
    auVar159._0_4_ = fVar207 * fVar207 + fVar171 * fVar171 + fVar173 * fVar173;
    auVar159._4_4_ = fVar257 * fVar257 + fVar242 * fVar242 + fVar243 * fVar243;
    auVar159._8_4_ = fVar286 * fVar286 + fVar282 * fVar282 + fVar285 * fVar285;
    auVar159._12_4_ = fVar312 * fVar312 + fVar302 * fVar302 + fVar311 * fVar311;
    auVar159._16_4_ = fVar343 * fVar343 + fVar337 * fVar337 + fVar340 * fVar340;
    auVar159._20_4_ = fVar22 * fVar22 + fVar20 * fVar20 + fVar21 * fVar21;
    auVar159._24_4_ = fVar30 * fVar30 + fVar28 * fVar28 + fVar29 * fVar29;
    auVar159._28_4_ = fVar144 + fVar144 + auVar42._28_4_;
    auVar123 = vrcpps_avx(auVar159);
    fVar293 = auVar123._0_4_;
    fVar294 = auVar123._4_4_;
    auVar48._4_4_ = fVar294 * auVar159._4_4_;
    auVar48._0_4_ = fVar293 * auVar159._0_4_;
    fVar297 = auVar123._8_4_;
    auVar48._8_4_ = fVar297 * auVar159._8_4_;
    fVar298 = auVar123._12_4_;
    auVar48._12_4_ = fVar298 * auVar159._12_4_;
    fVar318 = auVar123._16_4_;
    auVar48._16_4_ = fVar318 * auVar159._16_4_;
    fVar320 = auVar123._20_4_;
    auVar48._20_4_ = fVar320 * auVar159._20_4_;
    fVar322 = auVar123._24_4_;
    auVar48._24_4_ = fVar322 * auVar159._24_4_;
    auVar48._28_4_ = uStack_204;
    auVar237._8_4_ = 0x3f800000;
    auVar237._0_8_ = 0x3f8000003f800000;
    auVar237._12_4_ = 0x3f800000;
    auVar237._16_4_ = 0x3f800000;
    auVar237._20_4_ = 0x3f800000;
    auVar237._24_4_ = 0x3f800000;
    auVar237._28_4_ = 0x3f800000;
    auVar45 = vsubps_avx(auVar237,auVar48);
    fVar293 = auVar45._0_4_ * fVar293 + fVar293;
    fVar294 = auVar45._4_4_ * fVar294 + fVar294;
    fVar297 = auVar45._8_4_ * fVar297 + fVar297;
    fVar298 = auVar45._12_4_ * fVar298 + fVar298;
    fVar318 = auVar45._16_4_ * fVar318 + fVar318;
    fVar320 = auVar45._20_4_ * fVar320 + fVar320;
    fVar322 = auVar45._24_4_ * fVar322 + fVar322;
    auVar124 = vperm2f128_avx(auVar46,auVar46,1);
    auVar124 = vshufps_avx(auVar124,auVar46,0x30);
    local_a80 = vshufps_avx(auVar46,auVar124,0x29);
    auVar124 = vperm2f128_avx(auVar392,auVar392,1);
    auVar124 = vshufps_avx(auVar124,auVar392,0x30);
    local_880 = vshufps_avx(auVar392,auVar124,0x29);
    fVar386 = local_880._0_4_;
    fVar397 = local_880._4_4_;
    auVar49._4_4_ = fVar397 * fVar242;
    auVar49._0_4_ = fVar386 * fVar171;
    fVar399 = local_880._8_4_;
    auVar49._8_4_ = fVar399 * fVar282;
    fVar401 = local_880._12_4_;
    auVar49._12_4_ = fVar401 * fVar302;
    fVar403 = local_880._16_4_;
    auVar49._16_4_ = fVar403 * fVar337;
    fVar405 = local_880._20_4_;
    auVar49._20_4_ = fVar405 * fVar20;
    fVar407 = local_880._24_4_;
    auVar49._24_4_ = fVar407 * fVar28;
    auVar49._28_4_ = auVar124._28_4_;
    fVar226 = local_a80._0_4_;
    fVar258 = local_a80._4_4_;
    auVar51._4_4_ = fVar243 * fVar258;
    auVar51._0_4_ = fVar173 * fVar226;
    fVar289 = local_a80._8_4_;
    auVar51._8_4_ = fVar285 * fVar289;
    fVar314 = local_a80._12_4_;
    auVar51._12_4_ = fVar311 * fVar314;
    fVar346 = local_a80._16_4_;
    auVar51._16_4_ = fVar340 * fVar346;
    fVar23 = local_a80._20_4_;
    auVar51._20_4_ = fVar21 * fVar23;
    fVar31 = local_a80._24_4_;
    auVar51._24_4_ = fVar29 * fVar31;
    auVar51._28_4_ = uStack_1c4;
    auVar46 = vsubps_avx(auVar51,auVar49);
    auVar124 = vperm2f128_avx(auVar50,auVar50,1);
    auVar124 = vshufps_avx(auVar124,auVar50,0x30);
    local_860 = vshufps_avx(auVar50,auVar124,0x29);
    fVar227 = local_860._0_4_;
    fVar259 = local_860._4_4_;
    auVar52._4_4_ = fVar243 * fVar259;
    auVar52._0_4_ = fVar173 * fVar227;
    fVar290 = local_860._8_4_;
    auVar52._8_4_ = fVar285 * fVar290;
    fVar316 = local_860._12_4_;
    auVar52._12_4_ = fVar311 * fVar316;
    fVar349 = local_860._16_4_;
    auVar52._16_4_ = fVar340 * fVar349;
    fVar24 = local_860._20_4_;
    auVar52._20_4_ = fVar21 * fVar24;
    fVar32 = local_860._24_4_;
    auVar52._24_4_ = fVar29 * fVar32;
    auVar52._28_4_ = auVar124._28_4_;
    auVar53._4_4_ = fVar397 * fVar257;
    auVar53._0_4_ = fVar386 * fVar207;
    auVar53._8_4_ = fVar399 * fVar286;
    auVar53._12_4_ = fVar401 * fVar312;
    auVar53._16_4_ = fVar403 * fVar343;
    auVar53._20_4_ = fVar405 * fVar22;
    uVar100 = local_880._28_4_;
    auVar53._24_4_ = fVar407 * fVar30;
    auVar53._28_4_ = uVar100;
    auVar124 = vsubps_avx(auVar53,auVar52);
    auVar54._4_4_ = fVar257 * fVar258;
    auVar54._0_4_ = fVar207 * fVar226;
    auVar54._8_4_ = fVar286 * fVar289;
    auVar54._12_4_ = fVar312 * fVar314;
    auVar54._16_4_ = fVar343 * fVar346;
    auVar54._20_4_ = fVar22 * fVar23;
    auVar54._24_4_ = fVar30 * fVar31;
    auVar54._28_4_ = uVar100;
    auVar55._4_4_ = fVar242 * fVar259;
    auVar55._0_4_ = fVar171 * fVar227;
    auVar55._8_4_ = fVar282 * fVar290;
    auVar55._12_4_ = fVar302 * fVar316;
    auVar55._16_4_ = fVar337 * fVar349;
    auVar55._20_4_ = fVar20 * fVar24;
    auVar55._24_4_ = fVar28 * fVar32;
    auVar55._28_4_ = fVar354;
    auVar392 = vsubps_avx(auVar55,auVar54);
    auVar56._4_4_ =
         (auVar42._4_4_ * auVar42._4_4_ +
         auVar193._4_4_ * auVar193._4_4_ + auVar44._4_4_ * auVar44._4_4_) * fVar294;
    auVar56._0_4_ =
         (auVar42._0_4_ * auVar42._0_4_ +
         auVar193._0_4_ * auVar193._0_4_ + auVar44._0_4_ * auVar44._0_4_) * fVar293;
    auVar56._8_4_ =
         (auVar42._8_4_ * auVar42._8_4_ +
         auVar193._8_4_ * auVar193._8_4_ + auVar44._8_4_ * auVar44._8_4_) * fVar297;
    auVar56._12_4_ =
         (auVar42._12_4_ * auVar42._12_4_ +
         auVar193._12_4_ * auVar193._12_4_ + auVar44._12_4_ * auVar44._12_4_) * fVar298;
    auVar56._16_4_ =
         (auVar42._16_4_ * auVar42._16_4_ +
         auVar193._16_4_ * auVar193._16_4_ + auVar44._16_4_ * auVar44._16_4_) * fVar318;
    auVar56._20_4_ =
         (auVar42._20_4_ * auVar42._20_4_ +
         auVar193._20_4_ * auVar193._20_4_ + auVar44._20_4_ * auVar44._20_4_) * fVar320;
    auVar56._24_4_ =
         (auVar42._24_4_ * auVar42._24_4_ +
         auVar193._24_4_ * auVar193._24_4_ + auVar44._24_4_ * auVar44._24_4_) * fVar322;
    auVar56._28_4_ = auVar42._28_4_ + auVar193._28_4_ + fVar144;
    auVar57._4_4_ =
         (auVar46._4_4_ * auVar46._4_4_ +
         auVar124._4_4_ * auVar124._4_4_ + auVar392._4_4_ * auVar392._4_4_) * fVar294;
    auVar57._0_4_ =
         (auVar46._0_4_ * auVar46._0_4_ +
         auVar124._0_4_ * auVar124._0_4_ + auVar392._0_4_ * auVar392._0_4_) * fVar293;
    auVar57._8_4_ =
         (auVar46._8_4_ * auVar46._8_4_ +
         auVar124._8_4_ * auVar124._8_4_ + auVar392._8_4_ * auVar392._8_4_) * fVar297;
    auVar57._12_4_ =
         (auVar46._12_4_ * auVar46._12_4_ +
         auVar124._12_4_ * auVar124._12_4_ + auVar392._12_4_ * auVar392._12_4_) * fVar298;
    auVar57._16_4_ =
         (auVar46._16_4_ * auVar46._16_4_ +
         auVar124._16_4_ * auVar124._16_4_ + auVar392._16_4_ * auVar392._16_4_) * fVar318;
    auVar57._20_4_ =
         (auVar46._20_4_ * auVar46._20_4_ +
         auVar124._20_4_ * auVar124._20_4_ + auVar392._20_4_ * auVar392._20_4_) * fVar320;
    auVar57._24_4_ =
         (auVar46._24_4_ * auVar46._24_4_ +
         auVar124._24_4_ * auVar124._24_4_ + auVar392._24_4_ * auVar392._24_4_) * fVar322;
    auVar57._28_4_ = auVar45._28_4_ + auVar123._28_4_;
    auVar123 = vmaxps_avx(auVar56,auVar57);
    auVar124 = vperm2f128_avx(_local_b40,_local_b40,1);
    auVar124 = vshufps_avx(auVar124,_local_b40,0x30);
    auVar193 = vshufps_avx(_local_b40,auVar124,0x29);
    auVar125._0_4_ = (float)local_b40._0_4_ + fVar229;
    auVar125._4_4_ = (float)local_b40._4_4_ + fVar241;
    auVar125._8_4_ = fStack_b38 + fVar277;
    auVar125._12_4_ = fStack_b34 + fVar281;
    auVar125._16_4_ = fStack_b30 + fVar228;
    auVar125._20_4_ = fStack_b2c + fVar240;
    auVar125._24_4_ = fStack_b28 + fVar261;
    auVar125._28_4_ = fStack_b24 + fVar278;
    auVar124 = vmaxps_avx(_local_b40,auVar125);
    auVar42 = vmaxps_avx(auVar160,auVar193);
    auVar124 = vmaxps_avx(auVar124,auVar42);
    auVar42 = vrsqrtps_avx(auVar159);
    fVar144 = auVar42._0_4_;
    fVar228 = auVar42._4_4_;
    fVar229 = auVar42._8_4_;
    fVar240 = auVar42._12_4_;
    fVar241 = auVar42._16_4_;
    fVar261 = auVar42._20_4_;
    fVar277 = auVar42._24_4_;
    auVar58._4_4_ = fVar228 * fVar228 * fVar228 * auVar159._4_4_ * 0.5;
    auVar58._0_4_ = fVar144 * fVar144 * fVar144 * auVar159._0_4_ * 0.5;
    auVar58._8_4_ = fVar229 * fVar229 * fVar229 * auVar159._8_4_ * 0.5;
    auVar58._12_4_ = fVar240 * fVar240 * fVar240 * auVar159._12_4_ * 0.5;
    auVar58._16_4_ = fVar241 * fVar241 * fVar241 * auVar159._16_4_ * 0.5;
    auVar58._20_4_ = fVar261 * fVar261 * fVar261 * auVar159._20_4_ * 0.5;
    auVar58._24_4_ = fVar277 * fVar277 * fVar277 * auVar159._24_4_ * 0.5;
    auVar58._28_4_ = auVar159._28_4_;
    auVar59._4_4_ = fVar228 * 1.5;
    auVar59._0_4_ = fVar144 * 1.5;
    auVar59._8_4_ = fVar229 * 1.5;
    auVar59._12_4_ = fVar240 * 1.5;
    auVar59._16_4_ = fVar241 * 1.5;
    auVar59._20_4_ = fVar261 * 1.5;
    auVar59._24_4_ = fVar277 * 1.5;
    auVar59._28_4_ = auVar42._28_4_;
    local_580 = vsubps_avx(auVar59,auVar58);
    auVar90 = ZEXT412(0);
    auVar378 = ZEXT1264(auVar90) << 0x20;
    auVar92._4_4_ = fVar336;
    auVar92._0_4_ = fVar324;
    auVar92._8_4_ = fVar339;
    auVar92._12_4_ = fVar342;
    auVar92._16_4_ = fVar345;
    auVar92._20_4_ = fVar348;
    auVar92._24_4_ = fVar351;
    auVar92._28_4_ = fVar354;
    auVar44 = vsubps_avx(ZEXT1232(auVar90) << 0x20,auVar92);
    auVar45 = vsubps_avx(ZEXT1232(auVar90) << 0x20,auVar96);
    fVar228 = auVar45._0_4_;
    fVar261 = auVar45._4_4_;
    fVar293 = auVar45._8_4_;
    fVar318 = auVar45._12_4_;
    fVar352 = auVar45._16_4_;
    fVar25 = auVar45._20_4_;
    fVar33 = auVar45._24_4_;
    fVar229 = auVar44._0_4_;
    fVar277 = auVar44._4_4_;
    fVar294 = auVar44._8_4_;
    fVar320 = auVar44._12_4_;
    fVar362 = auVar44._16_4_;
    fVar26 = auVar44._20_4_;
    fVar34 = auVar44._24_4_;
    auVar93._4_4_ = fVar335;
    auVar93._0_4_ = fVar323;
    auVar93._8_4_ = fVar338;
    auVar93._12_4_ = fVar341;
    auVar93._16_4_ = fVar344;
    auVar93._20_4_ = fVar347;
    auVar93._24_4_ = fVar350;
    auVar93._28_4_ = fVar353;
    auVar377 = ZEXT1232(auVar90) << 0x20;
    auVar46 = vsubps_avx(auVar377,auVar93);
    fVar240 = auVar46._0_4_;
    fVar278 = auVar46._4_4_;
    fVar297 = auVar46._8_4_;
    fVar322 = auVar46._12_4_;
    fVar363 = auVar46._16_4_;
    fVar27 = auVar46._20_4_;
    fVar35 = auVar46._24_4_;
    auVar389._0_4_ =
         (float)local_ac0._0_4_ * fVar240 +
         (float)local_a00._0_4_ * fVar229 + (float)local_8a0._0_4_ * fVar228;
    auVar389._4_4_ =
         (float)local_ac0._4_4_ * fVar278 +
         (float)local_a00._4_4_ * fVar277 + (float)local_8a0._4_4_ * fVar261;
    auVar389._8_4_ = fStack_ab8 * fVar297 + fStack_9f8 * fVar294 + fStack_898 * fVar293;
    auVar389._12_4_ = fStack_ab4 * fVar322 + fStack_9f4 * fVar320 + fStack_894 * fVar318;
    auVar389._16_4_ = fStack_ab0 * fVar363 + fStack_9f0 * fVar362 + fStack_890 * fVar352;
    auVar389._20_4_ = fStack_aac * fVar27 + fStack_9ec * fVar26 + fStack_88c * fVar25;
    auVar389._24_4_ = fStack_aa8 * fVar35 + fStack_9e8 * fVar34 + fStack_888 * fVar33;
    auVar389._28_4_ = fVar354 + auVar392._28_4_ + auVar42._28_4_;
    auVar408._0_4_ = fVar240 * fVar240 + fVar229 * fVar229 + fVar228 * fVar228;
    auVar408._4_4_ = fVar278 * fVar278 + fVar277 * fVar277 + fVar261 * fVar261;
    auVar408._8_4_ = fVar297 * fVar297 + fVar294 * fVar294 + fVar293 * fVar293;
    auVar408._12_4_ = fVar322 * fVar322 + fVar320 * fVar320 + fVar318 * fVar318;
    auVar408._16_4_ = fVar363 * fVar363 + fVar362 * fVar362 + fVar352 * fVar352;
    auVar408._20_4_ = fVar27 * fVar27 + fVar26 * fVar26 + fVar25 * fVar25;
    auVar408._24_4_ = fVar35 * fVar35 + fVar34 * fVar34 + fVar33 * fVar33;
    auVar408._28_4_ = fStack_b24 + fStack_b24 + fVar354;
    fVar241 = local_580._0_4_;
    fVar281 = local_580._4_4_;
    fVar298 = local_580._8_4_;
    fVar334 = local_580._12_4_;
    fVar373 = local_580._16_4_;
    fVar260 = local_580._20_4_;
    fVar262 = local_580._24_4_;
    local_5c0 = (float)local_ac0._0_4_ * fVar207 * fVar241 +
                fVar171 * fVar241 * (float)local_a00._0_4_ +
                fVar173 * fVar241 * (float)local_8a0._0_4_;
    fStack_5bc = (float)local_ac0._4_4_ * fVar257 * fVar281 +
                 fVar242 * fVar281 * (float)local_a00._4_4_ +
                 fVar243 * fVar281 * (float)local_8a0._4_4_;
    fStack_5b8 = fStack_ab8 * fVar286 * fVar298 +
                 fVar282 * fVar298 * fStack_9f8 + fVar285 * fVar298 * fStack_898;
    fStack_5b4 = fStack_ab4 * fVar312 * fVar334 +
                 fVar302 * fVar334 * fStack_9f4 + fVar311 * fVar334 * fStack_894;
    fStack_5b0 = fStack_ab0 * fVar343 * fVar373 +
                 fVar337 * fVar373 * fStack_9f0 + fVar340 * fVar373 * fStack_890;
    fStack_5ac = fStack_aac * fVar22 * fVar260 +
                 fVar20 * fVar260 * fStack_9ec + fVar21 * fVar260 * fStack_88c;
    fStack_5a8 = fStack_aa8 * fVar30 * fVar262 +
                 fVar28 * fVar262 * fStack_9e8 + fVar29 * fVar262 * fStack_888;
    fStack_5a4 = fStack_aa4 + fStack_9e4 + fStack_884;
    fVar144 = fStack_aa4 + fStack_9e4 + fStack_884;
    local_aa0._0_4_ =
         fVar240 * fVar207 * fVar241 + fVar171 * fVar241 * fVar229 + fVar173 * fVar241 * fVar228;
    local_aa0._4_4_ =
         fVar278 * fVar257 * fVar281 + fVar242 * fVar281 * fVar277 + fVar243 * fVar281 * fVar261;
    local_aa0._8_4_ =
         fVar297 * fVar286 * fVar298 + fVar282 * fVar298 * fVar294 + fVar285 * fVar298 * fVar293;
    local_aa0._12_4_ =
         fVar322 * fVar312 * fVar334 + fVar302 * fVar334 * fVar320 + fVar311 * fVar334 * fVar318;
    local_aa0._16_4_ =
         fVar363 * fVar343 * fVar373 + fVar337 * fVar373 * fVar362 + fVar340 * fVar373 * fVar352;
    local_aa0._20_4_ =
         fVar27 * fVar22 * fVar260 + fVar20 * fVar260 * fVar26 + fVar21 * fVar260 * fVar25;
    local_aa0._24_4_ =
         fVar35 * fVar30 * fVar262 + fVar28 * fVar262 * fVar34 + fVar29 * fVar262 * fVar33;
    local_aa0._28_4_ = fStack_9e4 + fVar144;
    auVar60._4_4_ = fStack_5bc * local_aa0._4_4_;
    auVar60._0_4_ = local_5c0 * (float)local_aa0._0_4_;
    auVar60._8_4_ = fStack_5b8 * local_aa0._8_4_;
    auVar60._12_4_ = fStack_5b4 * local_aa0._12_4_;
    auVar60._16_4_ = fStack_5b0 * local_aa0._16_4_;
    auVar60._20_4_ = fStack_5ac * local_aa0._20_4_;
    auVar60._24_4_ = fStack_5a8 * local_aa0._24_4_;
    auVar60._28_4_ = fVar144;
    auVar392 = vsubps_avx(auVar389,auVar60);
    auVar61._4_4_ = local_aa0._4_4_ * local_aa0._4_4_;
    auVar61._0_4_ = (float)local_aa0._0_4_ * (float)local_aa0._0_4_;
    auVar61._8_4_ = local_aa0._8_4_ * local_aa0._8_4_;
    auVar61._12_4_ = local_aa0._12_4_ * local_aa0._12_4_;
    auVar61._16_4_ = local_aa0._16_4_ * local_aa0._16_4_;
    auVar61._20_4_ = local_aa0._20_4_ * local_aa0._20_4_;
    auVar61._24_4_ = local_aa0._24_4_ * local_aa0._24_4_;
    auVar61._28_4_ = fStack_9e4;
    auVar47 = vsubps_avx(auVar408,auVar61);
    auVar42 = vsqrtps_avx(auVar123);
    fVar144 = (auVar42._0_4_ + auVar124._0_4_) * 1.0000002;
    fVar136 = (auVar42._4_4_ + auVar124._4_4_) * 1.0000002;
    fVar137 = (auVar42._8_4_ + auVar124._8_4_) * 1.0000002;
    fVar138 = (auVar42._12_4_ + auVar124._12_4_) * 1.0000002;
    fVar139 = (auVar42._16_4_ + auVar124._16_4_) * 1.0000002;
    fVar140 = (auVar42._20_4_ + auVar124._20_4_) * 1.0000002;
    fVar141 = (auVar42._24_4_ + auVar124._24_4_) * 1.0000002;
    auVar62._4_4_ = fVar136 * fVar136;
    auVar62._0_4_ = fVar144 * fVar144;
    auVar62._8_4_ = fVar137 * fVar137;
    auVar62._12_4_ = fVar138 * fVar138;
    auVar62._16_4_ = fVar139 * fVar139;
    auVar62._20_4_ = fVar140 * fVar140;
    auVar62._24_4_ = fVar141 * fVar141;
    auVar62._28_4_ = auVar42._28_4_ + auVar124._28_4_;
    fVar136 = auVar392._0_4_ + auVar392._0_4_;
    fVar137 = auVar392._4_4_ + auVar392._4_4_;
    local_9e0._0_8_ = CONCAT44(fVar137,fVar136);
    local_9e0._8_4_ = auVar392._8_4_ + auVar392._8_4_;
    local_9e0._12_4_ = auVar392._12_4_ + auVar392._12_4_;
    local_9e0._16_4_ = auVar392._16_4_ + auVar392._16_4_;
    local_9e0._20_4_ = auVar392._20_4_ + auVar392._20_4_;
    local_9e0._24_4_ = auVar392._24_4_ + auVar392._24_4_;
    fVar144 = auVar392._28_4_;
    local_9e0._28_4_ = fVar144 + fVar144;
    auVar124 = vsubps_avx(auVar47,auVar62);
    local_340._4_4_ = fStack_5bc * fStack_5bc;
    local_340._0_4_ = local_5c0 * local_5c0;
    local_340._8_4_ = fStack_5b8 * fStack_5b8;
    local_340._12_4_ = fStack_5b4 * fStack_5b4;
    local_340._16_4_ = fStack_5b0 * fStack_5b0;
    local_340._20_4_ = fStack_5ac * fStack_5ac;
    local_340._24_4_ = fStack_5a8 * fStack_5a8;
    local_340._28_4_ = auVar41._28_4_;
    auVar372 = ZEXT3264(local_340);
    local_5a0 = vsubps_avx(local_2c0,local_340);
    auVar358 = ZEXT3264(local_5a0);
    auVar63._4_4_ = fVar137 * fVar137;
    auVar63._0_4_ = fVar136 * fVar136;
    auVar63._8_4_ = local_9e0._8_4_ * local_9e0._8_4_;
    auVar63._12_4_ = local_9e0._12_4_ * local_9e0._12_4_;
    auVar63._16_4_ = local_9e0._16_4_ * local_9e0._16_4_;
    auVar63._20_4_ = local_9e0._20_4_ * local_9e0._20_4_;
    auVar63._24_4_ = local_9e0._24_4_ * local_9e0._24_4_;
    auVar63._28_4_ = fVar144;
    fVar138 = local_5a0._0_4_;
    fVar139 = local_5a0._4_4_;
    fVar140 = local_5a0._8_4_;
    fVar141 = local_5a0._12_4_;
    fVar359 = local_5a0._16_4_;
    fVar360 = local_5a0._20_4_;
    fVar361 = local_5a0._24_4_;
    auVar41._4_4_ = auVar124._4_4_ * fVar139 * 4.0;
    auVar41._0_4_ = auVar124._0_4_ * fVar138 * 4.0;
    auVar41._8_4_ = auVar124._8_4_ * fVar140 * 4.0;
    auVar41._12_4_ = auVar124._12_4_ * fVar141 * 4.0;
    auVar41._16_4_ = auVar124._16_4_ * fVar359 * 4.0;
    auVar41._20_4_ = auVar124._20_4_ * fVar360 * 4.0;
    auVar41._24_4_ = auVar124._24_4_ * fVar361 * 4.0;
    auVar41._28_4_ = 0x40800000;
    auVar41 = vsubps_avx(auVar63,auVar41);
    auVar123 = vcmpps_avx(auVar41,auVar377,5);
    fVar144 = local_5a0._28_4_;
    if ((((((((auVar123 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar123 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar123 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar123 >> 0x7f,0) == '\0') &&
          (auVar123 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar123 >> 0xbf,0) == '\0') &&
        (auVar123 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar123[0x1f])
    {
      local_c80._8_4_ = 0x7f800000;
      local_c80._0_8_ = 0x7f8000007f800000;
      local_c80._12_4_ = 0x7f800000;
      local_c80._16_4_ = 0x7f800000;
      local_c80._20_4_ = 0x7f800000;
      local_c80._24_4_ = 0x7f800000;
      local_c80._28_4_ = 0x7f800000;
      auVar409._8_4_ = 0xff800000;
      auVar409._0_8_ = 0xff800000ff800000;
      auVar409._12_4_ = 0xff800000;
      auVar409._16_4_ = 0xff800000;
      auVar409._20_4_ = 0xff800000;
      auVar409._24_4_ = 0xff800000;
      auVar409._28_4_ = 0xff800000;
    }
    else {
      auVar392 = vcmpps_avx(auVar41,auVar377,5);
      auVar378 = ZEXT3264(auVar392);
      auVar377 = vsqrtps_avx(auVar41);
      auVar269._0_4_ = fVar138 + fVar138;
      auVar269._4_4_ = fVar139 + fVar139;
      auVar269._8_4_ = fVar140 + fVar140;
      auVar269._12_4_ = fVar141 + fVar141;
      auVar269._16_4_ = fVar359 + fVar359;
      auVar269._20_4_ = fVar360 + fVar360;
      auVar269._24_4_ = fVar361 + fVar361;
      auVar269._28_4_ = fVar144 + fVar144;
      auVar41 = vrcpps_avx(auVar269);
      fVar264 = auVar41._0_4_;
      fVar280 = auVar41._4_4_;
      auVar64._4_4_ = auVar269._4_4_ * fVar280;
      auVar64._0_4_ = auVar269._0_4_ * fVar264;
      fVar284 = auVar41._8_4_;
      auVar64._8_4_ = auVar269._8_4_ * fVar284;
      fVar288 = auVar41._12_4_;
      auVar64._12_4_ = auVar269._12_4_ * fVar288;
      fVar292 = auVar41._16_4_;
      auVar64._16_4_ = auVar269._16_4_ * fVar292;
      fVar296 = auVar41._20_4_;
      auVar64._20_4_ = auVar269._20_4_ * fVar296;
      fVar300 = auVar41._24_4_;
      auVar64._24_4_ = auVar269._24_4_ * fVar300;
      auVar64._28_4_ = auVar269._28_4_;
      auVar330._8_4_ = 0x3f800000;
      auVar330._0_8_ = 0x3f8000003f800000;
      auVar330._12_4_ = 0x3f800000;
      auVar330._16_4_ = 0x3f800000;
      auVar330._20_4_ = 0x3f800000;
      auVar330._24_4_ = 0x3f800000;
      auVar330._28_4_ = 0x3f800000;
      auVar48 = vsubps_avx(auVar330,auVar64);
      fVar264 = fVar264 + fVar264 * auVar48._0_4_;
      fVar280 = fVar280 + fVar280 * auVar48._4_4_;
      fVar284 = fVar284 + fVar284 * auVar48._8_4_;
      fVar288 = fVar288 + fVar288 * auVar48._12_4_;
      fVar292 = fVar292 + fVar292 * auVar48._16_4_;
      fVar296 = fVar296 + fVar296 * auVar48._20_4_;
      fVar300 = fVar300 + fVar300 * auVar48._24_4_;
      auVar308._0_8_ = CONCAT44(fVar137,fVar136) ^ 0x8000000080000000;
      auVar308._8_4_ = -local_9e0._8_4_;
      auVar308._12_4_ = -local_9e0._12_4_;
      auVar308._16_4_ = -local_9e0._16_4_;
      auVar308._20_4_ = -local_9e0._20_4_;
      auVar308._24_4_ = -local_9e0._24_4_;
      auVar308._28_4_ = -local_9e0._28_4_;
      auVar49 = vsubps_avx(auVar308,auVar377);
      fVar136 = auVar49._0_4_ * fVar264;
      fVar137 = auVar49._4_4_ * fVar280;
      auVar65._4_4_ = fVar137;
      auVar65._0_4_ = fVar136;
      fVar313 = auVar49._8_4_ * fVar284;
      auVar65._8_4_ = fVar313;
      fVar315 = auVar49._12_4_ * fVar288;
      auVar65._12_4_ = fVar315;
      fVar317 = auVar49._16_4_ * fVar292;
      auVar65._16_4_ = fVar317;
      fVar319 = auVar49._20_4_ * fVar296;
      auVar65._20_4_ = fVar319;
      fVar321 = auVar49._24_4_ * fVar300;
      auVar65._24_4_ = fVar321;
      auVar65._28_4_ = auVar49._28_4_;
      auVar377 = vsubps_avx(auVar377,local_9e0);
      fVar264 = auVar377._0_4_ * fVar264;
      fVar280 = auVar377._4_4_ * fVar280;
      auVar66._4_4_ = fVar280;
      auVar66._0_4_ = fVar264;
      fVar284 = auVar377._8_4_ * fVar284;
      auVar66._8_4_ = fVar284;
      fVar288 = auVar377._12_4_ * fVar288;
      auVar66._12_4_ = fVar288;
      fVar292 = auVar377._16_4_ * fVar292;
      auVar66._16_4_ = fVar292;
      fVar296 = auVar377._20_4_ * fVar296;
      auVar66._20_4_ = fVar296;
      fVar300 = auVar377._24_4_ * fVar300;
      auVar66._24_4_ = fVar300;
      auVar66._28_4_ = auVar377._28_4_;
      local_300 = fVar241 * ((float)local_aa0._0_4_ + local_5c0 * fVar136);
      fStack_2fc = fVar281 * (local_aa0._4_4_ + fStack_5bc * fVar137);
      fStack_2f8 = fVar298 * (local_aa0._8_4_ + fStack_5b8 * fVar313);
      fStack_2f4 = fVar334 * (local_aa0._12_4_ + fStack_5b4 * fVar315);
      fStack_2f0 = fVar373 * (local_aa0._16_4_ + fStack_5b0 * fVar317);
      fStack_2ec = fVar260 * (local_aa0._20_4_ + fStack_5ac * fVar319);
      fStack_2e8 = fVar262 * (local_aa0._24_4_ + fStack_5a8 * fVar321);
      fStack_2e4 = local_aa0._28_4_ + auVar41._28_4_ + auVar48._28_4_;
      auVar390._8_4_ = 0x7fffffff;
      auVar390._0_8_ = 0x7fffffff7fffffff;
      auVar390._12_4_ = 0x7fffffff;
      auVar390._16_4_ = 0x7fffffff;
      auVar390._20_4_ = 0x7fffffff;
      auVar390._24_4_ = 0x7fffffff;
      auVar390._28_4_ = 0x7fffffff;
      auVar41 = vandps_avx(local_340,auVar390);
      auVar377 = vmaxps_avx(local_520,auVar41);
      auVar67._4_4_ = auVar377._4_4_ * 1.9073486e-06;
      auVar67._0_4_ = auVar377._0_4_ * 1.9073486e-06;
      auVar67._8_4_ = auVar377._8_4_ * 1.9073486e-06;
      auVar67._12_4_ = auVar377._12_4_ * 1.9073486e-06;
      auVar67._16_4_ = auVar377._16_4_ * 1.9073486e-06;
      auVar67._20_4_ = auVar377._20_4_ * 1.9073486e-06;
      auVar67._24_4_ = auVar377._24_4_ * 1.9073486e-06;
      auVar67._28_4_ = auVar377._28_4_;
      auVar41 = vandps_avx(local_5a0,auVar390);
      auVar41 = vcmpps_avx(auVar41,auVar67,1);
      auVar331._8_4_ = 0x7f800000;
      auVar331._0_8_ = 0x7f8000007f800000;
      auVar331._12_4_ = 0x7f800000;
      auVar331._16_4_ = 0x7f800000;
      auVar331._20_4_ = 0x7f800000;
      auVar331._24_4_ = 0x7f800000;
      auVar331._28_4_ = 0x7f800000;
      local_c80 = vblendvps_avx(auVar331,auVar65,auVar392);
      local_320 = fVar241 * ((float)local_aa0._0_4_ + local_5c0 * fVar264);
      fStack_31c = fVar281 * (local_aa0._4_4_ + fStack_5bc * fVar280);
      fStack_318 = fVar298 * (local_aa0._8_4_ + fStack_5b8 * fVar284);
      fStack_314 = fVar334 * (local_aa0._12_4_ + fStack_5b4 * fVar288);
      fStack_310 = fVar373 * (local_aa0._16_4_ + fStack_5b0 * fVar292);
      fStack_30c = fVar260 * (local_aa0._20_4_ + fStack_5ac * fVar296);
      fStack_308 = fVar262 * (local_aa0._24_4_ + fStack_5a8 * fVar300);
      fStack_304 = local_aa0._28_4_ + auVar377._28_4_;
      auVar270._8_4_ = 0xff800000;
      auVar270._0_8_ = 0xff800000ff800000;
      auVar270._12_4_ = 0xff800000;
      auVar270._16_4_ = 0xff800000;
      auVar270._20_4_ = 0xff800000;
      auVar270._24_4_ = 0xff800000;
      auVar270._28_4_ = 0xff800000;
      auVar409 = vblendvps_avx(auVar270,auVar66,auVar392);
      auVar377 = auVar392 & auVar41;
      if ((((((((auVar377 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar377 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar377 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar377 >> 0x7f,0) != '\0') ||
            (auVar377 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar377 >> 0xbf,0) != '\0') ||
          (auVar377 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar377[0x1f] < '\0') {
        auVar123 = vandps_avx(auVar41,auVar392);
        auVar189 = vpackssdw_avx(auVar123._0_16_,auVar123._16_16_);
        auVar41 = vcmpps_avx(auVar124,ZEXT832(0) << 0x20,2);
        auVar394._8_4_ = 0xff800000;
        auVar394._0_8_ = 0xff800000ff800000;
        auVar394._12_4_ = 0xff800000;
        auVar394._16_4_ = 0xff800000;
        auVar394._20_4_ = 0xff800000;
        auVar394._24_4_ = 0xff800000;
        auVar394._28_4_ = 0xff800000;
        auVar411._8_4_ = 0x7f800000;
        auVar411._0_8_ = 0x7f8000007f800000;
        auVar411._12_4_ = 0x7f800000;
        auVar411._16_4_ = 0x7f800000;
        auVar411._20_4_ = 0x7f800000;
        auVar411._24_4_ = 0x7f800000;
        auVar411._28_4_ = 0x7f800000;
        auVar124 = vblendvps_avx(auVar411,auVar394,auVar41);
        auVar185 = vpmovsxwd_avx(auVar189);
        auVar189 = vpunpckhwd_avx(auVar189,auVar189);
        auVar256._16_16_ = auVar189;
        auVar256._0_16_ = auVar185;
        local_c80 = vblendvps_avx(local_c80,auVar124,auVar256);
        auVar124 = vblendvps_avx(auVar394,auVar411,auVar41);
        auVar409 = vblendvps_avx(auVar409,auVar124,auVar256);
        auVar124 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar134._0_4_ = auVar123._0_4_ ^ auVar124._0_4_;
        auVar134._4_4_ = auVar123._4_4_ ^ auVar124._4_4_;
        auVar134._8_4_ = auVar123._8_4_ ^ auVar124._8_4_;
        auVar134._12_4_ = auVar123._12_4_ ^ auVar124._12_4_;
        auVar134._16_4_ = auVar123._16_4_ ^ auVar124._16_4_;
        auVar134._20_4_ = auVar123._20_4_ ^ auVar124._20_4_;
        auVar134._24_4_ = auVar123._24_4_ ^ auVar124._24_4_;
        auVar134._28_4_ = auVar123._28_4_ ^ auVar124._28_4_;
        auVar123 = vorps_avx(auVar41,auVar134);
        auVar123 = vandps_avx(auVar392,auVar123);
      }
    }
    auVar367 = ZEXT3264(local_aa0);
    auVar310 = ZEXT3264(local_9e0);
    auVar124 = local_500 & auVar123;
    auVar276 = ZEXT3264(_local_a00);
    if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar124 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar124 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar124 >> 0x7f,0) != '\0') ||
          (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar124 >> 0xbf,0) != '\0') ||
        (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar124[0x1f] < '\0') {
      local_930 = ZEXT416((uint)*(float *)(ray + k * 4 + 0x100));
      auVar189 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_920._0_4_));
      auVar189 = vshufps_avx(auVar189,auVar189,0);
      auVar251._16_16_ = auVar189;
      auVar251._0_16_ = auVar189;
      auVar392 = vminps_avx(auVar251,auVar409);
      fVar296 = auVar45._28_4_;
      auVar367 = ZEXT3264(_local_8a0);
      auVar192._0_4_ =
           (float)local_ac0._0_4_ * fVar263 +
           (float)local_a00._0_4_ * fVar374 + (float)local_8a0._0_4_ * fVar385;
      auVar192._4_4_ =
           (float)local_ac0._4_4_ * fVar279 +
           (float)local_a00._4_4_ * fVar379 + (float)local_8a0._4_4_ * fVar396;
      auVar192._8_4_ = fStack_ab8 * fVar283 + fStack_9f8 * fVar380 + fStack_898 * fVar398;
      auVar192._12_4_ = fStack_ab4 * fVar287 + fStack_9f4 * fVar381 + fStack_894 * fVar400;
      auVar192._16_4_ = fStack_ab0 * fVar291 + fStack_9f0 * fVar382 + fStack_890 * fVar402;
      auVar192._20_4_ = fStack_aac * fVar295 + fStack_9ec * fVar383 + fStack_88c * fVar404;
      auVar192._24_4_ = fStack_aa8 * fVar299 + fStack_9e8 * fVar384 + fStack_888 * fVar406;
      auVar192._28_4_ = fVar296 + fVar296 + auVar46._28_4_;
      auVar124 = vrcpps_avx(auVar192);
      fVar136 = auVar124._0_4_;
      fVar137 = auVar124._4_4_;
      auVar68._4_4_ = auVar192._4_4_ * fVar137;
      auVar68._0_4_ = auVar192._0_4_ * fVar136;
      fVar264 = auVar124._8_4_;
      auVar68._8_4_ = auVar192._8_4_ * fVar264;
      fVar280 = auVar124._12_4_;
      auVar68._12_4_ = auVar192._12_4_ * fVar280;
      fVar284 = auVar124._16_4_;
      auVar68._16_4_ = auVar192._16_4_ * fVar284;
      fVar288 = auVar124._20_4_;
      auVar68._20_4_ = auVar192._20_4_ * fVar288;
      fVar292 = auVar124._24_4_;
      auVar68._24_4_ = auVar192._24_4_ * fVar292;
      auVar68._28_4_ = fVar301;
      auVar332._8_4_ = 0x3f800000;
      auVar332._0_8_ = 0x3f8000003f800000;
      auVar332._12_4_ = 0x3f800000;
      auVar332._16_4_ = 0x3f800000;
      auVar332._20_4_ = 0x3f800000;
      auVar332._24_4_ = 0x3f800000;
      auVar332._28_4_ = 0x3f800000;
      auVar45 = vsubps_avx(auVar332,auVar68);
      auVar309._8_4_ = 0x7fffffff;
      auVar309._0_8_ = 0x7fffffff7fffffff;
      auVar309._12_4_ = 0x7fffffff;
      auVar309._16_4_ = 0x7fffffff;
      auVar309._20_4_ = 0x7fffffff;
      auVar309._24_4_ = 0x7fffffff;
      auVar309._28_4_ = 0x7fffffff;
      auVar124 = vandps_avx(auVar192,auVar309);
      auVar391._8_4_ = 0x219392ef;
      auVar391._0_8_ = 0x219392ef219392ef;
      auVar391._12_4_ = 0x219392ef;
      auVar391._16_4_ = 0x219392ef;
      auVar391._20_4_ = 0x219392ef;
      auVar391._24_4_ = 0x219392ef;
      auVar391._28_4_ = 0x219392ef;
      auVar41 = vcmpps_avx(auVar124,auVar391,1);
      auVar69._4_4_ =
           (fVar137 + fVar137 * auVar45._4_4_) *
           -(fVar279 * fVar278 + fVar379 * fVar277 + fVar396 * fVar261);
      auVar69._0_4_ =
           (fVar136 + fVar136 * auVar45._0_4_) *
           -(fVar263 * fVar240 + fVar374 * fVar229 + fVar385 * fVar228);
      auVar69._8_4_ =
           (fVar264 + fVar264 * auVar45._8_4_) *
           -(fVar283 * fVar297 + fVar380 * fVar294 + fVar398 * fVar293);
      auVar69._12_4_ =
           (fVar280 + fVar280 * auVar45._12_4_) *
           -(fVar287 * fVar322 + fVar381 * fVar320 + fVar400 * fVar318);
      auVar69._16_4_ =
           (fVar284 + fVar284 * auVar45._16_4_) *
           -(fVar291 * fVar363 + fVar382 * fVar362 + fVar402 * fVar352);
      auVar69._20_4_ =
           (fVar288 + fVar288 * auVar45._20_4_) *
           -(fVar295 * fVar27 + fVar383 * fVar26 + fVar404 * fVar25);
      auVar69._24_4_ =
           (fVar292 + fVar292 * auVar45._24_4_) *
           -(fVar299 * fVar35 + fVar384 * fVar34 + fVar406 * fVar33);
      auVar69._28_4_ = -(auVar46._28_4_ + auVar44._28_4_ + fVar296);
      auVar90 = ZEXT812(0);
      auVar124 = vcmpps_avx(auVar192,ZEXT1232(auVar90) << 0x20,1);
      auVar124 = vorps_avx(auVar41,auVar124);
      auVar357._8_4_ = 0xff800000;
      auVar357._0_8_ = 0xff800000ff800000;
      auVar357._12_4_ = 0xff800000;
      auVar357._16_4_ = 0xff800000;
      auVar357._20_4_ = 0xff800000;
      auVar357._24_4_ = 0xff800000;
      auVar357._28_4_ = 0xff800000;
      auVar358 = ZEXT3264(auVar357);
      auVar124 = vblendvps_avx(auVar69,auVar357,auVar124);
      auVar44 = vcmpps_avx(auVar192,ZEXT1232(auVar90) << 0x20,6);
      auVar41 = vorps_avx(auVar41,auVar44);
      auVar370._8_4_ = 0x7f800000;
      auVar370._0_8_ = 0x7f8000007f800000;
      auVar370._12_4_ = 0x7f800000;
      auVar370._16_4_ = 0x7f800000;
      auVar370._20_4_ = 0x7f800000;
      auVar370._24_4_ = 0x7f800000;
      auVar370._28_4_ = 0x7f800000;
      auVar372 = ZEXT3264(auVar370);
      auVar41 = vblendvps_avx(auVar69,auVar370,auVar41);
      auVar44 = vmaxps_avx(local_2e0,local_c80);
      auVar44 = vmaxps_avx(auVar44,auVar124);
      auVar41 = vminps_avx(auVar392,auVar41);
      auVar392 = ZEXT1232(auVar90) << 0x20;
      auVar124 = vsubps_avx(auVar392,local_9c0);
      auVar39 = vsubps_avx(auVar392,auVar39);
      auVar70._4_4_ = auVar39._4_4_ * -fVar397;
      auVar70._0_4_ = auVar39._0_4_ * -fVar386;
      auVar70._8_4_ = auVar39._8_4_ * -fVar399;
      auVar70._12_4_ = auVar39._12_4_ * -fVar401;
      auVar70._16_4_ = auVar39._16_4_ * -fVar403;
      auVar70._20_4_ = auVar39._20_4_ * -fVar405;
      auVar70._24_4_ = auVar39._24_4_ * -fVar407;
      auVar70._28_4_ = auVar39._28_4_;
      auVar71._4_4_ = fVar258 * auVar124._4_4_;
      auVar71._0_4_ = fVar226 * auVar124._0_4_;
      auVar71._8_4_ = fVar289 * auVar124._8_4_;
      auVar71._12_4_ = fVar314 * auVar124._12_4_;
      auVar71._16_4_ = fVar346 * auVar124._16_4_;
      auVar71._20_4_ = fVar23 * auVar124._20_4_;
      auVar71._24_4_ = fVar31 * auVar124._24_4_;
      auVar71._28_4_ = auVar124._28_4_;
      auVar124 = vsubps_avx(auVar70,auVar71);
      auVar39 = vsubps_avx(auVar392,auVar393);
      auVar72._4_4_ = fVar259 * auVar39._4_4_;
      auVar72._0_4_ = fVar227 * auVar39._0_4_;
      auVar72._8_4_ = fVar290 * auVar39._8_4_;
      auVar72._12_4_ = fVar316 * auVar39._12_4_;
      auVar72._16_4_ = fVar349 * auVar39._16_4_;
      auVar72._20_4_ = fVar24 * auVar39._20_4_;
      uVar8 = auVar39._28_4_;
      auVar72._24_4_ = fVar32 * auVar39._24_4_;
      auVar72._28_4_ = uVar8;
      auVar393 = vsubps_avx(auVar124,auVar72);
      auVar73._4_4_ = (float)local_8a0._4_4_ * -fVar397;
      auVar73._0_4_ = (float)local_8a0._0_4_ * -fVar386;
      auVar73._8_4_ = fStack_898 * -fVar399;
      auVar73._12_4_ = fStack_894 * -fVar401;
      auVar73._16_4_ = fStack_890 * -fVar403;
      auVar73._20_4_ = fStack_88c * -fVar405;
      auVar73._24_4_ = fStack_888 * -fVar407;
      auVar73._28_4_ = uVar100 ^ 0x80000000;
      auVar74._4_4_ = (float)local_a00._4_4_ * fVar258;
      auVar74._0_4_ = (float)local_a00._0_4_ * fVar226;
      auVar74._8_4_ = fStack_9f8 * fVar289;
      auVar74._12_4_ = fStack_9f4 * fVar314;
      auVar74._16_4_ = fStack_9f0 * fVar346;
      auVar74._20_4_ = fStack_9ec * fVar23;
      auVar74._24_4_ = fStack_9e8 * fVar31;
      auVar74._28_4_ = uVar8;
      auVar124 = vsubps_avx(auVar73,auVar74);
      auVar75._4_4_ = fVar259 * (float)local_ac0._4_4_;
      auVar75._0_4_ = fVar227 * (float)local_ac0._0_4_;
      auVar75._8_4_ = fVar290 * fStack_ab8;
      auVar75._12_4_ = fVar316 * fStack_ab4;
      auVar75._16_4_ = fVar349 * fStack_ab0;
      auVar75._20_4_ = fVar24 * fStack_aac;
      auVar75._24_4_ = fVar32 * fStack_aa8;
      auVar75._28_4_ = uVar8;
      auVar378 = ZEXT3264(CONCAT428(0x80000000,
                                    CONCAT424(0x80000000,
                                              CONCAT420(0x80000000,
                                                        CONCAT416(0x80000000,
                                                                  CONCAT412(0x80000000,
                                                                            CONCAT48(0x80000000,
                                                                                                                                                                          
                                                  0x8000000080000000)))))));
      auVar310 = ZEXT3264(auVar332);
      auVar45 = vsubps_avx(auVar124,auVar75);
      auVar124 = vrcpps_avx(auVar45);
      fVar226 = auVar124._0_4_;
      fVar227 = auVar124._4_4_;
      auVar76._4_4_ = auVar45._4_4_ * fVar227;
      auVar76._0_4_ = auVar45._0_4_ * fVar226;
      fVar228 = auVar124._8_4_;
      auVar76._8_4_ = auVar45._8_4_ * fVar228;
      fVar229 = auVar124._12_4_;
      auVar76._12_4_ = auVar45._12_4_ * fVar229;
      fVar240 = auVar124._16_4_;
      auVar76._16_4_ = auVar45._16_4_ * fVar240;
      fVar258 = auVar124._20_4_;
      auVar76._20_4_ = auVar45._20_4_ * fVar258;
      fVar259 = auVar124._24_4_;
      auVar76._24_4_ = auVar45._24_4_ * fVar259;
      auVar76._28_4_ = fStack_aa4;
      auVar46 = vsubps_avx(auVar332,auVar76);
      auVar271._8_4_ = 0x7fffffff;
      auVar271._0_8_ = 0x7fffffff7fffffff;
      auVar271._12_4_ = 0x7fffffff;
      auVar271._16_4_ = 0x7fffffff;
      auVar271._20_4_ = 0x7fffffff;
      auVar271._24_4_ = 0x7fffffff;
      auVar271._28_4_ = 0x7fffffff;
      auVar124 = vandps_avx(auVar45,auVar271);
      auVar333._8_4_ = 0x219392ef;
      auVar333._0_8_ = 0x219392ef219392ef;
      auVar333._12_4_ = 0x219392ef;
      auVar333._16_4_ = 0x219392ef;
      auVar333._20_4_ = 0x219392ef;
      auVar333._24_4_ = 0x219392ef;
      auVar333._28_4_ = 0x219392ef;
      auVar39 = vcmpps_avx(auVar124,auVar333,1);
      auVar276 = ZEXT3264(auVar39);
      auVar77._4_4_ = (fVar227 + fVar227 * auVar46._4_4_) * -auVar393._4_4_;
      auVar77._0_4_ = (fVar226 + fVar226 * auVar46._0_4_) * -auVar393._0_4_;
      auVar77._8_4_ = (fVar228 + fVar228 * auVar46._8_4_) * -auVar393._8_4_;
      auVar77._12_4_ = (fVar229 + fVar229 * auVar46._12_4_) * -auVar393._12_4_;
      auVar77._16_4_ = (fVar240 + fVar240 * auVar46._16_4_) * -auVar393._16_4_;
      auVar77._20_4_ = (fVar258 + fVar258 * auVar46._20_4_) * -auVar393._20_4_;
      auVar77._24_4_ = (fVar259 + fVar259 * auVar46._24_4_) * -auVar393._24_4_;
      auVar77._28_4_ = auVar393._28_4_ ^ 0x80000000;
      auVar124 = vcmpps_avx(auVar45,auVar392,1);
      auVar124 = vorps_avx(auVar39,auVar124);
      auVar124 = vblendvps_avx(auVar77,auVar357,auVar124);
      _local_820 = vmaxps_avx(auVar44,auVar124);
      auVar393 = ZEXT1232(auVar90) << 0x20;
      auVar124 = vcmpps_avx(auVar45,auVar393,6);
      auVar124 = vorps_avx(auVar39,auVar124);
      auVar124 = vblendvps_avx(auVar77,auVar370,auVar124);
      auVar123 = vandps_avx(auVar123,local_500);
      local_360 = vminps_avx(auVar41,auVar124);
      auVar124 = vcmpps_avx(_local_820,local_360,2);
      auVar39 = auVar123 & auVar124;
      if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar39 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar39 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar39 >> 0x7f,0) != '\0') ||
            (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar39 >> 0xbf,0) != '\0') ||
          (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar39[0x1f] < '\0') {
        auVar39 = vminps_avx(_local_b40,auVar125);
        auVar160 = vminps_avx(auVar160,auVar193);
        auVar39 = vminps_avx(auVar39,auVar160);
        auVar42 = vsubps_avx(auVar39,auVar42);
        auVar123 = vandps_avx(auVar124,auVar123);
        auVar98._4_4_ = fStack_2fc;
        auVar98._0_4_ = local_300;
        auVar98._8_4_ = fStack_2f8;
        auVar98._12_4_ = fStack_2f4;
        auVar98._16_4_ = fStack_2f0;
        auVar98._20_4_ = fStack_2ec;
        auVar98._24_4_ = fStack_2e8;
        auVar98._28_4_ = fStack_2e4;
        auVar124 = vminps_avx(auVar98,auVar332);
        auVar124 = vmaxps_avx(auVar124,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar175 + fVar143 * (auVar124._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar204 + fVar170 * (auVar124._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar205 + fVar172 * (auVar124._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fVar206 + fVar174 * (auVar124._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar175 + fVar143 * (auVar124._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar204 + fVar170 * (auVar124._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar205 + fVar172 * (auVar124._24_4_ + 6.0) * 0.125;
        fStack_184 = fVar206 + auVar124._28_4_ + 7.0;
        auVar97._4_4_ = fStack_31c;
        auVar97._0_4_ = local_320;
        auVar97._8_4_ = fStack_318;
        auVar97._12_4_ = fStack_314;
        auVar97._16_4_ = fStack_310;
        auVar97._20_4_ = fStack_30c;
        auVar97._24_4_ = fStack_308;
        auVar97._28_4_ = fStack_304;
        auVar124 = vminps_avx(auVar97,auVar332);
        auVar124 = vmaxps_avx(auVar124,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar175 + fVar143 * (auVar124._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar204 + fVar170 * (auVar124._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar205 + fVar172 * (auVar124._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fVar206 + fVar174 * (auVar124._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar175 + fVar143 * (auVar124._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar204 + fVar170 * (auVar124._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar205 + fVar172 * (auVar124._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fVar206 + auVar124._28_4_ + 7.0;
        auVar78._4_4_ = auVar42._4_4_ * 0.99999976;
        auVar78._0_4_ = auVar42._0_4_ * 0.99999976;
        auVar78._8_4_ = auVar42._8_4_ * 0.99999976;
        auVar78._12_4_ = auVar42._12_4_ * 0.99999976;
        auVar78._16_4_ = auVar42._16_4_ * 0.99999976;
        auVar78._20_4_ = auVar42._20_4_ * 0.99999976;
        auVar78._24_4_ = auVar42._24_4_ * 0.99999976;
        auVar78._28_4_ = 0x3f7ffffc;
        auVar124 = vmaxps_avx(auVar393,auVar78);
        auVar79._4_4_ = auVar124._4_4_ * auVar124._4_4_;
        auVar79._0_4_ = auVar124._0_4_ * auVar124._0_4_;
        auVar79._8_4_ = auVar124._8_4_ * auVar124._8_4_;
        auVar79._12_4_ = auVar124._12_4_ * auVar124._12_4_;
        auVar79._16_4_ = auVar124._16_4_ * auVar124._16_4_;
        auVar79._20_4_ = auVar124._20_4_ * auVar124._20_4_;
        auVar79._24_4_ = auVar124._24_4_ * auVar124._24_4_;
        auVar79._28_4_ = auVar124._28_4_;
        local_980 = vsubps_avx(auVar47,auVar79);
        auVar80._4_4_ = local_980._4_4_ * fVar139 * 4.0;
        auVar80._0_4_ = local_980._0_4_ * fVar138 * 4.0;
        auVar80._8_4_ = local_980._8_4_ * fVar140 * 4.0;
        auVar80._12_4_ = local_980._12_4_ * fVar141 * 4.0;
        auVar80._16_4_ = local_980._16_4_ * fVar359 * 4.0;
        auVar80._20_4_ = local_980._20_4_ * fVar360 * 4.0;
        auVar80._24_4_ = local_980._24_4_ * fVar361 * 4.0;
        auVar80._28_4_ = auVar124._28_4_;
        auVar371 = vsubps_avx(auVar63,auVar80);
        auVar124 = vcmpps_avx(auVar371,ZEXT832(0) << 0x20,5);
        if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar124 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar124 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar124 >> 0x7f,0) == '\0') &&
              (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar124 >> 0xbf,0) == '\0') &&
            (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar124[0x1f]) {
          auVar160 = SUB6432(ZEXT864(0),0) << 0x20;
          _local_8e0 = ZEXT832(0) << 0x20;
          _local_900 = ZEXT832(0) << 0x20;
          auVar193 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar221 = SUB3228(ZEXT832(0),0) << 0x40;
          auVar252._8_4_ = 0x7f800000;
          auVar252._0_8_ = 0x7f8000007f800000;
          auVar252._12_4_ = 0x7f800000;
          auVar252._16_4_ = 0x7f800000;
          auVar252._20_4_ = 0x7f800000;
          auVar252._24_4_ = 0x7f800000;
          auVar252._28_4_ = 0x7f800000;
          auVar272._8_4_ = 0xff800000;
          auVar272._0_8_ = 0xff800000ff800000;
          auVar272._12_4_ = 0xff800000;
          auVar272._16_4_ = 0xff800000;
          auVar272._20_4_ = 0xff800000;
          auVar272._24_4_ = 0xff800000;
          auVar272._28_4_ = 0xff800000;
          local_980 = auVar50;
          _local_8c0 = _local_8e0;
        }
        else {
          auVar39 = vsqrtps_avx(auVar371);
          auVar194._0_4_ = fVar138 + fVar138;
          auVar194._4_4_ = fVar139 + fVar139;
          auVar194._8_4_ = fVar140 + fVar140;
          auVar194._12_4_ = fVar141 + fVar141;
          auVar194._16_4_ = fVar359 + fVar359;
          auVar194._20_4_ = fVar360 + fVar360;
          auVar194._24_4_ = fVar361 + fVar361;
          auVar194._28_4_ = fVar144 + fVar144;
          auVar42 = vrcpps_avx(auVar194);
          fVar144 = auVar42._0_4_;
          fVar226 = auVar42._4_4_;
          auVar81._4_4_ = auVar194._4_4_ * fVar226;
          auVar81._0_4_ = auVar194._0_4_ * fVar144;
          fVar227 = auVar42._8_4_;
          auVar81._8_4_ = auVar194._8_4_ * fVar227;
          fVar228 = auVar42._12_4_;
          auVar81._12_4_ = auVar194._12_4_ * fVar228;
          fVar229 = auVar42._16_4_;
          auVar81._16_4_ = auVar194._16_4_ * fVar229;
          fVar240 = auVar42._20_4_;
          auVar81._20_4_ = auVar194._20_4_ * fVar240;
          fVar258 = auVar42._24_4_;
          auVar81._24_4_ = auVar194._24_4_ * fVar258;
          auVar81._28_4_ = auVar194._28_4_;
          auVar160 = vsubps_avx(auVar332,auVar81);
          fVar144 = fVar144 + fVar144 * auVar160._0_4_;
          fVar226 = fVar226 + fVar226 * auVar160._4_4_;
          fVar227 = fVar227 + fVar227 * auVar160._8_4_;
          fVar228 = fVar228 + fVar228 * auVar160._12_4_;
          fVar229 = fVar229 + fVar229 * auVar160._16_4_;
          fVar240 = fVar240 + fVar240 * auVar160._20_4_;
          fVar258 = fVar258 + fVar258 * auVar160._24_4_;
          fVar259 = auVar42._28_4_ + auVar160._28_4_;
          auVar223._0_8_ = local_9e0._0_8_ ^ 0x8000000080000000;
          auVar223._8_4_ = -local_9e0._8_4_;
          auVar223._12_4_ = -local_9e0._12_4_;
          auVar223._16_4_ = -local_9e0._16_4_;
          auVar223._20_4_ = -local_9e0._20_4_;
          auVar223._24_4_ = -local_9e0._24_4_;
          auVar223._28_4_ = -local_9e0._28_4_;
          auVar42 = vsubps_avx(auVar223,auVar39);
          fVar297 = auVar42._0_4_ * fVar144;
          fVar314 = auVar42._4_4_ * fVar226;
          auVar82._4_4_ = fVar314;
          auVar82._0_4_ = fVar297;
          fVar316 = auVar42._8_4_ * fVar227;
          auVar82._8_4_ = fVar316;
          fVar318 = auVar42._12_4_ * fVar228;
          auVar82._12_4_ = fVar318;
          fVar320 = auVar42._16_4_ * fVar229;
          auVar82._16_4_ = fVar320;
          fVar322 = auVar42._20_4_ * fVar240;
          auVar82._20_4_ = fVar322;
          fVar346 = auVar42._24_4_ * fVar258;
          auVar82._24_4_ = fVar346;
          auVar82._28_4_ = 0x3f800000;
          auVar39 = vsubps_avx(auVar39,local_9e0);
          fVar144 = auVar39._0_4_ * fVar144;
          fVar226 = auVar39._4_4_ * fVar226;
          auVar83._4_4_ = fVar226;
          auVar83._0_4_ = fVar144;
          fVar227 = auVar39._8_4_ * fVar227;
          auVar83._8_4_ = fVar227;
          fVar228 = auVar39._12_4_ * fVar228;
          auVar83._12_4_ = fVar228;
          fVar229 = auVar39._16_4_ * fVar229;
          auVar83._16_4_ = fVar229;
          fVar240 = auVar39._20_4_ * fVar240;
          auVar83._20_4_ = fVar240;
          fVar258 = auVar39._24_4_ * fVar258;
          auVar83._24_4_ = fVar258;
          auVar83._28_4_ = 0x80000000;
          auVar378 = ZEXT3264(auVar83);
          fVar261 = (fVar297 * local_5c0 + (float)local_aa0._0_4_) * fVar241;
          fVar277 = (fVar314 * fStack_5bc + local_aa0._4_4_) * fVar281;
          fVar278 = (fVar316 * fStack_5b8 + local_aa0._8_4_) * fVar298;
          fVar289 = (fVar318 * fStack_5b4 + local_aa0._12_4_) * fVar334;
          fVar290 = (fVar320 * fStack_5b0 + local_aa0._16_4_) * fVar373;
          fVar293 = (fVar322 * fStack_5ac + local_aa0._20_4_) * fVar260;
          fVar294 = (fVar346 * fStack_5a8 + local_aa0._24_4_) * fVar262;
          local_a40._28_4_ = auVar43._28_4_;
          auVar161._0_4_ = fVar323 + fVar207 * fVar261;
          auVar161._4_4_ = fVar335 + fVar257 * fVar277;
          auVar161._8_4_ = fVar338 + fVar286 * fVar278;
          auVar161._12_4_ = fVar341 + fVar312 * fVar289;
          auVar161._16_4_ = fVar344 + fVar343 * fVar290;
          auVar161._20_4_ = fVar347 + fVar22 * fVar293;
          auVar161._24_4_ = fVar350 + fVar30 * fVar294;
          auVar161._28_4_ = fVar353 + auVar39._28_4_ + local_aa0._28_4_;
          auVar84._4_4_ = (float)local_ac0._4_4_ * fVar314;
          auVar84._0_4_ = (float)local_ac0._0_4_ * fVar297;
          auVar84._8_4_ = fStack_ab8 * fVar316;
          auVar84._12_4_ = fStack_ab4 * fVar318;
          auVar84._16_4_ = fStack_ab0 * fVar320;
          auVar84._20_4_ = fStack_aac * fVar322;
          auVar84._24_4_ = fStack_aa8 * fVar346;
          auVar84._28_4_ = fVar259;
          auVar160 = vsubps_avx(auVar84,auVar161);
          auVar195._0_4_ = fVar324 + fVar171 * fVar261;
          auVar195._4_4_ = fVar336 + fVar242 * fVar277;
          auVar195._8_4_ = fVar339 + fVar282 * fVar278;
          auVar195._12_4_ = fVar342 + fVar302 * fVar289;
          auVar195._16_4_ = fVar345 + fVar337 * fVar290;
          auVar195._20_4_ = fVar348 + fVar20 * fVar293;
          auVar195._24_4_ = fVar351 + fVar28 * fVar294;
          auVar195._28_4_ = fVar354 + fVar259;
          auVar253._0_4_ = (float)local_a00._0_4_ * fVar297;
          auVar253._4_4_ = (float)local_a00._4_4_ * fVar314;
          auVar253._8_4_ = fStack_9f8 * fVar316;
          auVar253._12_4_ = fStack_9f4 * fVar318;
          auVar253._16_4_ = fStack_9f0 * fVar320;
          auVar253._20_4_ = fStack_9ec * fVar322;
          auVar253._24_4_ = fStack_9e8 * fVar346;
          auVar253._28_4_ = 0;
          auVar193 = vsubps_avx(auVar253,auVar195);
          auVar224._0_4_ = local_9a0 + fVar173 * fVar261;
          auVar224._4_4_ = fStack_99c + fVar243 * fVar277;
          auVar224._8_4_ = fStack_998 + fVar285 * fVar278;
          auVar224._12_4_ = fStack_994 + fVar311 * fVar289;
          auVar224._16_4_ = fStack_990 + fVar340 * fVar290;
          auVar224._20_4_ = fStack_98c + fVar21 * fVar293;
          auVar224._24_4_ = fStack_988 + fVar29 * fVar294;
          auVar224._28_4_ = fStack_984 + auVar42._28_4_;
          auVar85._4_4_ = (float)local_8a0._4_4_ * fVar314;
          auVar85._0_4_ = (float)local_8a0._0_4_ * fVar297;
          auVar85._8_4_ = fStack_898 * fVar316;
          auVar85._12_4_ = fStack_894 * fVar318;
          auVar85._16_4_ = fStack_890 * fVar320;
          auVar85._20_4_ = fStack_88c * fVar322;
          auVar85._24_4_ = fStack_888 * fVar346;
          auVar85._28_4_ = 0;
          auVar42 = vsubps_avx(auVar85,auVar224);
          auVar221 = auVar42._0_28_;
          fVar241 = (fVar144 * local_5c0 + (float)local_aa0._0_4_) * fVar241;
          fVar281 = (fVar226 * fStack_5bc + local_aa0._4_4_) * fVar281;
          fVar298 = (fVar227 * fStack_5b8 + local_aa0._8_4_) * fVar298;
          fVar334 = (fVar228 * fStack_5b4 + local_aa0._12_4_) * fVar334;
          fVar373 = (fVar229 * fStack_5b0 + local_aa0._16_4_) * fVar373;
          fVar260 = (fVar240 * fStack_5ac + local_aa0._20_4_) * fVar260;
          fVar262 = (fVar258 * fStack_5a8 + local_aa0._24_4_) * fVar262;
          auVar273._0_4_ = fVar323 + fVar207 * fVar241;
          auVar273._4_4_ = fVar335 + fVar257 * fVar281;
          auVar273._8_4_ = fVar338 + fVar286 * fVar298;
          auVar273._12_4_ = fVar341 + fVar312 * fVar334;
          auVar273._16_4_ = fVar344 + fVar343 * fVar373;
          auVar273._20_4_ = fVar347 + fVar22 * fVar260;
          auVar273._24_4_ = fVar350 + fVar30 * fVar262;
          auVar273._28_4_ = fVar353 + (float)local_a40._28_4_;
          auVar86._4_4_ = (float)local_ac0._4_4_ * fVar226;
          auVar86._0_4_ = (float)local_ac0._0_4_ * fVar144;
          auVar86._8_4_ = fStack_ab8 * fVar227;
          auVar86._12_4_ = fStack_ab4 * fVar228;
          auVar86._16_4_ = fStack_ab0 * fVar229;
          auVar86._20_4_ = fStack_aac * fVar240;
          auVar86._24_4_ = fStack_aa8 * fVar258;
          auVar86._28_4_ = fStack_aa4;
          _local_8c0 = vsubps_avx(auVar86,auVar273);
          auVar274._0_4_ = fVar324 + fVar171 * fVar241;
          auVar274._4_4_ = fVar336 + fVar242 * fVar281;
          auVar274._8_4_ = fVar339 + fVar282 * fVar298;
          auVar274._12_4_ = fVar342 + fVar302 * fVar334;
          auVar274._16_4_ = fVar345 + fVar337 * fVar373;
          auVar274._20_4_ = fVar348 + fVar20 * fVar260;
          auVar274._24_4_ = fVar351 + fVar28 * fVar262;
          auVar274._28_4_ = fVar354 + local_8c0._28_4_;
          auVar87._4_4_ = (float)local_a00._4_4_ * fVar226;
          auVar87._0_4_ = (float)local_a00._0_4_ * fVar144;
          auVar87._8_4_ = fStack_9f8 * fVar227;
          auVar87._12_4_ = fStack_9f4 * fVar228;
          auVar87._16_4_ = fStack_9f0 * fVar229;
          auVar87._20_4_ = fStack_9ec * fVar240;
          auVar87._24_4_ = fStack_9e8 * fVar258;
          auVar87._28_4_ = fStack_aa4;
          _local_8e0 = vsubps_avx(auVar87,auVar274);
          auVar254._0_4_ = local_9a0 + fVar173 * fVar241;
          auVar254._4_4_ = fStack_99c + fVar243 * fVar281;
          auVar254._8_4_ = fStack_998 + fVar285 * fVar298;
          auVar254._12_4_ = fStack_994 + fVar311 * fVar334;
          auVar254._16_4_ = fStack_990 + fVar340 * fVar373;
          auVar254._20_4_ = fStack_98c + fVar21 * fVar260;
          auVar254._24_4_ = fStack_988 + fVar29 * fVar262;
          auVar254._28_4_ = fStack_984 + local_aa0._28_4_ + 0.0;
          auVar88._4_4_ = (float)local_8a0._4_4_ * fVar226;
          auVar88._0_4_ = (float)local_8a0._0_4_ * fVar144;
          auVar88._8_4_ = fStack_898 * fVar227;
          auVar88._12_4_ = fStack_894 * fVar228;
          auVar88._16_4_ = fStack_890 * fVar229;
          auVar88._20_4_ = fStack_88c * fVar240;
          auVar88._24_4_ = fStack_888 * fVar258;
          auVar88._28_4_ = local_8e0._28_4_;
          _local_900 = vsubps_avx(auVar88,auVar254);
          auVar39 = vcmpps_avx(auVar371,auVar393,5);
          auVar255._8_4_ = 0x7f800000;
          auVar255._0_8_ = 0x7f8000007f800000;
          auVar255._12_4_ = 0x7f800000;
          auVar255._16_4_ = 0x7f800000;
          auVar255._20_4_ = 0x7f800000;
          auVar255._24_4_ = 0x7f800000;
          auVar255._28_4_ = 0x7f800000;
          auVar252 = vblendvps_avx(auVar255,auVar82,auVar39);
          auVar365._8_4_ = 0x7fffffff;
          auVar365._0_8_ = 0x7fffffff7fffffff;
          auVar365._12_4_ = 0x7fffffff;
          auVar365._16_4_ = 0x7fffffff;
          auVar365._20_4_ = 0x7fffffff;
          auVar365._24_4_ = 0x7fffffff;
          auVar365._28_4_ = 0x7fffffff;
          auVar42 = vandps_avx(auVar365,local_340);
          auVar42 = vmaxps_avx(local_520,auVar42);
          auVar371._8_4_ = 0x36000000;
          auVar371._0_8_ = 0x3600000036000000;
          auVar371._12_4_ = 0x36000000;
          auVar371._16_4_ = 0x36000000;
          auVar371._20_4_ = 0x36000000;
          auVar371._24_4_ = 0x36000000;
          auVar371._28_4_ = 0x36000000;
          auVar89._4_4_ = auVar42._4_4_ * 1.9073486e-06;
          auVar89._0_4_ = auVar42._0_4_ * 1.9073486e-06;
          auVar89._8_4_ = auVar42._8_4_ * 1.9073486e-06;
          auVar89._12_4_ = auVar42._12_4_ * 1.9073486e-06;
          auVar89._16_4_ = auVar42._16_4_ * 1.9073486e-06;
          auVar89._20_4_ = auVar42._20_4_ * 1.9073486e-06;
          auVar89._24_4_ = auVar42._24_4_ * 1.9073486e-06;
          auVar89._28_4_ = auVar42._28_4_;
          auVar42 = vandps_avx(auVar365,local_5a0);
          auVar42 = vcmpps_avx(auVar42,auVar89,1);
          auVar275._8_4_ = 0xff800000;
          auVar275._0_8_ = 0xff800000ff800000;
          auVar275._12_4_ = 0xff800000;
          auVar275._16_4_ = 0xff800000;
          auVar275._20_4_ = 0xff800000;
          auVar275._24_4_ = 0xff800000;
          auVar275._28_4_ = 0xff800000;
          auVar272 = vblendvps_avx(auVar275,auVar83,auVar39);
          auVar393 = auVar39 & auVar42;
          _local_b40 = auVar123;
          local_9c0 = auVar193;
          if ((((((((auVar393 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar393 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar393 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar393 >> 0x7f,0) != '\0') ||
                (auVar393 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar393 >> 0xbf,0) != '\0') ||
              (auVar393 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar393[0x1f] < '\0') {
            auVar124 = vandps_avx(auVar42,auVar39);
            auVar189 = vpackssdw_avx(auVar124._0_16_,auVar124._16_16_);
            auVar393 = vcmpps_avx(local_980,ZEXT832(0) << 0x20,2);
            auVar410._8_4_ = 0xff800000;
            auVar410._0_8_ = 0xff800000ff800000;
            auVar410._12_4_ = 0xff800000;
            auVar410._16_4_ = 0xff800000;
            auVar410._20_4_ = 0xff800000;
            auVar410._24_4_ = 0xff800000;
            auVar410._28_4_ = 0xff800000;
            auVar395._8_4_ = 0x7f800000;
            auVar395._0_8_ = 0x7f8000007f800000;
            auVar395._12_4_ = 0x7f800000;
            auVar395._16_4_ = 0x7f800000;
            auVar395._20_4_ = 0x7f800000;
            auVar395._24_4_ = 0x7f800000;
            auVar395._28_4_ = 0x7f800000;
            auVar42 = vblendvps_avx(auVar395,auVar410,auVar393);
            auVar185 = vpmovsxwd_avx(auVar189);
            auVar378 = ZEXT1664(auVar185);
            auVar189 = vpunpckhwd_avx(auVar189,auVar189);
            auVar366._16_16_ = auVar189;
            auVar366._0_16_ = auVar185;
            auVar252 = vblendvps_avx(auVar252,auVar42,auVar366);
            auVar371 = vblendvps_avx(auVar410,auVar395,auVar393);
            auVar272 = vblendvps_avx(auVar272,auVar371,auVar366);
            auVar42 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
            auVar135._0_4_ = auVar42._0_4_ ^ auVar124._0_4_;
            auVar135._4_4_ = auVar42._4_4_ ^ auVar124._4_4_;
            auVar135._8_4_ = auVar42._8_4_ ^ auVar124._8_4_;
            auVar135._12_4_ = auVar42._12_4_ ^ auVar124._12_4_;
            auVar135._16_4_ = auVar42._16_4_ ^ auVar124._16_4_;
            auVar135._20_4_ = auVar42._20_4_ ^ auVar124._20_4_;
            auVar135._24_4_ = auVar42._24_4_ ^ auVar124._24_4_;
            auVar135._28_4_ = auVar42._28_4_ ^ auVar124._28_4_;
            auVar124 = vorps_avx(auVar393,auVar135);
            auVar124 = vandps_avx(auVar39,auVar124);
          }
        }
        auVar372 = ZEXT3264(auVar371);
        auVar367 = ZEXT3264(auVar123);
        auVar358 = ZEXT1664(local_930);
        _local_3c0 = _local_820;
        local_3a0 = vminps_avx(local_360,auVar252);
        _local_840 = vmaxps_avx(_local_820,auVar272);
        auVar276 = ZEXT3264(_local_840);
        local_380 = _local_840;
        auVar42 = vcmpps_avx(_local_820,local_3a0,2);
        local_760 = vandps_avx(auVar123,auVar42);
        auVar42 = vcmpps_avx(_local_840,local_360,2);
        local_7a0 = vandps_avx(auVar123,auVar42);
        auVar310 = ZEXT3264(local_7a0);
        auVar123 = vorps_avx(local_7a0,local_760);
        if ((((((((auVar123 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar123 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar123 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar123 >> 0x7f,0) != '\0') ||
              (auVar123 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar123 >> 0xbf,0) != '\0') ||
            (auVar123 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar123[0x1f] < '\0') {
          local_a40 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
          local_7c0._0_4_ = auVar124._0_4_ ^ local_a40._0_4_;
          local_7c0._4_4_ = auVar124._4_4_ ^ local_a40._4_4_;
          local_7c0._8_4_ = auVar124._8_4_ ^ local_a40._8_4_;
          local_7c0._12_4_ = auVar124._12_4_ ^ local_a40._12_4_;
          local_7c0._16_4_ = auVar124._16_4_ ^ local_a40._16_4_;
          local_7c0._20_4_ = auVar124._20_4_ ^ local_a40._20_4_;
          local_7c0._24_4_ = auVar124._24_4_ ^ local_a40._24_4_;
          local_7c0._28_4_ = (uint)auVar124._28_4_ ^ local_a40._28_4_;
          auVar276 = ZEXT3264(_local_a00);
          auVar126._0_4_ =
               (float)local_ac0._0_4_ * auVar160._0_4_ +
               (float)local_a00._0_4_ * auVar193._0_4_ + (float)local_8a0._0_4_ * auVar221._0_4_;
          auVar126._4_4_ =
               (float)local_ac0._4_4_ * auVar160._4_4_ +
               (float)local_a00._4_4_ * auVar193._4_4_ + (float)local_8a0._4_4_ * auVar221._4_4_;
          auVar126._8_4_ =
               fStack_ab8 * auVar160._8_4_ +
               fStack_9f8 * auVar193._8_4_ + fStack_898 * auVar221._8_4_;
          auVar126._12_4_ =
               fStack_ab4 * auVar160._12_4_ +
               fStack_9f4 * auVar193._12_4_ + fStack_894 * auVar221._12_4_;
          auVar126._16_4_ =
               fStack_ab0 * auVar160._16_4_ +
               fStack_9f0 * auVar193._16_4_ + fStack_890 * auVar221._16_4_;
          auVar126._20_4_ =
               fStack_aac * auVar160._20_4_ +
               fStack_9ec * auVar193._20_4_ + fStack_88c * auVar221._20_4_;
          auVar126._24_4_ =
               fStack_aa8 * auVar160._24_4_ +
               fStack_9e8 * auVar193._24_4_ + fStack_888 * auVar221._24_4_;
          auVar126._28_4_ = auVar124._28_4_ + auVar160._28_4_ + auVar193._28_4_;
          auVar162._8_4_ = 0x7fffffff;
          auVar162._0_8_ = 0x7fffffff7fffffff;
          auVar162._12_4_ = 0x7fffffff;
          auVar162._16_4_ = 0x7fffffff;
          auVar162._20_4_ = 0x7fffffff;
          auVar162._24_4_ = 0x7fffffff;
          auVar162._28_4_ = 0x7fffffff;
          auVar123 = vandps_avx(auVar126,auVar162);
          auVar163._8_4_ = 0x3e99999a;
          auVar163._0_8_ = 0x3e99999a3e99999a;
          auVar163._12_4_ = 0x3e99999a;
          auVar163._16_4_ = 0x3e99999a;
          auVar163._20_4_ = 0x3e99999a;
          auVar163._24_4_ = 0x3e99999a;
          auVar163._28_4_ = 0x3e99999a;
          auVar123 = vcmpps_avx(auVar123,auVar163,1);
          auVar123 = vorps_avx(local_7c0,auVar123);
          auVar164._8_4_ = 3;
          auVar164._0_8_ = 0x300000003;
          auVar164._12_4_ = 3;
          auVar164._16_4_ = 3;
          auVar164._20_4_ = 3;
          auVar164._24_4_ = 3;
          auVar164._28_4_ = 3;
          auVar196._8_4_ = 2;
          auVar196._0_8_ = 0x200000002;
          auVar196._12_4_ = 2;
          auVar196._16_4_ = 2;
          auVar196._20_4_ = 2;
          auVar196._24_4_ = 2;
          auVar196._28_4_ = 2;
          auVar123 = vblendvps_avx(auVar196,auVar164,auVar123);
          local_7e0 = ZEXT432(local_cc4);
          local_800 = vpshufd_avx(ZEXT416(local_cc4),0);
          fVar144 = 0.0;
          auVar189 = vpcmpgtd_avx(auVar123._16_16_,local_800);
          auStack_7f0 = auVar40._16_16_;
          auVar185 = vpcmpgtd_avx(auVar123._0_16_,local_800);
          auVar165._16_16_ = auVar189;
          auVar165._0_16_ = auVar185;
          local_780 = vblendps_avx(ZEXT1632(auVar185),auVar165,0xf0);
          local_720 = vandnps_avx(local_780,local_760);
          auVar310 = ZEXT3264(local_720);
          auVar123 = local_760 & ~local_780;
          if ((((((((auVar123 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar123 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar123 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar123 >> 0x7f,0) == '\0') &&
                (auVar123 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar123 >> 0xbf,0) == '\0') &&
              (auVar123 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar123[0x1f]) {
            auVar189 = vshufps_avx(local_930,local_930,0);
            auVar127._16_16_ = auVar189;
            auVar127._0_16_ = auVar189;
            fVar173 = (float)local_ac0._0_4_;
            fVar207 = (float)local_ac0._4_4_;
            fVar226 = fStack_ab8;
            fVar227 = fStack_ab4;
            fVar228 = fStack_ab0;
            fVar229 = fStack_aac;
            fVar240 = fStack_aa8;
          }
          else {
            local_a20._4_4_ = (float)local_820._4_4_ + (float)local_960._4_4_;
            local_a20._0_4_ = (float)local_820._0_4_ + (float)local_960._0_4_;
            fStack_a18 = fStack_818 + fStack_958;
            fStack_a14 = fStack_814 + fStack_954;
            fStack_a10 = fStack_810 + fStack_950;
            fStack_a0c = fStack_80c + fStack_94c;
            fStack_a08 = fStack_808 + fStack_948;
            fStack_a04 = fStack_804 + fStack_944;
            do {
              auVar128._8_4_ = 0x7f800000;
              auVar128._0_8_ = 0x7f8000007f800000;
              auVar128._12_4_ = 0x7f800000;
              auVar128._16_4_ = 0x7f800000;
              auVar128._20_4_ = 0x7f800000;
              auVar128._24_4_ = 0x7f800000;
              auVar128._28_4_ = 0x7f800000;
              auVar123 = auVar310._0_32_;
              auVar124 = vblendvps_avx(auVar128,_local_820,auVar123);
              auVar42 = vshufps_avx(auVar124,auVar124,0xb1);
              auVar42 = vminps_avx(auVar124,auVar42);
              auVar39 = vshufpd_avx(auVar42,auVar42,5);
              auVar42 = vminps_avx(auVar42,auVar39);
              auVar39 = vperm2f128_avx(auVar42,auVar42,1);
              auVar42 = vminps_avx(auVar42,auVar39);
              auVar124 = vcmpps_avx(auVar124,auVar42,0);
              auVar42 = auVar123 & auVar124;
              if ((((((((auVar42 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar42 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar42 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar42 >> 0x7f,0) != '\0') ||
                    (auVar42 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar42 >> 0xbf,0) != '\0') ||
                  (auVar42 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar42[0x1f] < '\0') {
                auVar123 = vandps_avx(auVar124,auVar123);
              }
              uVar104 = vmovmskps_avx(auVar123);
              uVar100 = 0;
              if (uVar104 != 0) {
                for (; (uVar104 >> uVar100 & 1) == 0; uVar100 = uVar100 + 1) {
                }
              }
              uVar101 = (ulong)uVar100;
              *(undefined4 *)(local_720 + uVar101 * 4) = 0;
              fVar144 = local_1a0[uVar101];
              uVar100 = *(uint *)(local_3c0 + uVar101 * 4);
              fVar171 = auVar149._0_4_;
              if ((float)local_a60._0_4_ < 0.0) {
                fVar171 = sqrtf((float)local_a60._0_4_);
              }
              auVar185 = vminps_avx(_local_b50,_local_b70);
              auVar189 = vmaxps_avx(_local_b50,_local_b70);
              auVar118 = vminps_avx(_local_b60,_local_b80);
              auVar154 = vminps_avx(auVar185,auVar118);
              auVar185 = vmaxps_avx(_local_b60,_local_b80);
              auVar118 = vmaxps_avx(auVar189,auVar185);
              auVar211._8_4_ = 0x7fffffff;
              auVar211._0_8_ = 0x7fffffff7fffffff;
              auVar211._12_4_ = 0x7fffffff;
              auVar189 = vandps_avx(auVar154,auVar211);
              auVar185 = vandps_avx(auVar118,auVar211);
              auVar189 = vmaxps_avx(auVar189,auVar185);
              auVar185 = vmovshdup_avx(auVar189);
              auVar185 = vmaxss_avx(auVar185,auVar189);
              auVar189 = vshufpd_avx(auVar189,auVar189,1);
              auVar189 = vmaxss_avx(auVar189,auVar185);
              local_b40._0_4_ = auVar189._0_4_ * 1.9073486e-06;
              local_980._0_4_ = fVar171 * 1.9073486e-06;
              local_9e0._0_16_ = vshufps_avx(auVar118,auVar118,0xff);
              auVar189 = vinsertps_avx(ZEXT416(uVar100),ZEXT416((uint)fVar144),0x10);
              auVar358 = ZEXT1664(auVar189);
              bVar109 = true;
              uVar101 = 0;
              do {
                auVar356 = auVar358._0_16_;
                auVar189 = vmovshdup_avx(auVar356);
                fVar144 = auVar189._0_4_;
                fVar226 = 1.0 - fVar144;
                fVar171 = fVar226 * fVar226 * fVar226;
                fVar173 = fVar144 * fVar144 * fVar144;
                fVar207 = fVar144 * fVar226;
                auVar189 = vshufps_avx(ZEXT416((uint)(fVar173 * 0.16666667)),
                                       ZEXT416((uint)(fVar173 * 0.16666667)),0);
                auVar185 = ZEXT416((uint)((fVar173 * 4.0 + fVar171 +
                                          fVar144 * fVar207 * 12.0 + fVar226 * fVar207 * 6.0) *
                                         0.16666667));
                auVar185 = vshufps_avx(auVar185,auVar185,0);
                auVar118 = ZEXT416((uint)((fVar171 * 4.0 + fVar173 +
                                          fVar226 * fVar207 * 12.0 + fVar144 * fVar207 * 6.0) *
                                         0.16666667));
                auVar118 = vshufps_avx(auVar118,auVar118,0);
                auVar154 = vshufps_avx(auVar356,auVar356,0);
                auVar180._0_4_ = auVar154._0_4_ * (float)local_a50._0_4_ + 0.0;
                auVar180._4_4_ = auVar154._4_4_ * (float)local_a50._4_4_ + 0.0;
                auVar180._8_4_ = auVar154._8_4_ * fStack_a48 + 0.0;
                auVar180._12_4_ = auVar154._12_4_ * fStack_a44 + 0.0;
                auVar154 = vshufps_avx(ZEXT416((uint)(fVar171 * 0.16666667)),
                                       ZEXT416((uint)(fVar171 * 0.16666667)),0);
                auVar114._0_4_ =
                     auVar154._0_4_ * (float)local_b50._0_4_ +
                     auVar118._0_4_ * (float)local_b70._0_4_ +
                     auVar189._0_4_ * (float)local_b80._0_4_ +
                     auVar185._0_4_ * (float)local_b60._0_4_;
                auVar114._4_4_ =
                     auVar154._4_4_ * (float)local_b50._4_4_ +
                     auVar118._4_4_ * (float)local_b70._4_4_ +
                     auVar189._4_4_ * (float)local_b80._4_4_ +
                     auVar185._4_4_ * (float)local_b60._4_4_;
                auVar114._8_4_ =
                     auVar154._8_4_ * fStack_b48 +
                     auVar118._8_4_ * fStack_b68 +
                     auVar189._8_4_ * fStack_b78 + auVar185._8_4_ * fStack_b58;
                auVar114._12_4_ =
                     auVar154._12_4_ * fStack_b44 +
                     auVar118._12_4_ * fStack_b64 +
                     auVar189._12_4_ * fStack_b74 + auVar185._12_4_ * fStack_b54;
                local_9c0._0_16_ = auVar114;
                auVar189 = vsubps_avx(auVar180,auVar114);
                local_9a0 = auVar189._0_4_;
                fStack_99c = auVar189._4_4_;
                fStack_998 = auVar189._8_4_;
                fStack_994 = auVar189._12_4_;
                auVar189 = vdpps_avx(auVar189,auVar189,0x7f);
                fVar171 = auVar189._0_4_;
                local_cc0 = auVar358._0_4_;
                if (fVar171 < 0.0) {
                  fVar173 = sqrtf(fVar171);
                }
                else {
                  auVar185 = vsqrtss_avx(auVar189,auVar189);
                  fVar173 = auVar185._0_4_;
                }
                auVar185 = ZEXT416((uint)(fVar144 * fVar144 * 0.5));
                auVar185 = vshufps_avx(auVar185,auVar185,0);
                auVar118 = ZEXT416((uint)((fVar226 * fVar226 + fVar207 * 4.0) * 0.5));
                auVar118 = vshufps_avx(auVar118,auVar118,0);
                auVar154 = ZEXT416((uint)((fVar144 * -fVar144 - fVar207 * 4.0) * 0.5));
                auVar154 = vshufps_avx(auVar154,auVar154,0);
                auVar117 = ZEXT416((uint)(fVar226 * -fVar226 * 0.5));
                auVar117 = vshufps_avx(auVar117,auVar117,0);
                auVar328._0_4_ =
                     (float)local_b50._0_4_ * auVar117._0_4_ +
                     (float)local_b70._0_4_ * auVar154._0_4_ +
                     (float)local_b80._0_4_ * auVar185._0_4_ +
                     (float)local_b60._0_4_ * auVar118._0_4_;
                auVar328._4_4_ =
                     (float)local_b50._4_4_ * auVar117._4_4_ +
                     (float)local_b70._4_4_ * auVar154._4_4_ +
                     (float)local_b80._4_4_ * auVar185._4_4_ +
                     (float)local_b60._4_4_ * auVar118._4_4_;
                auVar328._8_4_ =
                     fStack_b48 * auVar117._8_4_ +
                     fStack_b68 * auVar154._8_4_ +
                     fStack_b78 * auVar185._8_4_ + fStack_b58 * auVar118._8_4_;
                auVar328._12_4_ =
                     fStack_b44 * auVar117._12_4_ +
                     fStack_b64 * auVar154._12_4_ +
                     fStack_b74 * auVar185._12_4_ + fStack_b54 * auVar118._12_4_;
                auVar185 = vshufps_avx(auVar356,auVar356,0x55);
                auVar118 = ZEXT416((uint)(fVar226 - (fVar144 + fVar144)));
                auVar154 = vshufps_avx(auVar118,auVar118,0);
                auVar118 = ZEXT416((uint)(fVar144 - (fVar226 + fVar226)));
                auVar117 = vshufps_avx(auVar118,auVar118,0);
                auVar36 = vshufps_avx(ZEXT416((uint)fVar226),ZEXT416((uint)fVar226),0);
                auVar118 = vdpps_avx(auVar328,auVar328,0x7f);
                auVar150._0_4_ =
                     (float)local_b50._0_4_ * auVar36._0_4_ +
                     (float)local_b70._0_4_ * auVar117._0_4_ +
                     (float)local_b80._0_4_ * auVar185._0_4_ +
                     (float)local_b60._0_4_ * auVar154._0_4_;
                auVar150._4_4_ =
                     (float)local_b50._4_4_ * auVar36._4_4_ +
                     (float)local_b70._4_4_ * auVar117._4_4_ +
                     (float)local_b80._4_4_ * auVar185._4_4_ +
                     (float)local_b60._4_4_ * auVar154._4_4_;
                auVar150._8_4_ =
                     fStack_b48 * auVar36._8_4_ +
                     fStack_b68 * auVar117._8_4_ +
                     fStack_b78 * auVar185._8_4_ + fStack_b58 * auVar154._8_4_;
                auVar150._12_4_ =
                     fStack_b44 * auVar36._12_4_ +
                     fStack_b64 * auVar117._12_4_ +
                     fStack_b74 * auVar185._12_4_ + fStack_b54 * auVar154._12_4_;
                auVar185 = vblendps_avx(auVar118,_DAT_01f7aa10,0xe);
                auVar154 = vrsqrtss_avx(auVar185,auVar185);
                fVar207 = auVar154._0_4_;
                fVar144 = auVar118._0_4_;
                auVar154 = vdpps_avx(auVar328,auVar150,0x7f);
                auVar117 = vshufps_avx(auVar118,auVar118,0);
                auVar151._0_4_ = auVar150._0_4_ * auVar117._0_4_;
                auVar151._4_4_ = auVar150._4_4_ * auVar117._4_4_;
                auVar151._8_4_ = auVar150._8_4_ * auVar117._8_4_;
                auVar151._12_4_ = auVar150._12_4_ * auVar117._12_4_;
                auVar154 = vshufps_avx(auVar154,auVar154,0);
                auVar233._0_4_ = auVar328._0_4_ * auVar154._0_4_;
                auVar233._4_4_ = auVar328._4_4_ * auVar154._4_4_;
                auVar233._8_4_ = auVar328._8_4_ * auVar154._8_4_;
                auVar233._12_4_ = auVar328._12_4_ * auVar154._12_4_;
                auVar36 = vsubps_avx(auVar151,auVar233);
                auVar154 = vrcpss_avx(auVar185,auVar185);
                auVar185 = vmaxss_avx(ZEXT416((uint)local_b40._0_4_),
                                      ZEXT416((uint)(local_cc0 * (float)local_980._0_4_)));
                auVar367 = ZEXT1664(auVar185);
                auVar154 = ZEXT416((uint)(auVar154._0_4_ * (2.0 - fVar144 * auVar154._0_4_)));
                auVar154 = vshufps_avx(auVar154,auVar154,0);
                uVar91 = CONCAT44(auVar328._4_4_,auVar328._0_4_);
                auVar246._0_8_ = uVar91 ^ 0x8000000080000000;
                auVar246._8_4_ = -auVar328._8_4_;
                auVar246._12_4_ = -auVar328._12_4_;
                auVar117 = ZEXT416((uint)(fVar207 * 1.5 +
                                         fVar144 * -0.5 * fVar207 * fVar207 * fVar207));
                auVar117 = vshufps_avx(auVar117,auVar117,0);
                auVar212._0_4_ = auVar117._0_4_ * auVar36._0_4_ * auVar154._0_4_;
                auVar212._4_4_ = auVar117._4_4_ * auVar36._4_4_ * auVar154._4_4_;
                auVar212._8_4_ = auVar117._8_4_ * auVar36._8_4_ * auVar154._8_4_;
                auVar212._12_4_ = auVar117._12_4_ * auVar36._12_4_ * auVar154._12_4_;
                auVar267._0_4_ = auVar328._0_4_ * auVar117._0_4_;
                auVar267._4_4_ = auVar328._4_4_ * auVar117._4_4_;
                auVar267._8_4_ = auVar328._8_4_ * auVar117._8_4_;
                auVar267._12_4_ = auVar328._12_4_ * auVar117._12_4_;
                if (fVar144 < 0.0) {
                  local_a80._0_16_ = auVar212;
                  fVar144 = sqrtf(fVar144);
                  auVar367 = ZEXT464(auVar185._0_4_);
                  auVar212 = local_a80._0_16_;
                }
                else {
                  auVar118 = vsqrtss_avx(auVar118,auVar118);
                  fVar144 = auVar118._0_4_;
                }
                auVar94._4_4_ = fStack_99c;
                auVar94._0_4_ = local_9a0;
                auVar94._8_4_ = fStack_998;
                auVar94._12_4_ = fStack_994;
                auVar118 = vdpps_avx(auVar94,auVar267,0x7f);
                fVar144 = ((float)local_b40._0_4_ / fVar144) * (fVar173 + 1.0) +
                          auVar367._0_4_ + fVar173 * (float)local_b40._0_4_;
                auVar154 = vdpps_avx(auVar246,auVar267,0x7f);
                auVar117 = vdpps_avx(auVar94,auVar212,0x7f);
                auVar36 = vdpps_avx(_local_a50,auVar267,0x7f);
                auVar37 = vdpps_avx(auVar94,auVar246,0x7f);
                fVar173 = auVar154._0_4_ + auVar117._0_4_;
                fVar207 = auVar118._0_4_;
                auVar115._0_4_ = fVar207 * fVar207;
                auVar115._4_4_ = auVar118._4_4_ * auVar118._4_4_;
                auVar115._8_4_ = auVar118._8_4_ * auVar118._8_4_;
                auVar115._12_4_ = auVar118._12_4_ * auVar118._12_4_;
                auVar117 = vsubps_avx(auVar189,auVar115);
                auVar154 = vdpps_avx(auVar94,_local_a50,0x7f);
                fVar226 = auVar37._0_4_ - fVar207 * fVar173;
                fVar227 = auVar154._0_4_ - fVar207 * auVar36._0_4_;
                auVar154 = vrsqrtss_avx(auVar117,auVar117);
                fVar228 = auVar117._0_4_;
                fVar207 = auVar154._0_4_;
                fVar207 = fVar207 * 1.5 + fVar228 * -0.5 * fVar207 * fVar207 * fVar207;
                if (fVar228 < 0.0) {
                  local_a80._0_16_ = ZEXT416((uint)fVar173);
                  local_860._0_4_ = fVar226;
                  local_880._0_4_ = fVar227;
                  local_aa0._0_4_ = fVar207;
                  fVar228 = sqrtf(fVar228);
                  auVar367 = ZEXT464(auVar185._0_4_);
                  fVar207 = (float)local_aa0._0_4_;
                  fVar226 = (float)local_860._0_4_;
                  fVar227 = (float)local_880._0_4_;
                  auVar185 = local_a80._0_16_;
                }
                else {
                  auVar185 = vsqrtss_avx(auVar117,auVar117);
                  fVar228 = auVar185._0_4_;
                  auVar185 = ZEXT416((uint)fVar173);
                }
                auVar378 = ZEXT1664(auVar118);
                auVar372 = ZEXT464((uint)fVar144);
                auVar120 = vpermilps_avx(local_9c0._0_16_,0xff);
                auVar37 = vshufps_avx(auVar328,auVar328,0xff);
                fVar173 = fVar226 * fVar207 - auVar37._0_4_;
                auVar234._0_8_ = auVar36._0_8_ ^ 0x8000000080000000;
                auVar234._8_4_ = auVar36._8_4_ ^ 0x80000000;
                auVar234._12_4_ = auVar36._12_4_ ^ 0x80000000;
                auVar247._0_4_ = -fVar173;
                auVar247._4_4_ = 0x80000000;
                auVar247._8_4_ = 0x80000000;
                auVar247._12_4_ = 0x80000000;
                auVar154 = vinsertps_avx(auVar247,ZEXT416((uint)(fVar227 * fVar207)),0x1c);
                auVar117 = vmovsldup_avx(ZEXT416((uint)(auVar185._0_4_ * fVar227 * fVar207 -
                                                       auVar36._0_4_ * fVar173)));
                auVar154 = vdivps_avx(auVar154,auVar117);
                auVar185 = vinsertps_avx(auVar185,auVar234,0x10);
                auVar185 = vdivps_avx(auVar185,auVar117);
                auVar117 = vmovsldup_avx(auVar118);
                auVar120 = ZEXT416((uint)(fVar228 - auVar120._0_4_));
                auVar36 = vmovsldup_avx(auVar120);
                auVar181._0_4_ = auVar117._0_4_ * auVar154._0_4_ + auVar36._0_4_ * auVar185._0_4_;
                auVar181._4_4_ = auVar117._4_4_ * auVar154._4_4_ + auVar36._4_4_ * auVar185._4_4_;
                auVar181._8_4_ = auVar117._8_4_ * auVar154._8_4_ + auVar36._8_4_ * auVar185._8_4_;
                auVar181._12_4_ =
                     auVar117._12_4_ * auVar154._12_4_ + auVar36._12_4_ * auVar185._12_4_;
                auVar154 = vsubps_avx(auVar356,auVar181);
                auVar358 = ZEXT1664(auVar154);
                auVar182._8_4_ = 0x7fffffff;
                auVar182._0_8_ = 0x7fffffff7fffffff;
                auVar182._12_4_ = 0x7fffffff;
                auVar185 = vandps_avx(auVar118,auVar182);
                fVar173 = (float)local_ac0._0_4_;
                fVar207 = (float)local_ac0._4_4_;
                fVar226 = fStack_ab8;
                fVar227 = fStack_ab4;
                fVar228 = fStack_ab0;
                fVar229 = fStack_aac;
                fVar240 = fStack_aa8;
                if (auVar185._0_4_ < fVar144) {
                  auVar213._8_4_ = 0x7fffffff;
                  auVar213._0_8_ = 0x7fffffff7fffffff;
                  auVar213._12_4_ = 0x7fffffff;
                  auVar185 = vandps_avx(auVar120,auVar213);
                  if (auVar185._0_4_ <
                      (float)local_9e0._0_4_ * 1.9073486e-06 + auVar367._0_4_ + fVar144) {
                    fVar241 = auVar154._0_4_ + (float)local_920._0_4_;
                    auVar276 = ZEXT3264(_local_a00);
                    if (fVar241 < fVar142) {
                      bVar99 = 0;
                      goto LAB_00f402bc;
                    }
                    fVar242 = *(float *)(ray + k * 4 + 0x100);
                    auVar367 = ZEXT464((uint)fVar242);
                    if (fVar241 <= fVar242) {
                      auVar185 = vmovshdup_avx(auVar154);
                      bVar99 = 0;
                      if ((auVar185._0_4_ < 0.0) || (bVar99 = 0, 1.0 < auVar185._0_4_))
                      goto LAB_00f402bc;
                      auVar189 = vrsqrtss_avx(auVar189,auVar189);
                      fVar243 = auVar189._0_4_;
                      pGVar11 = (context->scene->geometries).items[local_af8].ptr;
                      if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                        bVar99 = 0;
                        goto LAB_00f402bc;
                      }
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar99 = 1, pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_00f402bc;
                      auVar189 = ZEXT416((uint)(fVar243 * 1.5 +
                                               fVar171 * -0.5 * fVar243 * fVar243 * fVar243));
                      auVar189 = vshufps_avx(auVar189,auVar189,0);
                      auVar183._0_4_ = auVar189._0_4_ * local_9a0;
                      auVar183._4_4_ = auVar189._4_4_ * fStack_99c;
                      auVar183._8_4_ = auVar189._8_4_ * fStack_998;
                      auVar183._12_4_ = auVar189._12_4_ * fStack_994;
                      auVar152._0_4_ = auVar328._0_4_ + auVar37._0_4_ * auVar183._0_4_;
                      auVar152._4_4_ = auVar328._4_4_ + auVar37._4_4_ * auVar183._4_4_;
                      auVar152._8_4_ = auVar328._8_4_ + auVar37._8_4_ * auVar183._8_4_;
                      auVar152._12_4_ = auVar328._12_4_ + auVar37._12_4_ * auVar183._12_4_;
                      auVar189 = vshufps_avx(auVar183,auVar183,0xc9);
                      auVar185 = vshufps_avx(auVar328,auVar328,0xc9);
                      auVar184._0_4_ = auVar185._0_4_ * auVar183._0_4_;
                      auVar184._4_4_ = auVar185._4_4_ * auVar183._4_4_;
                      auVar184._8_4_ = auVar185._8_4_ * auVar183._8_4_;
                      auVar184._12_4_ = auVar185._12_4_ * auVar183._12_4_;
                      auVar214._0_4_ = auVar328._0_4_ * auVar189._0_4_;
                      auVar214._4_4_ = auVar328._4_4_ * auVar189._4_4_;
                      auVar214._8_4_ = auVar328._8_4_ * auVar189._8_4_;
                      auVar214._12_4_ = auVar328._12_4_ * auVar189._12_4_;
                      auVar356 = vsubps_avx(auVar214,auVar184);
                      auVar189 = vshufps_avx(auVar356,auVar356,0xc9);
                      auVar185 = vshufps_avx(auVar152,auVar152,0xc9);
                      auVar215._0_4_ = auVar185._0_4_ * auVar189._0_4_;
                      auVar215._4_4_ = auVar185._4_4_ * auVar189._4_4_;
                      auVar215._8_4_ = auVar185._8_4_ * auVar189._8_4_;
                      auVar215._12_4_ = auVar185._12_4_ * auVar189._12_4_;
                      auVar189 = vshufps_avx(auVar356,auVar356,0xd2);
                      auVar153._0_4_ = auVar152._0_4_ * auVar189._0_4_;
                      auVar153._4_4_ = auVar152._4_4_ * auVar189._4_4_;
                      auVar153._8_4_ = auVar152._8_4_ * auVar189._8_4_;
                      auVar153._12_4_ = auVar152._12_4_ * auVar189._12_4_;
                      auVar189 = vsubps_avx(auVar215,auVar153);
                      pRVar16 = context->user;
                      local_680 = vshufps_avx(auVar154,auVar154,0x55);
                      auStack_6d0 = vshufps_avx(auVar189,auVar189,0x55);
                      local_6c0 = vshufps_avx(auVar189,auVar189,0xaa);
                      local_6a0 = vshufps_avx(auVar189,auVar189,0);
                      local_6e0 = (RTCHitN  [16])auStack_6d0;
                      local_660 = ZEXT832(0) << 0x20;
                      local_640 = local_560._0_8_;
                      uStack_638 = local_560._8_8_;
                      uStack_630 = local_560._16_8_;
                      uStack_628 = local_560._24_8_;
                      local_620 = local_540._0_8_;
                      uStack_618 = local_540._8_8_;
                      uStack_610 = local_540._16_8_;
                      uStack_608 = local_540._24_8_;
                      *(undefined8 *)(local_b00 + 8) = local_a40._0_8_;
                      *(undefined8 *)(local_b00 + 10) = local_a40._8_8_;
                      *(undefined8 *)(local_b00 + 0xc) = local_a40._16_8_;
                      *(undefined8 *)(local_b00 + 0xe) = local_a40._24_8_;
                      *(undefined8 *)local_b00 = local_a40._0_8_;
                      *(undefined8 *)(local_b00 + 2) = local_a40._8_8_;
                      *(undefined8 *)(local_b00 + 4) = local_a40._16_8_;
                      *(undefined8 *)(local_b00 + 6) = local_a40._24_8_;
                      local_600 = pRVar16->instID[0];
                      local_5e0 = pRVar16->instPrimID[0];
                      *(float *)(ray + k * 4 + 0x100) = fVar241;
                      local_ba0 = *local_b08;
                      local_b90 = *local_b10;
                      local_af0.valid = (int *)local_ba0;
                      local_af0.geometryUserPtr = pGVar11->userPtr;
                      local_af0.context = context->user;
                      local_af0.hit = local_6e0;
                      local_af0.N = 8;
                      local_af0.ray = (RTCRayN *)ray;
                      local_6b0 = local_6c0;
                      local_690 = local_6a0;
                      local_670 = local_680;
                      uStack_5fc = local_600;
                      uStack_5f8 = local_600;
                      uStack_5f4 = local_600;
                      uStack_5f0 = local_600;
                      uStack_5ec = local_600;
                      uStack_5e8 = local_600;
                      uStack_5e4 = local_600;
                      uStack_5dc = local_5e0;
                      uStack_5d8 = local_5e0;
                      uStack_5d4 = local_5e0;
                      uStack_5d0 = local_5e0;
                      uStack_5cc = local_5e0;
                      uStack_5c8 = local_5e0;
                      uStack_5c4 = local_5e0;
                      if (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar358 = ZEXT1664(auVar154);
                        auVar372 = ZEXT464((uint)fVar144);
                        auVar378 = ZEXT1664(auVar118);
                        (*pGVar11->occlusionFilterN)(&local_af0);
                        auVar276 = ZEXT3264(_local_a00);
                      }
                      auVar189 = vpcmpeqd_avx(local_ba0,ZEXT816(0) << 0x40);
                      auVar185 = vpcmpeqd_avx(local_b90,ZEXT816(0) << 0x40);
                      auVar197._16_16_ = auVar185;
                      auVar197._0_16_ = auVar189;
                      auVar123 = local_a40 & ~auVar197;
                      if ((((((((auVar123 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar123 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar123 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar123 >> 0x7f,0) == '\0') &&
                            (auVar123 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar123 >> 0xbf,0) == '\0') &&
                          (auVar123 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar123[0x1f]) {
                        fVar173 = (float)local_ac0._0_4_;
                        fVar207 = (float)local_ac0._4_4_;
                        fVar226 = fStack_ab8;
                        fVar227 = fStack_ab4;
                        fVar228 = fStack_ab0;
                        fVar229 = fStack_aac;
                        fVar240 = fStack_aa8;
                      }
                      else {
                        p_Var17 = context->args->filter;
                        if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar358 = ZEXT1664(auVar358._0_16_);
                          auVar372 = ZEXT1664(auVar372._0_16_);
                          auVar378 = ZEXT1664(auVar378._0_16_);
                          (*p_Var17)(&local_af0);
                          auVar276 = ZEXT3264(_local_a00);
                        }
                        auVar367 = ZEXT464((uint)fVar242);
                        auVar189 = vpcmpeqd_avx(local_ba0,ZEXT816(0) << 0x40);
                        auVar185 = vpcmpeqd_avx(local_b90,ZEXT816(0) << 0x40);
                        auVar129._16_16_ = auVar185;
                        auVar129._0_16_ = auVar189;
                        auVar166._8_4_ = 0xff800000;
                        auVar166._0_8_ = 0xff800000ff800000;
                        auVar166._12_4_ = 0xff800000;
                        auVar166._16_4_ = 0xff800000;
                        auVar166._20_4_ = 0xff800000;
                        auVar166._24_4_ = 0xff800000;
                        auVar166._28_4_ = 0xff800000;
                        auVar123 = vblendvps_avx(auVar166,*(undefined1 (*) [32])
                                                           (local_af0.ray + 0x100),auVar129);
                        *(undefined1 (*) [32])(local_af0.ray + 0x100) = auVar123;
                        auVar123 = local_a40 & ~auVar129;
                        fVar173 = (float)local_ac0._0_4_;
                        fVar207 = (float)local_ac0._4_4_;
                        fVar226 = fStack_ab8;
                        fVar227 = fStack_ab4;
                        fVar228 = fStack_ab0;
                        fVar229 = fStack_aac;
                        fVar240 = fStack_aa8;
                        if ((((((((auVar123 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar123 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar123 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar123 >> 0x7f,0) != '\0')
                              || (auVar123 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar123 >> 0xbf,0) != '\0') ||
                            (auVar123 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar123[0x1f] < '\0') {
                          bVar99 = 1;
                          goto LAB_00f402bc;
                        }
                      }
                      *(float *)(ray + k * 4 + 0x100) = fVar242;
                    }
                    auVar367 = ZEXT464((uint)fVar242);
                    bVar99 = 0;
                    goto LAB_00f402bc;
                  }
                }
                bVar109 = uVar101 < 4;
                uVar101 = uVar101 + 1;
              } while (uVar101 != 5);
              bVar109 = false;
              auVar276 = ZEXT3264(_local_a00);
              bVar99 = 5;
LAB_00f402bc:
              bVar108 = (bool)(bVar108 | bVar109 & bVar99);
              uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar127._4_4_ = uVar8;
              auVar127._0_4_ = uVar8;
              auVar127._8_4_ = uVar8;
              auVar127._12_4_ = uVar8;
              auVar127._16_4_ = uVar8;
              auVar127._20_4_ = uVar8;
              auVar127._24_4_ = uVar8;
              auVar127._28_4_ = uVar8;
              auVar124 = vcmpps_avx(_local_a20,auVar127,2);
              fVar144 = auVar124._28_4_;
              auVar123 = vandps_avx(auVar124,local_720);
              auVar310 = ZEXT3264(auVar123);
              auVar124 = local_720 & auVar124;
              local_720 = auVar123;
            } while ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar124 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar124 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar124 >> 0x7f,0) != '\0') ||
                       (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar124 >> 0xbf,0) != '\0') ||
                     (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar124[0x1f] < '\0');
            auVar310 = ZEXT3264(local_380);
          }
          auVar167._0_4_ =
               fVar173 * (float)local_8c0._0_4_ +
               auVar276._0_4_ * (float)local_8e0._0_4_ +
               (float)local_8a0._0_4_ * (float)local_900._0_4_;
          auVar167._4_4_ =
               fVar207 * (float)local_8c0._4_4_ +
               auVar276._4_4_ * (float)local_8e0._4_4_ +
               (float)local_8a0._4_4_ * (float)local_900._4_4_;
          auVar167._8_4_ =
               fVar226 * fStack_8b8 + auVar276._8_4_ * fStack_8d8 + fStack_898 * fStack_8f8;
          auVar167._12_4_ =
               fVar227 * fStack_8b4 + auVar276._12_4_ * fStack_8d4 + fStack_894 * fStack_8f4;
          auVar167._16_4_ =
               fVar228 * fStack_8b0 + auVar276._16_4_ * fStack_8d0 + fStack_890 * fStack_8f0;
          auVar167._20_4_ =
               fVar229 * fStack_8ac + auVar276._20_4_ * fStack_8cc + fStack_88c * fStack_8ec;
          auVar167._24_4_ =
               fVar240 * fStack_8a8 + auVar276._24_4_ * fStack_8c8 + fStack_888 * fStack_8e8;
          auVar167._28_4_ = fVar144 + fVar144 + auVar310._28_4_;
          auVar198._8_4_ = 0x7fffffff;
          auVar198._0_8_ = 0x7fffffff7fffffff;
          auVar198._12_4_ = 0x7fffffff;
          auVar198._16_4_ = 0x7fffffff;
          auVar198._20_4_ = 0x7fffffff;
          auVar198._24_4_ = 0x7fffffff;
          auVar198._28_4_ = 0x7fffffff;
          auVar123 = vandps_avx(auVar167,auVar198);
          auVar199._8_4_ = 0x3e99999a;
          auVar199._0_8_ = 0x3e99999a3e99999a;
          auVar199._12_4_ = 0x3e99999a;
          auVar199._16_4_ = 0x3e99999a;
          auVar199._20_4_ = 0x3e99999a;
          auVar199._24_4_ = 0x3e99999a;
          auVar199._28_4_ = 0x3e99999a;
          auVar123 = vcmpps_avx(auVar123,auVar199,1);
          auVar124 = vorps_avx(auVar123,local_7c0);
          auVar200._0_4_ = (float)local_960._0_4_ + (float)local_840._0_4_;
          auVar200._4_4_ = (float)local_960._4_4_ + (float)local_840._4_4_;
          auVar200._8_4_ = fStack_958 + fStack_838;
          auVar200._12_4_ = fStack_954 + fStack_834;
          auVar200._16_4_ = fStack_950 + fStack_830;
          auVar200._20_4_ = fStack_94c + fStack_82c;
          auVar200._24_4_ = fStack_948 + fStack_828;
          auVar200._28_4_ = fStack_944 + fStack_824;
          auVar123 = vcmpps_avx(auVar200,auVar127,2);
          _local_900 = vandps_avx(auVar123,local_7a0);
          auVar201._8_4_ = 3;
          auVar201._0_8_ = 0x300000003;
          auVar201._12_4_ = 3;
          auVar201._16_4_ = 3;
          auVar201._20_4_ = 3;
          auVar201._24_4_ = 3;
          auVar201._28_4_ = 3;
          auVar225._8_4_ = 2;
          auVar225._0_8_ = 0x200000002;
          auVar225._12_4_ = 2;
          auVar225._16_4_ = 2;
          auVar225._20_4_ = 2;
          auVar225._24_4_ = 2;
          auVar225._28_4_ = 2;
          auVar123 = vblendvps_avx(auVar225,auVar201,auVar124);
          auVar189 = vpcmpgtd_avx(auVar123._16_16_,local_800);
          auVar185 = vpshufd_avx(local_7e0._0_16_,0);
          auVar185 = vpcmpgtd_avx(auVar123._0_16_,auVar185);
          auVar202._16_16_ = auVar189;
          auVar202._0_16_ = auVar127._0_16_;
          _local_8e0 = vblendps_avx(ZEXT1632(auVar185),auVar202,0xf0);
          auVar123 = vandnps_avx(_local_8e0,_local_900);
          auVar124 = _local_900 & ~_local_8e0;
          local_740 = auVar123;
          if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar124 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar124 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar124 >> 0x7f,0) != '\0') ||
                (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar124 >> 0xbf,0) != '\0') ||
              (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar124[0x1f] < '\0') {
            local_8c0._4_4_ = (float)local_960._4_4_ + local_380._4_4_;
            local_8c0._0_4_ = (float)local_960._0_4_ + local_380._0_4_;
            fStack_8b8 = fStack_958 + local_380._8_4_;
            fStack_8b4 = fStack_954 + local_380._12_4_;
            fStack_8b0 = fStack_950 + local_380._16_4_;
            fStack_8ac = fStack_94c + local_380._20_4_;
            fStack_8a8 = fStack_948 + local_380._24_4_;
            fStack_8a4 = fStack_944 + local_380._28_4_;
            _local_a20 = local_380;
            do {
              auVar130._8_4_ = 0x7f800000;
              auVar130._0_8_ = 0x7f8000007f800000;
              auVar130._12_4_ = 0x7f800000;
              auVar130._16_4_ = 0x7f800000;
              auVar130._20_4_ = 0x7f800000;
              auVar130._24_4_ = 0x7f800000;
              auVar130._28_4_ = 0x7f800000;
              auVar124 = vblendvps_avx(auVar130,_local_a20,auVar123);
              auVar42 = vshufps_avx(auVar124,auVar124,0xb1);
              auVar42 = vminps_avx(auVar124,auVar42);
              auVar39 = vshufpd_avx(auVar42,auVar42,5);
              auVar42 = vminps_avx(auVar42,auVar39);
              auVar39 = vperm2f128_avx(auVar42,auVar42,1);
              auVar42 = vminps_avx(auVar42,auVar39);
              auVar42 = vcmpps_avx(auVar124,auVar42,0);
              auVar39 = auVar123 & auVar42;
              auVar124 = auVar123;
              if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar39 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar39 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar39 >> 0x7f,0) != '\0') ||
                    (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar39 >> 0xbf,0) != '\0') ||
                  (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar39[0x1f] < '\0') {
                auVar124 = vandps_avx(auVar42,auVar123);
              }
              uVar104 = vmovmskps_avx(auVar124);
              uVar100 = 0;
              if (uVar104 != 0) {
                for (; (uVar104 >> uVar100 & 1) == 0; uVar100 = uVar100 + 1) {
                }
              }
              uVar101 = (ulong)uVar100;
              local_740 = auVar123;
              *(undefined4 *)(local_740 + uVar101 * 4) = 0;
              fVar144 = local_1c0[uVar101];
              uVar100 = *(uint *)(local_360 + uVar101 * 4);
              fVar171 = auVar19._0_4_;
              if ((float)local_a60._0_4_ < 0.0) {
                fVar171 = sqrtf((float)local_a60._0_4_);
              }
              auVar185 = vminps_avx(_local_b50,_local_b70);
              auVar189 = vmaxps_avx(_local_b50,_local_b70);
              auVar118 = vminps_avx(_local_b60,_local_b80);
              auVar154 = vminps_avx(auVar185,auVar118);
              auVar185 = vmaxps_avx(_local_b60,_local_b80);
              auVar118 = vmaxps_avx(auVar189,auVar185);
              auVar216._8_4_ = 0x7fffffff;
              auVar216._0_8_ = 0x7fffffff7fffffff;
              auVar216._12_4_ = 0x7fffffff;
              auVar189 = vandps_avx(auVar154,auVar216);
              auVar185 = vandps_avx(auVar118,auVar216);
              auVar189 = vmaxps_avx(auVar189,auVar185);
              auVar185 = vmovshdup_avx(auVar189);
              auVar185 = vmaxss_avx(auVar185,auVar189);
              auVar189 = vshufpd_avx(auVar189,auVar189,1);
              auVar189 = vmaxss_avx(auVar189,auVar185);
              local_b40._0_4_ = auVar189._0_4_ * 1.9073486e-06;
              local_980._0_4_ = fVar171 * 1.9073486e-06;
              local_9e0._0_16_ = vshufps_avx(auVar118,auVar118,0xff);
              auVar189 = vinsertps_avx(ZEXT416(uVar100),ZEXT416((uint)fVar144),0x10);
              auVar358 = ZEXT1664(auVar189);
              bVar109 = true;
              uVar101 = 0;
              do {
                auVar356 = auVar358._0_16_;
                auVar189 = vmovshdup_avx(auVar356);
                fVar144 = auVar189._0_4_;
                fVar226 = 1.0 - fVar144;
                fVar171 = fVar226 * fVar226 * fVar226;
                fVar173 = fVar144 * fVar144 * fVar144;
                fVar207 = fVar144 * fVar226;
                auVar189 = vshufps_avx(ZEXT416((uint)(fVar173 * 0.16666667)),
                                       ZEXT416((uint)(fVar173 * 0.16666667)),0);
                auVar185 = ZEXT416((uint)((fVar173 * 4.0 + fVar171 +
                                          fVar144 * fVar207 * 12.0 + fVar226 * fVar207 * 6.0) *
                                         0.16666667));
                auVar185 = vshufps_avx(auVar185,auVar185,0);
                auVar118 = ZEXT416((uint)((fVar171 * 4.0 + fVar173 +
                                          fVar226 * fVar207 * 12.0 + fVar144 * fVar207 * 6.0) *
                                         0.16666667));
                auVar118 = vshufps_avx(auVar118,auVar118,0);
                auVar154 = vshufps_avx(auVar356,auVar356,0);
                auVar186._0_4_ = auVar154._0_4_ * (float)local_a50._0_4_ + 0.0;
                auVar186._4_4_ = auVar154._4_4_ * (float)local_a50._4_4_ + 0.0;
                auVar186._8_4_ = auVar154._8_4_ * fStack_a48 + 0.0;
                auVar186._12_4_ = auVar154._12_4_ * fStack_a44 + 0.0;
                auVar154 = vshufps_avx(ZEXT416((uint)(fVar171 * 0.16666667)),
                                       ZEXT416((uint)(fVar171 * 0.16666667)),0);
                auVar116._0_4_ =
                     auVar154._0_4_ * (float)local_b50._0_4_ +
                     auVar118._0_4_ * (float)local_b70._0_4_ +
                     auVar189._0_4_ * (float)local_b80._0_4_ +
                     auVar185._0_4_ * (float)local_b60._0_4_;
                auVar116._4_4_ =
                     auVar154._4_4_ * (float)local_b50._4_4_ +
                     auVar118._4_4_ * (float)local_b70._4_4_ +
                     auVar189._4_4_ * (float)local_b80._4_4_ +
                     auVar185._4_4_ * (float)local_b60._4_4_;
                auVar116._8_4_ =
                     auVar154._8_4_ * fStack_b48 +
                     auVar118._8_4_ * fStack_b68 +
                     auVar189._8_4_ * fStack_b78 + auVar185._8_4_ * fStack_b58;
                auVar116._12_4_ =
                     auVar154._12_4_ * fStack_b44 +
                     auVar118._12_4_ * fStack_b64 +
                     auVar189._12_4_ * fStack_b74 + auVar185._12_4_ * fStack_b54;
                local_9c0._0_16_ = auVar116;
                auVar189 = vsubps_avx(auVar186,auVar116);
                local_9a0 = auVar189._0_4_;
                fStack_99c = auVar189._4_4_;
                fStack_998 = auVar189._8_4_;
                fStack_994 = auVar189._12_4_;
                auVar189 = vdpps_avx(auVar189,auVar189,0x7f);
                fVar171 = auVar189._0_4_;
                local_cc0 = auVar358._0_4_;
                if (fVar171 < 0.0) {
                  fVar173 = sqrtf(fVar171);
                }
                else {
                  auVar185 = vsqrtss_avx(auVar189,auVar189);
                  fVar173 = auVar185._0_4_;
                }
                auVar185 = ZEXT416((uint)(fVar144 * fVar144 * 0.5));
                auVar185 = vshufps_avx(auVar185,auVar185,0);
                auVar118 = ZEXT416((uint)((fVar226 * fVar226 + fVar207 * 4.0) * 0.5));
                auVar118 = vshufps_avx(auVar118,auVar118,0);
                auVar154 = ZEXT416((uint)((fVar144 * -fVar144 - fVar207 * 4.0) * 0.5));
                auVar154 = vshufps_avx(auVar154,auVar154,0);
                auVar117 = ZEXT416((uint)(fVar226 * -fVar226 * 0.5));
                auVar117 = vshufps_avx(auVar117,auVar117,0);
                auVar329._0_4_ =
                     (float)local_b50._0_4_ * auVar117._0_4_ +
                     (float)local_b70._0_4_ * auVar154._0_4_ +
                     (float)local_b80._0_4_ * auVar185._0_4_ +
                     (float)local_b60._0_4_ * auVar118._0_4_;
                auVar329._4_4_ =
                     (float)local_b50._4_4_ * auVar117._4_4_ +
                     (float)local_b70._4_4_ * auVar154._4_4_ +
                     (float)local_b80._4_4_ * auVar185._4_4_ +
                     (float)local_b60._4_4_ * auVar118._4_4_;
                auVar329._8_4_ =
                     fStack_b48 * auVar117._8_4_ +
                     fStack_b68 * auVar154._8_4_ +
                     fStack_b78 * auVar185._8_4_ + fStack_b58 * auVar118._8_4_;
                auVar329._12_4_ =
                     fStack_b44 * auVar117._12_4_ +
                     fStack_b64 * auVar154._12_4_ +
                     fStack_b74 * auVar185._12_4_ + fStack_b54 * auVar118._12_4_;
                auVar185 = vshufps_avx(auVar356,auVar356,0x55);
                auVar118 = ZEXT416((uint)(fVar226 - (fVar144 + fVar144)));
                auVar154 = vshufps_avx(auVar118,auVar118,0);
                auVar118 = ZEXT416((uint)(fVar144 - (fVar226 + fVar226)));
                auVar117 = vshufps_avx(auVar118,auVar118,0);
                auVar36 = vshufps_avx(ZEXT416((uint)fVar226),ZEXT416((uint)fVar226),0);
                auVar118 = vdpps_avx(auVar329,auVar329,0x7f);
                auVar155._0_4_ =
                     (float)local_b50._0_4_ * auVar36._0_4_ +
                     (float)local_b70._0_4_ * auVar117._0_4_ +
                     (float)local_b80._0_4_ * auVar185._0_4_ +
                     (float)local_b60._0_4_ * auVar154._0_4_;
                auVar155._4_4_ =
                     (float)local_b50._4_4_ * auVar36._4_4_ +
                     (float)local_b70._4_4_ * auVar117._4_4_ +
                     (float)local_b80._4_4_ * auVar185._4_4_ +
                     (float)local_b60._4_4_ * auVar154._4_4_;
                auVar155._8_4_ =
                     fStack_b48 * auVar36._8_4_ +
                     fStack_b68 * auVar117._8_4_ +
                     fStack_b78 * auVar185._8_4_ + fStack_b58 * auVar154._8_4_;
                auVar155._12_4_ =
                     fStack_b44 * auVar36._12_4_ +
                     fStack_b64 * auVar117._12_4_ +
                     fStack_b74 * auVar185._12_4_ + fStack_b54 * auVar154._12_4_;
                auVar185 = vblendps_avx(auVar118,_DAT_01f7aa10,0xe);
                auVar154 = vrsqrtss_avx(auVar185,auVar185);
                fVar207 = auVar154._0_4_;
                fVar144 = auVar118._0_4_;
                auVar154 = vdpps_avx(auVar329,auVar155,0x7f);
                auVar117 = vshufps_avx(auVar118,auVar118,0);
                auVar156._0_4_ = auVar155._0_4_ * auVar117._0_4_;
                auVar156._4_4_ = auVar155._4_4_ * auVar117._4_4_;
                auVar156._8_4_ = auVar155._8_4_ * auVar117._8_4_;
                auVar156._12_4_ = auVar155._12_4_ * auVar117._12_4_;
                auVar154 = vshufps_avx(auVar154,auVar154,0);
                auVar235._0_4_ = auVar329._0_4_ * auVar154._0_4_;
                auVar235._4_4_ = auVar329._4_4_ * auVar154._4_4_;
                auVar235._8_4_ = auVar329._8_4_ * auVar154._8_4_;
                auVar235._12_4_ = auVar329._12_4_ * auVar154._12_4_;
                auVar36 = vsubps_avx(auVar156,auVar235);
                auVar154 = vrcpss_avx(auVar185,auVar185);
                auVar185 = vmaxss_avx(ZEXT416((uint)local_b40._0_4_),
                                      ZEXT416((uint)(local_cc0 * (float)local_980._0_4_)));
                auVar367 = ZEXT1664(auVar185);
                auVar154 = ZEXT416((uint)(auVar154._0_4_ * (2.0 - fVar144 * auVar154._0_4_)));
                auVar154 = vshufps_avx(auVar154,auVar154,0);
                uVar91 = CONCAT44(auVar329._4_4_,auVar329._0_4_);
                auVar248._0_8_ = uVar91 ^ 0x8000000080000000;
                auVar248._8_4_ = -auVar329._8_4_;
                auVar248._12_4_ = -auVar329._12_4_;
                auVar117 = ZEXT416((uint)(fVar207 * 1.5 +
                                         fVar144 * -0.5 * fVar207 * fVar207 * fVar207));
                auVar117 = vshufps_avx(auVar117,auVar117,0);
                auVar217._0_4_ = auVar117._0_4_ * auVar36._0_4_ * auVar154._0_4_;
                auVar217._4_4_ = auVar117._4_4_ * auVar36._4_4_ * auVar154._4_4_;
                auVar217._8_4_ = auVar117._8_4_ * auVar36._8_4_ * auVar154._8_4_;
                auVar217._12_4_ = auVar117._12_4_ * auVar36._12_4_ * auVar154._12_4_;
                auVar268._0_4_ = auVar329._0_4_ * auVar117._0_4_;
                auVar268._4_4_ = auVar329._4_4_ * auVar117._4_4_;
                auVar268._8_4_ = auVar329._8_4_ * auVar117._8_4_;
                auVar268._12_4_ = auVar329._12_4_ * auVar117._12_4_;
                if (fVar144 < 0.0) {
                  local_a80._0_16_ = auVar217;
                  fVar144 = sqrtf(fVar144);
                  auVar367 = ZEXT464(auVar185._0_4_);
                  auVar217 = local_a80._0_16_;
                }
                else {
                  auVar118 = vsqrtss_avx(auVar118,auVar118);
                  fVar144 = auVar118._0_4_;
                }
                auVar95._4_4_ = fStack_99c;
                auVar95._0_4_ = local_9a0;
                auVar95._8_4_ = fStack_998;
                auVar95._12_4_ = fStack_994;
                auVar118 = vdpps_avx(auVar95,auVar268,0x7f);
                fVar144 = ((float)local_b40._0_4_ / fVar144) * (fVar173 + 1.0) +
                          auVar367._0_4_ + fVar173 * (float)local_b40._0_4_;
                auVar154 = vdpps_avx(auVar248,auVar268,0x7f);
                auVar117 = vdpps_avx(auVar95,auVar217,0x7f);
                auVar36 = vdpps_avx(_local_a50,auVar268,0x7f);
                auVar37 = vdpps_avx(auVar95,auVar248,0x7f);
                fVar173 = auVar154._0_4_ + auVar117._0_4_;
                fVar207 = auVar118._0_4_;
                auVar119._0_4_ = fVar207 * fVar207;
                auVar119._4_4_ = auVar118._4_4_ * auVar118._4_4_;
                auVar119._8_4_ = auVar118._8_4_ * auVar118._8_4_;
                auVar119._12_4_ = auVar118._12_4_ * auVar118._12_4_;
                auVar117 = vsubps_avx(auVar189,auVar119);
                auVar154 = vdpps_avx(auVar95,_local_a50,0x7f);
                fVar226 = auVar37._0_4_ - fVar207 * fVar173;
                fVar227 = auVar154._0_4_ - fVar207 * auVar36._0_4_;
                auVar154 = vrsqrtss_avx(auVar117,auVar117);
                fVar228 = auVar117._0_4_;
                fVar207 = auVar154._0_4_;
                fVar207 = fVar207 * 1.5 + fVar228 * -0.5 * fVar207 * fVar207 * fVar207;
                if (fVar228 < 0.0) {
                  local_a80._0_16_ = ZEXT416((uint)fVar173);
                  local_860._0_4_ = fVar226;
                  local_880._0_4_ = fVar227;
                  local_aa0._0_4_ = fVar207;
                  fVar228 = sqrtf(fVar228);
                  auVar367 = ZEXT464(auVar185._0_4_);
                  fVar207 = (float)local_aa0._0_4_;
                  fVar226 = (float)local_860._0_4_;
                  fVar227 = (float)local_880._0_4_;
                  auVar185 = local_a80._0_16_;
                }
                else {
                  auVar185 = vsqrtss_avx(auVar117,auVar117);
                  fVar228 = auVar185._0_4_;
                  auVar185 = ZEXT416((uint)fVar173);
                }
                auVar378 = ZEXT1664(auVar118);
                auVar372 = ZEXT464((uint)fVar144);
                auVar120 = vpermilps_avx(local_9c0._0_16_,0xff);
                auVar37 = vshufps_avx(auVar329,auVar329,0xff);
                fVar226 = fVar226 * fVar207 - auVar37._0_4_;
                auVar236._0_8_ = auVar36._0_8_ ^ 0x8000000080000000;
                auVar236._8_4_ = auVar36._8_4_ ^ 0x80000000;
                auVar236._12_4_ = auVar36._12_4_ ^ 0x80000000;
                auVar249._0_4_ = -fVar226;
                auVar249._4_4_ = 0x80000000;
                auVar249._8_4_ = 0x80000000;
                auVar249._12_4_ = 0x80000000;
                fVar173 = auVar185._0_4_ * fVar227 * fVar207;
                auVar276 = ZEXT464((uint)fVar173);
                auVar154 = vinsertps_avx(auVar249,ZEXT416((uint)(fVar227 * fVar207)),0x1c);
                auVar117 = vmovsldup_avx(ZEXT416((uint)(fVar173 - auVar36._0_4_ * fVar226)));
                auVar154 = vdivps_avx(auVar154,auVar117);
                auVar185 = vinsertps_avx(auVar185,auVar236,0x10);
                auVar185 = vdivps_avx(auVar185,auVar117);
                auVar117 = vmovsldup_avx(auVar118);
                auVar120 = ZEXT416((uint)(fVar228 - auVar120._0_4_));
                auVar36 = vmovsldup_avx(auVar120);
                auVar187._0_4_ = auVar117._0_4_ * auVar154._0_4_ + auVar36._0_4_ * auVar185._0_4_;
                auVar187._4_4_ = auVar117._4_4_ * auVar154._4_4_ + auVar36._4_4_ * auVar185._4_4_;
                auVar187._8_4_ = auVar117._8_4_ * auVar154._8_4_ + auVar36._8_4_ * auVar185._8_4_;
                auVar187._12_4_ =
                     auVar117._12_4_ * auVar154._12_4_ + auVar36._12_4_ * auVar185._12_4_;
                auVar154 = vsubps_avx(auVar356,auVar187);
                auVar358 = ZEXT1664(auVar154);
                auVar188._8_4_ = 0x7fffffff;
                auVar188._0_8_ = 0x7fffffff7fffffff;
                auVar188._12_4_ = 0x7fffffff;
                auVar185 = vandps_avx(auVar118,auVar188);
                if (auVar185._0_4_ < fVar144) {
                  auVar218._8_4_ = 0x7fffffff;
                  auVar218._0_8_ = 0x7fffffff7fffffff;
                  auVar218._12_4_ = 0x7fffffff;
                  auVar185 = vandps_avx(auVar120,auVar218);
                  if (auVar185._0_4_ <
                      (float)local_9e0._0_4_ * 1.9073486e-06 + auVar367._0_4_ + fVar144) {
                    fVar207 = auVar154._0_4_ + (float)local_920._0_4_;
                    if (fVar207 < fVar142) {
LAB_00f40bcd:
                      bVar99 = 0;
                      goto LAB_00f40bd4;
                    }
                    fVar226 = *(float *)(ray + k * 4 + 0x100);
                    auVar367 = ZEXT464((uint)fVar226);
                    if (fVar207 <= fVar226) {
                      auVar185 = vmovshdup_avx(auVar154);
                      bVar99 = 0;
                      if ((auVar185._0_4_ < 0.0) || (1.0 < auVar185._0_4_)) goto LAB_00f40bd4;
                      auVar189 = vrsqrtss_avx(auVar189,auVar189);
                      fVar227 = auVar189._0_4_;
                      pGVar11 = (context->scene->geometries).items[local_af8].ptr;
                      if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) goto LAB_00f40bcd;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar99 = 1, pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_00f40bd4;
                      auVar189 = ZEXT416((uint)(fVar227 * 1.5 +
                                               fVar171 * -0.5 * fVar227 * fVar227 * fVar227));
                      auVar189 = vshufps_avx(auVar189,auVar189,0);
                      auVar190._0_4_ = auVar189._0_4_ * local_9a0;
                      auVar190._4_4_ = auVar189._4_4_ * fStack_99c;
                      auVar190._8_4_ = auVar189._8_4_ * fStack_998;
                      auVar190._12_4_ = auVar189._12_4_ * fStack_994;
                      auVar157._0_4_ = auVar329._0_4_ + auVar37._0_4_ * auVar190._0_4_;
                      auVar157._4_4_ = auVar329._4_4_ + auVar37._4_4_ * auVar190._4_4_;
                      auVar157._8_4_ = auVar329._8_4_ + auVar37._8_4_ * auVar190._8_4_;
                      auVar157._12_4_ = auVar329._12_4_ + auVar37._12_4_ * auVar190._12_4_;
                      auVar189 = vshufps_avx(auVar190,auVar190,0xc9);
                      auVar185 = vshufps_avx(auVar329,auVar329,0xc9);
                      auVar191._0_4_ = auVar185._0_4_ * auVar190._0_4_;
                      auVar191._4_4_ = auVar185._4_4_ * auVar190._4_4_;
                      auVar191._8_4_ = auVar185._8_4_ * auVar190._8_4_;
                      auVar191._12_4_ = auVar185._12_4_ * auVar190._12_4_;
                      auVar219._0_4_ = auVar329._0_4_ * auVar189._0_4_;
                      auVar219._4_4_ = auVar329._4_4_ * auVar189._4_4_;
                      auVar219._8_4_ = auVar329._8_4_ * auVar189._8_4_;
                      auVar219._12_4_ = auVar329._12_4_ * auVar189._12_4_;
                      auVar356 = vsubps_avx(auVar219,auVar191);
                      auVar189 = vshufps_avx(auVar356,auVar356,0xc9);
                      auVar185 = vshufps_avx(auVar157,auVar157,0xc9);
                      auVar220._0_4_ = auVar185._0_4_ * auVar189._0_4_;
                      auVar220._4_4_ = auVar185._4_4_ * auVar189._4_4_;
                      auVar220._8_4_ = auVar185._8_4_ * auVar189._8_4_;
                      auVar220._12_4_ = auVar185._12_4_ * auVar189._12_4_;
                      auVar189 = vshufps_avx(auVar356,auVar356,0xd2);
                      auVar158._0_4_ = auVar157._0_4_ * auVar189._0_4_;
                      auVar158._4_4_ = auVar157._4_4_ * auVar189._4_4_;
                      auVar158._8_4_ = auVar157._8_4_ * auVar189._8_4_;
                      auVar158._12_4_ = auVar157._12_4_ * auVar189._12_4_;
                      auVar189 = vsubps_avx(auVar220,auVar158);
                      pRVar16 = context->user;
                      local_680 = vshufps_avx(auVar154,auVar154,0x55);
                      auStack_6d0 = vshufps_avx(auVar189,auVar189,0x55);
                      local_6c0 = vshufps_avx(auVar189,auVar189,0xaa);
                      local_6a0 = vshufps_avx(auVar189,auVar189,0);
                      local_6e0 = (RTCHitN  [16])auStack_6d0;
                      local_660 = ZEXT832(0) << 0x20;
                      local_640 = local_560._0_8_;
                      uStack_638 = local_560._8_8_;
                      uStack_630 = local_560._16_8_;
                      uStack_628 = local_560._24_8_;
                      local_620 = local_540._0_8_;
                      uStack_618 = local_540._8_8_;
                      uStack_610 = local_540._16_8_;
                      uStack_608 = local_540._24_8_;
                      *(undefined8 *)(local_b00 + 8) = local_a40._0_8_;
                      *(undefined8 *)(local_b00 + 10) = local_a40._8_8_;
                      *(undefined8 *)(local_b00 + 0xc) = local_a40._16_8_;
                      *(undefined8 *)(local_b00 + 0xe) = local_a40._24_8_;
                      *(undefined8 *)local_b00 = local_a40._0_8_;
                      *(undefined8 *)(local_b00 + 2) = local_a40._8_8_;
                      *(undefined8 *)(local_b00 + 4) = local_a40._16_8_;
                      *(undefined8 *)(local_b00 + 6) = local_a40._24_8_;
                      local_600 = pRVar16->instID[0];
                      local_5e0 = pRVar16->instPrimID[0];
                      *(float *)(ray + k * 4 + 0x100) = fVar207;
                      local_ba0 = *local_b08;
                      local_b90 = *local_b10;
                      local_af0.valid = (int *)local_ba0;
                      local_af0.geometryUserPtr = pGVar11->userPtr;
                      local_af0.context = context->user;
                      local_af0.hit = local_6e0;
                      local_af0.N = 8;
                      local_af0.ray = (RTCRayN *)ray;
                      local_6b0 = local_6c0;
                      local_690 = local_6a0;
                      local_670 = local_680;
                      uStack_5fc = local_600;
                      uStack_5f8 = local_600;
                      uStack_5f4 = local_600;
                      uStack_5f0 = local_600;
                      uStack_5ec = local_600;
                      uStack_5e8 = local_600;
                      uStack_5e4 = local_600;
                      uStack_5dc = local_5e0;
                      uStack_5d8 = local_5e0;
                      uStack_5d4 = local_5e0;
                      uStack_5d0 = local_5e0;
                      uStack_5cc = local_5e0;
                      uStack_5c8 = local_5e0;
                      uStack_5c4 = local_5e0;
                      if (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar276 = ZEXT464((uint)fVar173);
                        auVar358 = ZEXT1664(auVar154);
                        auVar372 = ZEXT464((uint)fVar144);
                        auVar378 = ZEXT1664(auVar118);
                        (*pGVar11->occlusionFilterN)(&local_af0);
                      }
                      auVar189 = vpcmpeqd_avx(local_ba0,ZEXT816(0) << 0x40);
                      auVar185 = vpcmpeqd_avx(local_b90,ZEXT816(0) << 0x40);
                      auVar203._16_16_ = auVar185;
                      auVar203._0_16_ = auVar189;
                      auVar123 = local_a40 & ~auVar203;
                      if ((((((((auVar123 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar123 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar123 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar123 >> 0x7f,0) != '\0') ||
                            (auVar123 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar123 >> 0xbf,0) != '\0') ||
                          (auVar123 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar123[0x1f] < '\0') {
                        p_Var17 = context->args->filter;
                        if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar276 = ZEXT1664(auVar276._0_16_);
                          auVar358 = ZEXT1664(auVar358._0_16_);
                          auVar372 = ZEXT1664(auVar372._0_16_);
                          auVar378 = ZEXT1664(auVar378._0_16_);
                          (*p_Var17)(&local_af0);
                        }
                        auVar367 = ZEXT464((uint)fVar226);
                        auVar189 = vpcmpeqd_avx(local_ba0,ZEXT816(0) << 0x40);
                        auVar185 = vpcmpeqd_avx(local_b90,ZEXT816(0) << 0x40);
                        auVar131._16_16_ = auVar185;
                        auVar131._0_16_ = auVar189;
                        auVar168._8_4_ = 0xff800000;
                        auVar168._0_8_ = 0xff800000ff800000;
                        auVar168._12_4_ = 0xff800000;
                        auVar168._16_4_ = 0xff800000;
                        auVar168._20_4_ = 0xff800000;
                        auVar168._24_4_ = 0xff800000;
                        auVar168._28_4_ = 0xff800000;
                        auVar123 = vblendvps_avx(auVar168,*(undefined1 (*) [32])
                                                           (local_af0.ray + 0x100),auVar131);
                        *(undefined1 (*) [32])(local_af0.ray + 0x100) = auVar123;
                        auVar123 = local_a40 & ~auVar131;
                        if ((((((((auVar123 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar123 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar123 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar123 >> 0x7f,0) != '\0')
                              || (auVar123 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar123 >> 0xbf,0) != '\0') ||
                            (auVar123 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar123[0x1f] < '\0') {
                          bVar99 = 1;
                          goto LAB_00f40bd4;
                        }
                      }
                      *(float *)(ray + k * 4 + 0x100) = fVar226;
                    }
                    auVar367 = ZEXT464((uint)fVar226);
                    bVar99 = 0;
                    goto LAB_00f40bd4;
                  }
                }
                bVar109 = uVar101 < 4;
                uVar101 = uVar101 + 1;
              } while (uVar101 != 5);
              bVar109 = false;
              bVar99 = 5;
LAB_00f40bd4:
              bVar108 = (bool)(bVar108 | bVar109 & bVar99);
              uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar127._4_4_ = uVar8;
              auVar127._0_4_ = uVar8;
              auVar127._8_4_ = uVar8;
              auVar127._12_4_ = uVar8;
              auVar127._16_4_ = uVar8;
              auVar127._20_4_ = uVar8;
              auVar127._24_4_ = uVar8;
              auVar127._28_4_ = uVar8;
              auVar124 = vcmpps_avx(_local_8c0,auVar127,2);
              auVar123 = vandps_avx(auVar124,local_740);
              auVar124 = local_740 & auVar124;
              local_740 = auVar123;
            } while ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar124 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar124 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar124 >> 0x7f,0) != '\0') ||
                       (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar124 >> 0xbf,0) != '\0') ||
                     (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar124[0x1f] < '\0');
          }
          auVar123 = vandps_avx(local_780,local_760);
          auVar124 = vandps_avx(_local_900,_local_8e0);
          auVar310 = ZEXT3264(_local_960);
          auVar238._0_4_ = local_960._0_4_ + local_3c0._0_4_;
          auVar238._4_4_ = local_960._4_4_ + local_3c0._4_4_;
          auVar238._8_4_ = local_960._8_4_ + local_3c0._8_4_;
          auVar238._12_4_ = local_960._12_4_ + local_3c0._12_4_;
          auVar238._16_4_ = local_960._16_4_ + local_3c0._16_4_;
          auVar238._20_4_ = local_960._20_4_ + local_3c0._20_4_;
          auVar238._24_4_ = local_960._24_4_ + local_3c0._24_4_;
          auVar238._28_4_ = local_960._28_4_ + local_3c0._28_4_;
          auVar42 = vcmpps_avx(auVar238,auVar127,2);
          auVar123 = vandps_avx(auVar42,auVar123);
          auVar239._0_4_ = local_380._0_4_ + local_960._0_4_;
          auVar239._4_4_ = local_380._4_4_ + local_960._4_4_;
          auVar239._8_4_ = local_380._8_4_ + local_960._8_4_;
          auVar239._12_4_ = local_380._12_4_ + local_960._12_4_;
          auVar239._16_4_ = local_380._16_4_ + local_960._16_4_;
          auVar239._20_4_ = local_380._20_4_ + local_960._20_4_;
          auVar239._24_4_ = local_380._24_4_ + local_960._24_4_;
          auVar239._28_4_ = local_380._28_4_ + local_960._28_4_;
          auVar42 = vcmpps_avx(auVar239,auVar127,2);
          auVar124 = vandps_avx(auVar42,auVar124);
          auVar124 = vorps_avx(auVar123,auVar124);
          if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar124 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar124 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar124 >> 0x7f,0) != '\0') ||
                (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar124 >> 0xbf,0) != '\0') ||
              (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar124[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar106 * 0x60) = auVar124;
            auVar123 = vblendvps_avx(local_380,_local_3c0,auVar123);
            *(undefined1 (*) [32])(auStack_160 + uVar106 * 0x60) = auVar123;
            uVar9 = vmovlps_avx(local_6f0);
            (&uStack_140)[uVar106 * 0xc] = uVar9;
            aiStack_138[uVar106 * 0x18] = local_cc4 + 1;
            iVar105 = iVar105 + 1;
          }
        }
      }
    }
    if (iVar105 == 0) break;
    uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar132._4_4_ = uVar8;
    auVar132._0_4_ = uVar8;
    auVar132._8_4_ = uVar8;
    auVar132._12_4_ = uVar8;
    auVar132._16_4_ = uVar8;
    auVar132._20_4_ = uVar8;
    auVar132._24_4_ = uVar8;
    auVar132._28_4_ = uVar8;
    uVar100 = -iVar105;
    pauVar102 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar105 - 1) * 0x60);
    while( true ) {
      auVar123 = pauVar102[1];
      auVar169._0_4_ = (float)local_960._0_4_ + auVar123._0_4_;
      auVar169._4_4_ = (float)local_960._4_4_ + auVar123._4_4_;
      auVar169._8_4_ = fStack_958 + auVar123._8_4_;
      auVar169._12_4_ = fStack_954 + auVar123._12_4_;
      auVar169._16_4_ = fStack_950 + auVar123._16_4_;
      auVar169._20_4_ = fStack_94c + auVar123._20_4_;
      auVar169._24_4_ = fStack_948 + auVar123._24_4_;
      auVar169._28_4_ = fStack_944 + auVar123._28_4_;
      auVar124 = vcmpps_avx(auVar169,auVar132,2);
      _local_6e0 = vandps_avx(auVar124,*pauVar102);
      auVar124 = *pauVar102 & auVar124;
      if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar124 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar124 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar124 >> 0x7f,0) != '\0') ||
            (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar124 >> 0xbf,0) != '\0') ||
          (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar124[0x1f] < '\0') break;
      pauVar102 = pauVar102 + -3;
      uVar100 = uVar100 + 1;
      if (uVar100 == 0) goto LAB_00f4123b;
    }
    auVar133._8_4_ = 0x7f800000;
    auVar133._0_8_ = 0x7f8000007f800000;
    auVar133._12_4_ = 0x7f800000;
    auVar133._16_4_ = 0x7f800000;
    auVar133._20_4_ = 0x7f800000;
    auVar133._24_4_ = 0x7f800000;
    auVar133._28_4_ = 0x7f800000;
    auVar123 = vblendvps_avx(auVar133,auVar123,_local_6e0);
    auVar124 = vshufps_avx(auVar123,auVar123,0xb1);
    auVar124 = vminps_avx(auVar123,auVar124);
    auVar42 = vshufpd_avx(auVar124,auVar124,5);
    auVar124 = vminps_avx(auVar124,auVar42);
    auVar42 = vperm2f128_avx(auVar124,auVar124,1);
    auVar124 = vminps_avx(auVar124,auVar42);
    auVar124 = vcmpps_avx(auVar123,auVar124,0);
    auVar42 = _local_6e0 & auVar124;
    auVar123 = _local_6e0;
    if ((((((((auVar42 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar42 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar42 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar42 >> 0x7f,0) != '\0') ||
          (auVar42 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar42 >> 0xbf,0) != '\0') ||
        (auVar42 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar42[0x1f] < '\0')
    {
      auVar123 = vandps_avx(auVar124,_local_6e0);
    }
    auVar121._8_8_ = 0;
    auVar121._0_8_ = *(ulong *)pauVar102[2];
    local_cc4 = *(uint *)(pauVar102[2] + 8);
    uVar103 = vmovmskps_avx(auVar123);
    uVar104 = 0;
    if (uVar103 != 0) {
      for (; (uVar103 >> uVar104 & 1) == 0; uVar104 = uVar104 + 1) {
      }
    }
    *(undefined4 *)(local_6e0 + (ulong)uVar104 * 4) = 0;
    *pauVar102 = _local_6e0;
    uVar103 = ~uVar100;
    if ((((((((_local_6e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_6e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_6e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_6e0 >> 0x7f,0) != '\0') ||
          (_local_6e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_6e0 >> 0xbf,0) != '\0') ||
        (_local_6e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_6e0[0x1f] < '\0') {
      uVar103 = -uVar100;
    }
    uVar106 = (ulong)uVar103;
    auVar189 = vshufps_avx(auVar121,auVar121,0);
    auVar185 = vshufps_avx(auVar121,auVar121,0x55);
    auVar185 = vsubps_avx(auVar185,auVar189);
    local_3c0._4_4_ = auVar189._4_4_ + auVar185._4_4_ * 0.14285715;
    local_3c0._0_4_ = auVar189._0_4_ + auVar185._0_4_ * 0.0;
    fStack_3b8 = auVar189._8_4_ + auVar185._8_4_ * 0.2857143;
    fStack_3b4 = auVar189._12_4_ + auVar185._12_4_ * 0.42857146;
    fStack_3b0 = auVar189._0_4_ + auVar185._0_4_ * 0.5714286;
    fStack_3ac = auVar189._4_4_ + auVar185._4_4_ * 0.71428573;
    fStack_3a8 = auVar189._8_4_ + auVar185._8_4_ * 0.8571429;
    fStack_3a4 = auVar189._12_4_ + auVar185._12_4_;
    local_6f0._8_8_ = 0;
    local_6f0._0_8_ = *(ulong *)(local_3c0 + (ulong)uVar104 * 4);
  } while( true );
LAB_00f4123b:
  if (bVar108 != false) {
    return bVar108;
  }
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar122._4_4_ = uVar8;
  auVar122._0_4_ = uVar8;
  auVar122._8_4_ = uVar8;
  auVar122._12_4_ = uVar8;
  auVar149 = vcmpps_avx(local_700,auVar122,2);
  uVar100 = vmovmskps_avx(auVar149);
  uVar100 = (uint)local_908 - 1 & (uint)local_908 & uVar100;
  if (uVar100 == 0) {
    return false;
  }
  goto LAB_00f3e5a8;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }